

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersectorK<8,8>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Primitive PVar19;
  uint uVar20;
  Geometry *pGVar21;
  __int_type_conflict _Var22;
  long lVar23;
  long lVar24;
  long lVar25;
  RTCFilterFunctionN p_Var26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  bool bVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  uint uVar86;
  uint uVar87;
  ulong uVar88;
  ulong uVar89;
  long lVar90;
  uint uVar91;
  uint uVar93;
  long lVar94;
  long lVar95;
  long lVar96;
  float t1;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar122;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar109 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar123;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar152;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  vfloat4 a0_1;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  float fVar174;
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar162 [16];
  float fVar175;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar176;
  float fVar207;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar205;
  float fVar206;
  float fVar208;
  float fVar209;
  float fVar210;
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar211;
  float fVar212;
  float fVar230;
  float fVar232;
  vfloat4 a0_2;
  float fVar234;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar226 [32];
  float fVar233;
  float fVar235;
  undefined1 auVar227 [32];
  float fVar231;
  float fVar236;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar240;
  float fVar255;
  float fVar256;
  undefined1 auVar241 [16];
  float fVar257;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar254 [32];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar265 [16];
  float fVar273;
  float fVar275;
  undefined1 auVar271 [32];
  float fVar274;
  undefined1 auVar272 [32];
  vfloat4 b0;
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  float fVar331;
  float fVar332;
  float fVar333;
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar350 [16];
  float fVar349;
  float fVar364;
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  float fVar362;
  float fVar363;
  float fVar365;
  float fVar366;
  float fVar367;
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  float fVar368;
  float fVar381;
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  float fVar379;
  float fVar380;
  float fVar382;
  float fVar383;
  float fVar384;
  float fVar385;
  float fVar386;
  float fVar387;
  float in_register_0000151c;
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  float fVar388;
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  float fVar397;
  float fVar398;
  undefined1 auVar396 [32];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  float fVar399;
  undefined1 auVar402 [16];
  float fVar405;
  float fVar406;
  float in_register_0000159c;
  undefined1 auVar403 [32];
  undefined1 auVar404 [64];
  vfloat4 a0;
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  float in_register_000015dc;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float local_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  uint local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  RTCFilterFunctionNArguments local_4e0;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  uint auStack_460 [4];
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [8];
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  float afStack_320 [8];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 auStack_170 [16];
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar92;
  undefined1 auVar204 [32];
  undefined1 auVar412 [32];
  
  PVar19 = prim[1];
  uVar88 = (ulong)(byte)PVar19;
  lVar95 = uVar88 * 0x25;
  auVar136 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar136 = vinsertps_avx(auVar136,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar217 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar217 = vinsertps_avx(auVar217,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar136 = vsubps_avx(auVar136,*(undefined1 (*) [16])(prim + lVar95 + 6));
  fVar176 = *(float *)(prim + lVar95 + 0x12);
  auVar124._0_4_ = fVar176 * auVar136._0_4_;
  auVar124._4_4_ = fVar176 * auVar136._4_4_;
  auVar124._8_4_ = fVar176 * auVar136._8_4_;
  auVar124._12_4_ = fVar176 * auVar136._12_4_;
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 4 + 6)));
  auVar241._0_4_ = fVar176 * auVar217._0_4_;
  auVar241._4_4_ = fVar176 * auVar217._4_4_;
  auVar241._8_4_ = fVar176 * auVar217._8_4_;
  auVar241._12_4_ = fVar176 * auVar217._12_4_;
  auVar217 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 4 + 10)));
  auVar112._16_16_ = auVar217;
  auVar112._0_16_ = auVar136;
  auVar112 = vcvtdq2ps_avx(auVar112);
  lVar90 = uVar88 * 5;
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar90 + 6)));
  auVar217 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar90 + 10)));
  auVar168._16_16_ = auVar217;
  auVar168._0_16_ = auVar136;
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 6 + 6)));
  auVar217 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 6 + 10)));
  auVar27 = vcvtdq2ps_avx(auVar168);
  auVar197._16_16_ = auVar217;
  auVar197._0_16_ = auVar136;
  auVar28 = vcvtdq2ps_avx(auVar197);
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 0xf + 6)));
  auVar217 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 0xf + 10)));
  auVar198._16_16_ = auVar217;
  auVar198._0_16_ = auVar136;
  auVar29 = vcvtdq2ps_avx(auVar198);
  lVar96 = (ulong)(byte)PVar19 * 0x10;
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar96 + 6)));
  auVar217 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar96 + 10)));
  auVar271._16_16_ = auVar217;
  auVar271._0_16_ = auVar136;
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar96 + uVar88 + 6)));
  auVar30 = vcvtdq2ps_avx(auVar271);
  auVar217 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar96 + uVar88 + 10)));
  auVar286._16_16_ = auVar217;
  auVar286._0_16_ = auVar136;
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 0x1a + 6)));
  auVar31 = vcvtdq2ps_avx(auVar286);
  auVar217 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 0x1a + 10)));
  auVar287._16_16_ = auVar217;
  auVar287._0_16_ = auVar136;
  auVar32 = vcvtdq2ps_avx(auVar287);
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 0x1b + 6)));
  auVar217 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 0x1b + 10)));
  auVar326._16_16_ = auVar217;
  auVar326._0_16_ = auVar136;
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 0x1c + 6)));
  auVar217 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 0x1c + 10)));
  auVar33 = vcvtdq2ps_avx(auVar326);
  auVar344._16_16_ = auVar217;
  auVar344._0_16_ = auVar136;
  auVar34 = vcvtdq2ps_avx(auVar344);
  auVar136 = vshufps_avx(auVar241,auVar241,0);
  auVar217 = vshufps_avx(auVar241,auVar241,0x55);
  auVar252 = vshufps_avx(auVar241,auVar241,0xaa);
  fVar176 = auVar252._0_4_;
  fVar211 = auVar252._4_4_;
  fVar122 = auVar252._8_4_;
  fVar205 = auVar252._12_4_;
  fVar174 = auVar217._0_4_;
  fVar123 = auVar217._4_4_;
  fVar206 = auVar217._8_4_;
  fVar232 = auVar217._12_4_;
  fVar152 = auVar136._0_4_;
  fVar207 = auVar136._4_4_;
  fVar234 = auVar136._8_4_;
  fVar331 = auVar136._12_4_;
  auVar375._0_4_ = fVar152 * auVar112._0_4_ + fVar174 * auVar27._0_4_ + fVar176 * auVar28._0_4_;
  auVar375._4_4_ = fVar207 * auVar112._4_4_ + fVar123 * auVar27._4_4_ + fVar211 * auVar28._4_4_;
  auVar375._8_4_ = fVar234 * auVar112._8_4_ + fVar206 * auVar27._8_4_ + fVar122 * auVar28._8_4_;
  auVar375._12_4_ = fVar331 * auVar112._12_4_ + fVar232 * auVar27._12_4_ + fVar205 * auVar28._12_4_;
  auVar375._16_4_ = fVar152 * auVar112._16_4_ + fVar174 * auVar27._16_4_ + fVar176 * auVar28._16_4_;
  auVar375._20_4_ = fVar207 * auVar112._20_4_ + fVar123 * auVar27._20_4_ + fVar211 * auVar28._20_4_;
  auVar375._24_4_ = fVar234 * auVar112._24_4_ + fVar206 * auVar27._24_4_ + fVar122 * auVar28._24_4_;
  auVar375._28_4_ = fVar232 + in_register_000015dc + in_register_0000151c;
  auVar357._0_4_ = fVar152 * auVar29._0_4_ + fVar174 * auVar30._0_4_ + auVar31._0_4_ * fVar176;
  auVar357._4_4_ = fVar207 * auVar29._4_4_ + fVar123 * auVar30._4_4_ + auVar31._4_4_ * fVar211;
  auVar357._8_4_ = fVar234 * auVar29._8_4_ + fVar206 * auVar30._8_4_ + auVar31._8_4_ * fVar122;
  auVar357._12_4_ = fVar331 * auVar29._12_4_ + fVar232 * auVar30._12_4_ + auVar31._12_4_ * fVar205;
  auVar357._16_4_ = fVar152 * auVar29._16_4_ + fVar174 * auVar30._16_4_ + auVar31._16_4_ * fVar176;
  auVar357._20_4_ = fVar207 * auVar29._20_4_ + fVar123 * auVar30._20_4_ + auVar31._20_4_ * fVar211;
  auVar357._24_4_ = fVar234 * auVar29._24_4_ + fVar206 * auVar30._24_4_ + auVar31._24_4_ * fVar122;
  auVar357._28_4_ = fVar232 + in_register_000015dc + in_register_0000159c;
  auVar254._0_4_ = fVar152 * auVar32._0_4_ + fVar174 * auVar33._0_4_ + auVar34._0_4_ * fVar176;
  auVar254._4_4_ = fVar207 * auVar32._4_4_ + fVar123 * auVar33._4_4_ + auVar34._4_4_ * fVar211;
  auVar254._8_4_ = fVar234 * auVar32._8_4_ + fVar206 * auVar33._8_4_ + auVar34._8_4_ * fVar122;
  auVar254._12_4_ = fVar331 * auVar32._12_4_ + fVar232 * auVar33._12_4_ + auVar34._12_4_ * fVar205;
  auVar254._16_4_ = fVar152 * auVar32._16_4_ + fVar174 * auVar33._16_4_ + auVar34._16_4_ * fVar176;
  auVar254._20_4_ = fVar207 * auVar32._20_4_ + fVar123 * auVar33._20_4_ + auVar34._20_4_ * fVar211;
  auVar254._24_4_ = fVar234 * auVar32._24_4_ + fVar206 * auVar33._24_4_ + auVar34._24_4_ * fVar122;
  auVar254._28_4_ = fVar331 + fVar232 + fVar205;
  auVar136 = vshufps_avx(auVar124,auVar124,0);
  auVar217 = vshufps_avx(auVar124,auVar124,0x55);
  auVar252 = vshufps_avx(auVar124,auVar124,0xaa);
  fVar176 = auVar252._0_4_;
  fVar211 = auVar252._4_4_;
  fVar122 = auVar252._8_4_;
  fVar205 = auVar252._12_4_;
  fVar207 = auVar217._0_4_;
  fVar234 = auVar217._4_4_;
  fVar331 = auVar217._8_4_;
  fVar208 = auVar217._12_4_;
  fVar174 = auVar27._28_4_ + auVar28._28_4_;
  fVar123 = auVar136._0_4_;
  fVar206 = auVar136._4_4_;
  fVar232 = auVar136._8_4_;
  fVar152 = auVar136._12_4_;
  auVar146._0_4_ = fVar123 * auVar112._0_4_ + fVar207 * auVar27._0_4_ + fVar176 * auVar28._0_4_;
  auVar146._4_4_ = fVar206 * auVar112._4_4_ + fVar234 * auVar27._4_4_ + fVar211 * auVar28._4_4_;
  auVar146._8_4_ = fVar232 * auVar112._8_4_ + fVar331 * auVar27._8_4_ + fVar122 * auVar28._8_4_;
  auVar146._12_4_ = fVar152 * auVar112._12_4_ + fVar208 * auVar27._12_4_ + fVar205 * auVar28._12_4_;
  auVar146._16_4_ = fVar123 * auVar112._16_4_ + fVar207 * auVar27._16_4_ + fVar176 * auVar28._16_4_;
  auVar146._20_4_ = fVar206 * auVar112._20_4_ + fVar234 * auVar27._20_4_ + fVar211 * auVar28._20_4_;
  auVar146._24_4_ = fVar232 * auVar112._24_4_ + fVar331 * auVar27._24_4_ + fVar122 * auVar28._24_4_;
  auVar146._28_4_ = auVar112._28_4_ + fVar174;
  auVar113._0_4_ = fVar123 * auVar29._0_4_ + auVar31._0_4_ * fVar176 + fVar207 * auVar30._0_4_;
  auVar113._4_4_ = fVar206 * auVar29._4_4_ + auVar31._4_4_ * fVar211 + fVar234 * auVar30._4_4_;
  auVar113._8_4_ = fVar232 * auVar29._8_4_ + auVar31._8_4_ * fVar122 + fVar331 * auVar30._8_4_;
  auVar113._12_4_ = fVar152 * auVar29._12_4_ + auVar31._12_4_ * fVar205 + fVar208 * auVar30._12_4_;
  auVar113._16_4_ = fVar123 * auVar29._16_4_ + auVar31._16_4_ * fVar176 + fVar207 * auVar30._16_4_;
  auVar113._20_4_ = fVar206 * auVar29._20_4_ + auVar31._20_4_ * fVar211 + fVar234 * auVar30._20_4_;
  auVar113._24_4_ = fVar232 * auVar29._24_4_ + auVar31._24_4_ * fVar122 + fVar331 * auVar30._24_4_;
  auVar113._28_4_ = auVar112._28_4_ + auVar31._28_4_ + auVar28._28_4_;
  auVar199._8_4_ = 0x7fffffff;
  auVar199._0_8_ = 0x7fffffff7fffffff;
  auVar199._12_4_ = 0x7fffffff;
  auVar199._16_4_ = 0x7fffffff;
  auVar199._20_4_ = 0x7fffffff;
  auVar199._24_4_ = 0x7fffffff;
  auVar199._28_4_ = 0x7fffffff;
  auVar226._8_4_ = 0x219392ef;
  auVar226._0_8_ = 0x219392ef219392ef;
  auVar226._12_4_ = 0x219392ef;
  auVar226._16_4_ = 0x219392ef;
  auVar226._20_4_ = 0x219392ef;
  auVar226._24_4_ = 0x219392ef;
  auVar226._28_4_ = 0x219392ef;
  auVar112 = vandps_avx(auVar375,auVar199);
  auVar112 = vcmpps_avx(auVar112,auVar226,1);
  auVar27 = vblendvps_avx(auVar375,auVar226,auVar112);
  auVar112 = vandps_avx(auVar357,auVar199);
  auVar112 = vcmpps_avx(auVar112,auVar226,1);
  auVar28 = vblendvps_avx(auVar357,auVar226,auVar112);
  auVar112 = vandps_avx(auVar254,auVar199);
  auVar112 = vcmpps_avx(auVar112,auVar226,1);
  auVar112 = vblendvps_avx(auVar254,auVar226,auVar112);
  auVar169._0_4_ = fVar123 * auVar32._0_4_ + fVar207 * auVar33._0_4_ + auVar34._0_4_ * fVar176;
  auVar169._4_4_ = fVar206 * auVar32._4_4_ + fVar234 * auVar33._4_4_ + auVar34._4_4_ * fVar211;
  auVar169._8_4_ = fVar232 * auVar32._8_4_ + fVar331 * auVar33._8_4_ + auVar34._8_4_ * fVar122;
  auVar169._12_4_ = fVar152 * auVar32._12_4_ + fVar208 * auVar33._12_4_ + auVar34._12_4_ * fVar205;
  auVar169._16_4_ = fVar123 * auVar32._16_4_ + fVar207 * auVar33._16_4_ + auVar34._16_4_ * fVar176;
  auVar169._20_4_ = fVar206 * auVar32._20_4_ + fVar234 * auVar33._20_4_ + auVar34._20_4_ * fVar211;
  auVar169._24_4_ = fVar232 * auVar32._24_4_ + fVar331 * auVar33._24_4_ + auVar34._24_4_ * fVar122;
  auVar169._28_4_ = fVar174 + auVar30._28_4_ + fVar205;
  auVar29 = vrcpps_avx(auVar27);
  fVar176 = auVar29._0_4_;
  fVar205 = auVar29._4_4_;
  auVar30._4_4_ = auVar27._4_4_ * fVar205;
  auVar30._0_4_ = auVar27._0_4_ * fVar176;
  fVar206 = auVar29._8_4_;
  auVar30._8_4_ = auVar27._8_4_ * fVar206;
  fVar207 = auVar29._12_4_;
  auVar30._12_4_ = auVar27._12_4_ * fVar207;
  fVar208 = auVar29._16_4_;
  auVar30._16_4_ = auVar27._16_4_ * fVar208;
  fVar209 = auVar29._20_4_;
  auVar30._20_4_ = auVar27._20_4_ * fVar209;
  fVar210 = auVar29._24_4_;
  auVar30._24_4_ = auVar27._24_4_ * fVar210;
  auVar30._28_4_ = 0x219392ef;
  auVar288._8_4_ = 0x3f800000;
  auVar288._0_8_ = &DAT_3f8000003f800000;
  auVar288._12_4_ = 0x3f800000;
  auVar288._16_4_ = 0x3f800000;
  auVar288._20_4_ = 0x3f800000;
  auVar288._24_4_ = 0x3f800000;
  auVar288._28_4_ = 0x3f800000;
  auVar31 = vsubps_avx(auVar288,auVar30);
  auVar30 = vrcpps_avx(auVar28);
  fVar176 = fVar176 + fVar176 * auVar31._0_4_;
  fVar205 = fVar205 + fVar205 * auVar31._4_4_;
  fVar206 = fVar206 + fVar206 * auVar31._8_4_;
  fVar207 = fVar207 + fVar207 * auVar31._12_4_;
  fVar208 = fVar208 + fVar208 * auVar31._16_4_;
  fVar209 = fVar209 + fVar209 * auVar31._20_4_;
  fVar210 = fVar210 + fVar210 * auVar31._24_4_;
  fVar211 = auVar30._0_4_;
  fVar174 = auVar30._4_4_;
  auVar27._4_4_ = auVar28._4_4_ * fVar174;
  auVar27._0_4_ = auVar28._0_4_ * fVar211;
  fVar232 = auVar30._8_4_;
  auVar27._8_4_ = auVar28._8_4_ * fVar232;
  fVar234 = auVar30._12_4_;
  auVar27._12_4_ = auVar28._12_4_ * fVar234;
  fVar237 = auVar30._16_4_;
  auVar27._16_4_ = auVar28._16_4_ * fVar237;
  fVar238 = auVar30._20_4_;
  auVar27._20_4_ = auVar28._20_4_ * fVar238;
  fVar239 = auVar30._24_4_;
  auVar27._24_4_ = auVar28._24_4_ * fVar239;
  auVar27._28_4_ = auVar31._28_4_;
  auVar28 = vsubps_avx(auVar288,auVar27);
  fVar211 = fVar211 + fVar211 * auVar28._0_4_;
  fVar174 = fVar174 + fVar174 * auVar28._4_4_;
  fVar232 = fVar232 + fVar232 * auVar28._8_4_;
  fVar234 = fVar234 + fVar234 * auVar28._12_4_;
  fVar237 = fVar237 + fVar237 * auVar28._16_4_;
  fVar238 = fVar238 + fVar238 * auVar28._20_4_;
  fVar239 = fVar239 + fVar239 * auVar28._24_4_;
  auVar27 = vrcpps_avx(auVar112);
  fVar240 = auVar27._0_4_;
  fVar255 = auVar27._4_4_;
  auVar32._4_4_ = fVar255 * auVar112._4_4_;
  auVar32._0_4_ = fVar240 * auVar112._0_4_;
  fVar256 = auVar27._8_4_;
  auVar32._8_4_ = fVar256 * auVar112._8_4_;
  fVar257 = auVar27._12_4_;
  auVar32._12_4_ = fVar257 * auVar112._12_4_;
  fVar258 = auVar27._16_4_;
  auVar32._16_4_ = fVar258 * auVar112._16_4_;
  fVar259 = auVar27._20_4_;
  auVar32._20_4_ = fVar259 * auVar112._20_4_;
  fVar260 = auVar27._24_4_;
  auVar32._24_4_ = fVar260 * auVar112._24_4_;
  auVar32._28_4_ = auVar112._28_4_;
  auVar112 = vsubps_avx(auVar288,auVar32);
  fVar240 = fVar240 + fVar240 * auVar112._0_4_;
  fVar255 = fVar255 + fVar255 * auVar112._4_4_;
  fVar256 = fVar256 + fVar256 * auVar112._8_4_;
  fVar257 = fVar257 + fVar257 * auVar112._12_4_;
  fVar258 = fVar258 + fVar258 * auVar112._16_4_;
  fVar259 = fVar259 + fVar259 * auVar112._20_4_;
  fVar260 = fVar260 + fVar260 * auVar112._24_4_;
  auVar136 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar95 + 0x16)) *
                           *(float *)(prim + lVar95 + 0x1a)));
  auVar263 = vshufps_avx(auVar136,auVar136,0);
  auVar136._8_8_ = 0;
  auVar136._0_8_ = *(ulong *)(prim + uVar88 * 7 + 6);
  auVar136 = vpmovsxwd_avx(auVar136);
  auVar217._8_8_ = 0;
  auVar217._0_8_ = *(ulong *)(prim + uVar88 * 7 + 0xe);
  auVar217 = vpmovsxwd_avx(auVar217);
  auVar289._16_16_ = auVar217;
  auVar289._0_16_ = auVar136;
  auVar112 = vcvtdq2ps_avx(auVar289);
  auVar252._8_8_ = 0;
  auVar252._0_8_ = *(ulong *)(prim + uVar88 * 0xb + 6);
  auVar136 = vpmovsxwd_avx(auVar252);
  auVar297._8_8_ = 0;
  auVar297._0_8_ = *(ulong *)(prim + uVar88 * 0xb + 0xe);
  auVar217 = vpmovsxwd_avx(auVar297);
  auVar307._16_16_ = auVar217;
  auVar307._0_16_ = auVar136;
  auVar27 = vcvtdq2ps_avx(auVar307);
  auVar27 = vsubps_avx(auVar27,auVar112);
  fVar122 = auVar263._0_4_;
  fVar123 = auVar263._4_4_;
  fVar152 = auVar263._8_4_;
  fVar331 = auVar263._12_4_;
  auVar263._8_8_ = 0;
  auVar263._0_8_ = *(ulong *)(prim + uVar88 * 9 + 6);
  auVar136 = vpmovsxwd_avx(auVar263);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar88 * 9 + 0xe);
  auVar217 = vpmovsxwd_avx(auVar6);
  auVar290._0_4_ = auVar27._0_4_ * fVar122 + auVar112._0_4_;
  auVar290._4_4_ = auVar27._4_4_ * fVar123 + auVar112._4_4_;
  auVar290._8_4_ = auVar27._8_4_ * fVar152 + auVar112._8_4_;
  auVar290._12_4_ = auVar27._12_4_ * fVar331 + auVar112._12_4_;
  auVar290._16_4_ = auVar27._16_4_ * fVar122 + auVar112._16_4_;
  auVar290._20_4_ = auVar27._20_4_ * fVar123 + auVar112._20_4_;
  auVar290._24_4_ = auVar27._24_4_ * fVar152 + auVar112._24_4_;
  auVar290._28_4_ = auVar27._28_4_ + auVar112._28_4_;
  auVar308._16_16_ = auVar217;
  auVar308._0_16_ = auVar136;
  auVar112 = vcvtdq2ps_avx(auVar308);
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *(ulong *)(prim + uVar88 * 0xd + 6);
  auVar136 = vpmovsxwd_avx(auVar194);
  auVar135._8_8_ = 0;
  auVar135._0_8_ = *(ulong *)(prim + uVar88 * 0xd + 0xe);
  auVar217 = vpmovsxwd_avx(auVar135);
  auVar327._16_16_ = auVar217;
  auVar327._0_16_ = auVar136;
  auVar27 = vcvtdq2ps_avx(auVar327);
  auVar27 = vsubps_avx(auVar27,auVar112);
  auVar193._8_8_ = 0;
  auVar193._0_8_ = *(ulong *)(prim + uVar88 * 0x12 + 6);
  auVar136 = vpmovsxwd_avx(auVar193);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + uVar88 * 0x12 + 0xe);
  auVar217 = vpmovsxwd_avx(auVar110);
  auVar309._0_4_ = auVar112._0_4_ + auVar27._0_4_ * fVar122;
  auVar309._4_4_ = auVar112._4_4_ + auVar27._4_4_ * fVar123;
  auVar309._8_4_ = auVar112._8_4_ + auVar27._8_4_ * fVar152;
  auVar309._12_4_ = auVar112._12_4_ + auVar27._12_4_ * fVar331;
  auVar309._16_4_ = auVar112._16_4_ + auVar27._16_4_ * fVar122;
  auVar309._20_4_ = auVar112._20_4_ + auVar27._20_4_ * fVar123;
  auVar309._24_4_ = auVar112._24_4_ + auVar27._24_4_ * fVar152;
  auVar309._28_4_ = auVar112._28_4_ + auVar27._28_4_;
  auVar328._16_16_ = auVar217;
  auVar328._0_16_ = auVar136;
  auVar112 = vcvtdq2ps_avx(auVar328);
  uVar89 = (ulong)(uint)((int)lVar90 << 2);
  lVar95 = uVar88 * 2 + uVar89;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = *(ulong *)(prim + lVar95 + 6);
  auVar136 = vpmovsxwd_avx(auVar163);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + lVar95 + 0xe);
  auVar217 = vpmovsxwd_avx(auVar7);
  auVar345._16_16_ = auVar217;
  auVar345._0_16_ = auVar136;
  auVar27 = vcvtdq2ps_avx(auVar345);
  auVar27 = vsubps_avx(auVar27,auVar112);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar89 + 6);
  auVar136 = vpmovsxwd_avx(auVar8);
  auVar329._0_4_ = auVar112._0_4_ + auVar27._0_4_ * fVar122;
  auVar329._4_4_ = auVar112._4_4_ + auVar27._4_4_ * fVar123;
  auVar329._8_4_ = auVar112._8_4_ + auVar27._8_4_ * fVar152;
  auVar329._12_4_ = auVar112._12_4_ + auVar27._12_4_ * fVar331;
  auVar329._16_4_ = auVar112._16_4_ + auVar27._16_4_ * fVar122;
  auVar329._20_4_ = auVar112._20_4_ + auVar27._20_4_ * fVar123;
  auVar329._24_4_ = auVar112._24_4_ + auVar27._24_4_ * fVar152;
  auVar329._28_4_ = auVar112._28_4_ + auVar27._28_4_;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = *(ulong *)(prim + uVar89 + 0xe);
  auVar217 = vpmovsxwd_avx(auVar282);
  auVar346._16_16_ = auVar217;
  auVar346._0_16_ = auVar136;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar88 * 0x18 + 6);
  auVar136 = vpmovsxwd_avx(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar88 * 0x18 + 0xe);
  auVar217 = vpmovsxwd_avx(auVar10);
  auVar112 = vcvtdq2ps_avx(auVar346);
  auVar358._16_16_ = auVar217;
  auVar358._0_16_ = auVar136;
  auVar27 = vcvtdq2ps_avx(auVar358);
  auVar27 = vsubps_avx(auVar27,auVar112);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar88 * 0x1d + 6);
  auVar136 = vpmovsxwd_avx(auVar11);
  auVar347._0_4_ = auVar112._0_4_ + auVar27._0_4_ * fVar122;
  auVar347._4_4_ = auVar112._4_4_ + auVar27._4_4_ * fVar123;
  auVar347._8_4_ = auVar112._8_4_ + auVar27._8_4_ * fVar152;
  auVar347._12_4_ = auVar112._12_4_ + auVar27._12_4_ * fVar331;
  auVar347._16_4_ = auVar112._16_4_ + auVar27._16_4_ * fVar122;
  auVar347._20_4_ = auVar112._20_4_ + auVar27._20_4_ * fVar123;
  auVar347._24_4_ = auVar112._24_4_ + auVar27._24_4_ * fVar152;
  auVar347._28_4_ = auVar112._28_4_ + auVar27._28_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar88 * 0x1d + 0xe);
  auVar217 = vpmovsxwd_avx(auVar12);
  auVar359._16_16_ = auVar217;
  auVar359._0_16_ = auVar136;
  auVar112 = vcvtdq2ps_avx(auVar359);
  lVar95 = uVar88 + (ulong)(byte)PVar19 * 0x20;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + lVar95 + 6);
  auVar136 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + lVar95 + 0xe);
  auVar217 = vpmovsxwd_avx(auVar14);
  auVar376._16_16_ = auVar217;
  auVar376._0_16_ = auVar136;
  auVar27 = vcvtdq2ps_avx(auVar376);
  auVar27 = vsubps_avx(auVar27,auVar112);
  auVar360._0_4_ = auVar112._0_4_ + auVar27._0_4_ * fVar122;
  auVar360._4_4_ = auVar112._4_4_ + auVar27._4_4_ * fVar123;
  auVar360._8_4_ = auVar112._8_4_ + auVar27._8_4_ * fVar152;
  auVar360._12_4_ = auVar112._12_4_ + auVar27._12_4_ * fVar331;
  auVar360._16_4_ = auVar112._16_4_ + auVar27._16_4_ * fVar122;
  auVar360._20_4_ = auVar112._20_4_ + auVar27._20_4_ * fVar123;
  auVar360._24_4_ = auVar112._24_4_ + auVar27._24_4_ * fVar152;
  auVar360._28_4_ = auVar112._28_4_ + auVar27._28_4_;
  lVar95 = (ulong)(byte)PVar19 * 0x20 - uVar88;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + lVar95 + 6);
  auVar136 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + lVar95 + 0xe);
  auVar217 = vpmovsxwd_avx(auVar16);
  auVar377._16_16_ = auVar217;
  auVar377._0_16_ = auVar136;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar88 * 0x23 + 6);
  auVar136 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar88 * 0x23 + 0xe);
  auVar217 = vpmovsxwd_avx(auVar18);
  auVar112 = vcvtdq2ps_avx(auVar377);
  auVar394._16_16_ = auVar217;
  auVar394._0_16_ = auVar136;
  auVar27 = vcvtdq2ps_avx(auVar394);
  auVar27 = vsubps_avx(auVar27,auVar112);
  auVar378._0_4_ = auVar112._0_4_ + auVar27._0_4_ * fVar122;
  auVar378._4_4_ = auVar112._4_4_ + auVar27._4_4_ * fVar123;
  auVar378._8_4_ = auVar112._8_4_ + auVar27._8_4_ * fVar152;
  auVar378._12_4_ = auVar112._12_4_ + auVar27._12_4_ * fVar331;
  auVar378._16_4_ = auVar112._16_4_ + auVar27._16_4_ * fVar122;
  auVar378._20_4_ = auVar112._20_4_ + auVar27._20_4_ * fVar123;
  auVar378._24_4_ = auVar112._24_4_ + auVar27._24_4_ * fVar152;
  auVar378._28_4_ = auVar112._28_4_ + fVar331;
  auVar112 = vsubps_avx(auVar290,auVar146);
  auVar261._0_4_ = fVar176 * auVar112._0_4_;
  auVar261._4_4_ = fVar205 * auVar112._4_4_;
  auVar261._8_4_ = fVar206 * auVar112._8_4_;
  auVar261._12_4_ = fVar207 * auVar112._12_4_;
  auVar33._16_4_ = fVar208 * auVar112._16_4_;
  auVar33._0_16_ = auVar261;
  auVar33._20_4_ = fVar209 * auVar112._20_4_;
  auVar33._24_4_ = fVar210 * auVar112._24_4_;
  auVar33._28_4_ = auVar112._28_4_;
  auVar112 = vsubps_avx(auVar309,auVar146);
  auVar177._0_4_ = fVar176 * auVar112._0_4_;
  auVar177._4_4_ = fVar205 * auVar112._4_4_;
  auVar177._8_4_ = fVar206 * auVar112._8_4_;
  auVar177._12_4_ = fVar207 * auVar112._12_4_;
  auVar34._16_4_ = fVar208 * auVar112._16_4_;
  auVar34._0_16_ = auVar177;
  auVar34._20_4_ = fVar209 * auVar112._20_4_;
  auVar34._24_4_ = fVar210 * auVar112._24_4_;
  auVar34._28_4_ = auVar29._28_4_ + auVar31._28_4_;
  auVar112 = vsubps_avx(auVar329,auVar113);
  auVar125._0_4_ = fVar211 * auVar112._0_4_;
  auVar125._4_4_ = fVar174 * auVar112._4_4_;
  auVar125._8_4_ = fVar232 * auVar112._8_4_;
  auVar125._12_4_ = fVar234 * auVar112._12_4_;
  auVar29._16_4_ = fVar237 * auVar112._16_4_;
  auVar29._0_16_ = auVar125;
  auVar29._20_4_ = fVar238 * auVar112._20_4_;
  auVar29._24_4_ = fVar239 * auVar112._24_4_;
  auVar29._28_4_ = auVar112._28_4_;
  auVar112 = vsubps_avx(auVar347,auVar113);
  auVar213._0_4_ = fVar211 * auVar112._0_4_;
  auVar213._4_4_ = fVar174 * auVar112._4_4_;
  auVar213._8_4_ = fVar232 * auVar112._8_4_;
  auVar213._12_4_ = fVar234 * auVar112._12_4_;
  auVar31._16_4_ = fVar237 * auVar112._16_4_;
  auVar31._0_16_ = auVar213;
  auVar31._20_4_ = fVar238 * auVar112._20_4_;
  auVar31._24_4_ = fVar239 * auVar112._24_4_;
  auVar31._28_4_ = auVar30._28_4_ + auVar28._28_4_;
  auVar112 = vsubps_avx(auVar360,auVar169);
  auVar97._0_4_ = fVar240 * auVar112._0_4_;
  auVar97._4_4_ = fVar255 * auVar112._4_4_;
  auVar97._8_4_ = fVar256 * auVar112._8_4_;
  auVar97._12_4_ = fVar257 * auVar112._12_4_;
  auVar28._16_4_ = fVar258 * auVar112._16_4_;
  auVar28._0_16_ = auVar97;
  auVar28._20_4_ = fVar259 * auVar112._20_4_;
  auVar28._24_4_ = fVar260 * auVar112._24_4_;
  auVar28._28_4_ = auVar112._28_4_;
  auVar112 = vsubps_avx(auVar378,auVar169);
  auVar153._0_4_ = fVar240 * auVar112._0_4_;
  auVar153._4_4_ = fVar255 * auVar112._4_4_;
  auVar153._8_4_ = fVar256 * auVar112._8_4_;
  auVar153._12_4_ = fVar257 * auVar112._12_4_;
  auVar35._16_4_ = fVar258 * auVar112._16_4_;
  auVar35._0_16_ = auVar153;
  auVar35._20_4_ = fVar259 * auVar112._20_4_;
  auVar35._24_4_ = fVar260 * auVar112._24_4_;
  auVar35._28_4_ = auVar112._28_4_;
  auVar136 = vpminsd_avx(auVar33._16_16_,auVar34._16_16_);
  auVar217 = vpminsd_avx(auVar261,auVar177);
  auVar310._16_16_ = auVar136;
  auVar310._0_16_ = auVar217;
  auVar136 = vpminsd_avx(auVar29._16_16_,auVar31._16_16_);
  auVar217 = vpminsd_avx(auVar125,auVar213);
  auVar361._16_16_ = auVar136;
  auVar361._0_16_ = auVar217;
  auVar112 = vmaxps_avx(auVar310,auVar361);
  auVar136 = vpminsd_avx(auVar28._16_16_,auVar35._16_16_);
  auVar217 = vpminsd_avx(auVar97,auVar153);
  auVar395._16_16_ = auVar136;
  auVar395._0_16_ = auVar217;
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar403._4_4_ = uVar3;
  auVar403._0_4_ = uVar3;
  auVar403._8_4_ = uVar3;
  auVar403._12_4_ = uVar3;
  auVar403._16_4_ = uVar3;
  auVar403._20_4_ = uVar3;
  auVar403._24_4_ = uVar3;
  auVar403._28_4_ = uVar3;
  auVar27 = vmaxps_avx(auVar395,auVar403);
  auVar112 = vmaxps_avx(auVar112,auVar27);
  local_2c0._4_4_ = auVar112._4_4_ * 0.99999964;
  local_2c0._0_4_ = auVar112._0_4_ * 0.99999964;
  local_2c0._8_4_ = auVar112._8_4_ * 0.99999964;
  local_2c0._12_4_ = auVar112._12_4_ * 0.99999964;
  local_2c0._16_4_ = auVar112._16_4_ * 0.99999964;
  local_2c0._20_4_ = auVar112._20_4_ * 0.99999964;
  local_2c0._24_4_ = auVar112._24_4_ * 0.99999964;
  local_2c0._28_4_ = auVar112._28_4_;
  auVar136 = vpmaxsd_avx(auVar33._16_16_,auVar34._16_16_);
  auVar217 = vpmaxsd_avx(auVar261,auVar177);
  auVar200._16_16_ = auVar136;
  auVar200._0_16_ = auVar217;
  auVar136 = vpmaxsd_avx(auVar29._16_16_,auVar31._16_16_);
  auVar217 = vpmaxsd_avx(auVar125,auVar213);
  auVar147._16_16_ = auVar136;
  auVar147._0_16_ = auVar217;
  auVar112 = vminps_avx(auVar200,auVar147);
  auVar136 = vpmaxsd_avx(auVar28._16_16_,auVar35._16_16_);
  auVar217 = vpmaxsd_avx(auVar97,auVar153);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar170._4_4_ = uVar3;
  auVar170._0_4_ = uVar3;
  auVar170._8_4_ = uVar3;
  auVar170._12_4_ = uVar3;
  auVar170._16_4_ = uVar3;
  auVar170._20_4_ = uVar3;
  auVar170._24_4_ = uVar3;
  auVar170._28_4_ = uVar3;
  auVar114._16_16_ = auVar136;
  auVar114._0_16_ = auVar217;
  auVar27 = vminps_avx(auVar114,auVar170);
  auVar112 = vminps_avx(auVar112,auVar27);
  auVar36._4_4_ = auVar112._4_4_ * 1.0000004;
  auVar36._0_4_ = auVar112._0_4_ * 1.0000004;
  auVar36._8_4_ = auVar112._8_4_ * 1.0000004;
  auVar36._12_4_ = auVar112._12_4_ * 1.0000004;
  auVar36._16_4_ = auVar112._16_4_ * 1.0000004;
  auVar36._20_4_ = auVar112._20_4_ * 1.0000004;
  auVar36._24_4_ = auVar112._24_4_ * 1.0000004;
  auVar36._28_4_ = auVar112._28_4_;
  auVar112 = vcmpps_avx(local_2c0,auVar36,2);
  auVar136 = vpshufd_avx(ZEXT116((byte)PVar19),0);
  auVar148._16_16_ = auVar136;
  auVar148._0_16_ = auVar136;
  auVar27 = vcvtdq2ps_avx(auVar148);
  auVar27 = vcmpps_avx(_DAT_02020f40,auVar27,1);
  auVar112 = vandps_avx(auVar112,auVar27);
  uVar86 = vmovmskps_avx(auVar112);
  if (uVar86 == 0) {
    return;
  }
  uVar86 = uVar86 & 0xff;
  auVar115._16_16_ = mm_lookupmask_ps._240_16_;
  auVar115._0_16_ = mm_lookupmask_ps._240_16_;
  local_340 = vblendps_avx(auVar115,ZEXT832(0) << 0x20,0x80);
  uVar93 = 1 << ((byte)k & 0x1f);
  uVar88 = (ulong)((uVar93 & 0xf) << 4);
  lVar95 = (long)((int)uVar93 >> 4) * 0x10;
  auVar404 = ZEXT464(0) << 0x20;
LAB_012a4bec:
  lVar90 = 0;
  if (uVar86 != 0) {
    for (; (uVar86 >> lVar90 & 1) == 0; lVar90 = lVar90 + 1) {
    }
  }
  uVar93 = *(uint *)(prim + 2);
  pGVar21 = (context->scene->geometries).items[uVar93].ptr;
  fVar176 = (pGVar21->time_range).lower;
  fVar176 = pGVar21->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar176) / ((pGVar21->time_range).upper - fVar176));
  auVar136 = vroundss_avx(ZEXT416((uint)fVar176),ZEXT416((uint)fVar176),9);
  auVar136 = vminss_avx(auVar136,ZEXT416((uint)(pGVar21->fnumTimeSegments + -1.0)));
  auVar136 = vmaxss_avx(ZEXT816(0) << 0x20,auVar136);
  uVar20 = *(uint *)(prim + lVar90 * 4 + 6);
  uVar89 = (ulong)*(uint *)(*(long *)&pGVar21->field_0x58 +
                           (ulong)uVar20 *
                           pGVar21[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var22 = pGVar21[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar94 = (long)(int)auVar136._0_4_ * 0x38;
  lVar23 = *(long *)(_Var22 + lVar94);
  lVar24 = *(long *)(_Var22 + 0x10 + lVar94);
  pfVar2 = (float *)(lVar23 + lVar24 * uVar89);
  fVar211 = *pfVar2;
  fVar122 = pfVar2[1];
  fVar205 = pfVar2[2];
  fVar174 = pfVar2[3];
  lVar90 = uVar89 + 1;
  pfVar2 = (float *)(lVar23 + lVar24 * lVar90);
  fVar123 = *pfVar2;
  fVar206 = pfVar2[1];
  fVar232 = pfVar2[2];
  fVar152 = pfVar2[3];
  lVar96 = uVar89 + 2;
  pfVar2 = (float *)(lVar23 + lVar24 * lVar96);
  fVar207 = *pfVar2;
  fVar234 = pfVar2[1];
  fVar331 = pfVar2[2];
  fVar208 = pfVar2[3];
  lVar1 = uVar89 + 3;
  pfVar2 = (float *)(lVar23 + lVar24 * lVar1);
  fVar237 = *pfVar2;
  fVar209 = pfVar2[1];
  fVar238 = pfVar2[2];
  fVar210 = pfVar2[3];
  lVar23 = *(long *)&pGVar21[4].fnumTimeSegments;
  lVar24 = *(long *)(lVar23 + lVar94);
  lVar25 = *(long *)(lVar23 + 0x10 + lVar94);
  pfVar2 = (float *)(lVar24 + lVar25 * uVar89);
  fVar239 = *pfVar2;
  fVar240 = pfVar2[1];
  fVar255 = pfVar2[2];
  fVar256 = pfVar2[3];
  pfVar2 = (float *)(lVar24 + lVar25 * lVar90);
  fVar257 = *pfVar2;
  fVar258 = pfVar2[1];
  fVar259 = pfVar2[2];
  fVar260 = pfVar2[3];
  pfVar2 = (float *)(lVar24 + lVar25 * lVar96);
  fVar175 = *pfVar2;
  fVar332 = pfVar2[1];
  fVar333 = pfVar2[2];
  fVar349 = pfVar2[3];
  fVar176 = fVar176 - auVar136._0_4_;
  pfVar2 = (float *)(lVar24 + lVar25 * lVar1);
  fVar212 = *pfVar2;
  fVar230 = pfVar2[1];
  fVar233 = pfVar2[2];
  fVar235 = pfVar2[3];
  fVar362 = auVar404._8_4_;
  fVar231 = auVar404._12_4_;
  auVar98._0_4_ = fVar123 * 0.0 + fVar207 * 0.5 + fVar237 * 0.0;
  auVar98._4_4_ = fVar206 * 0.0 + fVar234 * 0.5 + fVar209 * 0.0;
  auVar98._8_4_ = fVar362 * fVar232 + fVar331 * 0.5 + fVar238 * fVar362;
  auVar98._12_4_ = fVar231 * fVar152 + fVar208 * 0.5 + fVar210 * fVar231;
  auVar154._0_4_ = fVar211 * 0.5;
  auVar154._4_4_ = fVar122 * 0.5;
  auVar154._8_4_ = fVar205 * 0.5;
  auVar154._12_4_ = fVar174 * 0.5;
  auVar135 = vsubps_avx(auVar98,auVar154);
  auVar99._0_4_ = fVar257 * 0.0 + fVar175 * 0.5 + fVar212 * 0.0;
  auVar99._4_4_ = fVar258 * 0.0 + fVar332 * 0.5 + fVar230 * 0.0;
  auVar99._8_4_ = fVar362 * fVar259 + fVar333 * 0.5 + fVar233 * fVar362;
  auVar99._12_4_ = fVar231 * fVar260 + fVar349 * 0.5 + fVar235 * fVar231;
  auVar400._0_4_ = fVar239 * 0.5;
  auVar400._4_4_ = fVar240 * 0.5;
  auVar400._8_4_ = fVar255 * 0.5;
  auVar400._12_4_ = fVar256 * 0.5;
  auVar297 = vsubps_avx(auVar99,auVar400);
  local_720._0_4_ = fVar211 * -0.0 + fVar207 * 0.0 + fVar237 * -0.0 + fVar123;
  local_720._4_4_ = fVar122 * -0.0 + fVar234 * 0.0 + fVar209 * -0.0 + fVar206;
  fStack_718 = fVar205 * -0.0 + fVar362 * fVar331 + fVar238 * -0.0 + fVar232;
  fStack_714 = fVar174 * -0.0 + fVar231 * fVar208 + fVar210 * -0.0 + fVar152;
  local_6c0._0_4_ = fVar211 * -0.0 + fVar123 * 0.0 + fVar207 + fVar237 * -0.0;
  local_6c0._4_4_ = fVar122 * -0.0 + fVar206 * 0.0 + fVar234 + fVar209 * -0.0;
  fStack_6b8 = fVar205 * -0.0 + fVar362 * fVar232 + fVar331 + fVar238 * -0.0;
  fStack_6b4 = fVar174 * -0.0 + fVar231 * fVar152 + fVar208 + fVar210 * -0.0;
  auVar292._0_4_ = fVar207 * 0.0 + fVar237 * 0.5;
  auVar292._4_4_ = fVar234 * 0.0 + fVar209 * 0.5;
  auVar292._8_4_ = fVar362 * fVar331 + fVar238 * 0.5;
  auVar292._12_4_ = fVar231 * fVar208 + fVar210 * 0.5;
  auVar214._0_4_ = fVar123 * 0.5;
  auVar214._4_4_ = fVar206 * 0.5;
  auVar214._8_4_ = fVar232 * 0.5;
  auVar214._12_4_ = fVar152 * 0.5;
  auVar136 = vsubps_avx(auVar292,auVar214);
  auVar407._0_4_ = fVar239 * -0.0 + fVar175 * 0.0 + fVar212 * -0.0 + fVar257;
  auVar407._4_4_ = fVar240 * -0.0 + fVar332 * 0.0 + fVar230 * -0.0 + fVar258;
  auVar407._8_4_ = fVar255 * -0.0 + fVar333 * 0.0 + fVar233 * -0.0 + fVar259;
  auVar407._12_4_ = fVar256 * -0.0 + fVar349 * 0.0 + fVar235 * -0.0 + fVar260;
  auVar313._0_4_ = fVar211 * 0.0 + auVar136._0_4_;
  auVar313._4_4_ = fVar122 * 0.0 + auVar136._4_4_;
  auVar313._8_4_ = fVar205 * 0.0 + auVar136._8_4_;
  auVar313._12_4_ = fVar174 * 0.0 + auVar136._12_4_;
  auVar178._0_4_ = fVar239 * -0.0 + fVar257 * 0.0 + fVar175 + fVar212 * -0.0;
  auVar178._4_4_ = fVar240 * -0.0 + fVar258 * 0.0 + fVar332 + fVar230 * -0.0;
  auVar178._8_4_ = fVar255 * -0.0 + fVar362 * fVar259 + fVar333 + fVar233 * -0.0;
  auVar178._12_4_ = fVar256 * -0.0 + fVar231 * fVar260 + fVar349 + fVar235 * -0.0;
  auVar215._0_4_ = fVar175 * 0.0 + fVar212 * 0.5;
  auVar215._4_4_ = fVar332 * 0.0 + fVar230 * 0.5;
  auVar215._8_4_ = fVar333 * 0.0 + fVar233 * 0.5;
  auVar215._12_4_ = fVar349 * 0.0 + fVar235 * 0.5;
  auVar276._0_4_ = fVar257 * 0.5;
  auVar276._4_4_ = fVar258 * 0.5;
  auVar276._8_4_ = fVar259 * 0.5;
  auVar276._12_4_ = fVar260 * 0.5;
  auVar136 = vsubps_avx(auVar215,auVar276);
  auVar216._0_4_ = fVar239 * 0.0 + auVar136._0_4_;
  auVar216._4_4_ = fVar240 * 0.0 + auVar136._4_4_;
  auVar216._8_4_ = fVar255 * 0.0 + auVar136._8_4_;
  auVar216._12_4_ = fVar256 * 0.0 + auVar136._12_4_;
  auVar136 = vshufps_avx(auVar135,auVar135,0xc9);
  auVar217 = vshufps_avx(auVar407,auVar407,0xc9);
  fVar362 = auVar135._0_4_;
  auVar242._0_4_ = fVar362 * auVar217._0_4_;
  fVar231 = auVar135._4_4_;
  auVar242._4_4_ = fVar231 * auVar217._4_4_;
  fVar363 = auVar135._8_4_;
  auVar242._8_4_ = fVar363 * auVar217._8_4_;
  fVar236 = auVar135._12_4_;
  auVar242._12_4_ = fVar236 * auVar217._12_4_;
  auVar293._0_4_ = auVar407._0_4_ * auVar136._0_4_;
  auVar293._4_4_ = auVar407._4_4_ * auVar136._4_4_;
  auVar293._8_4_ = auVar407._8_4_ * auVar136._8_4_;
  auVar293._12_4_ = auVar407._12_4_ * auVar136._12_4_;
  auVar217 = vsubps_avx(auVar293,auVar242);
  auVar252 = vshufps_avx(auVar217,auVar217,0xc9);
  auVar217 = vshufps_avx(auVar297,auVar297,0xc9);
  auVar294._0_4_ = auVar217._0_4_ * fVar362;
  auVar294._4_4_ = auVar217._4_4_ * fVar231;
  auVar294._8_4_ = auVar217._8_4_ * fVar363;
  auVar294._12_4_ = auVar217._12_4_ * fVar236;
  auVar100._0_4_ = auVar136._0_4_ * auVar297._0_4_;
  auVar100._4_4_ = auVar136._4_4_ * auVar297._4_4_;
  auVar100._8_4_ = auVar136._8_4_ * auVar297._8_4_;
  auVar100._12_4_ = auVar136._12_4_ * auVar297._12_4_;
  auVar136 = vsubps_avx(auVar100,auVar294);
  auVar297 = vshufps_avx(auVar136,auVar136,0xc9);
  auVar136 = vshufps_avx(auVar313,auVar313,0xc9);
  auVar217 = vshufps_avx(auVar178,auVar178,0xc9);
  auVar295._0_4_ = auVar313._0_4_ * auVar217._0_4_;
  auVar295._4_4_ = auVar313._4_4_ * auVar217._4_4_;
  auVar295._8_4_ = auVar313._8_4_ * auVar217._8_4_;
  auVar295._12_4_ = auVar313._12_4_ * auVar217._12_4_;
  auVar179._0_4_ = auVar136._0_4_ * auVar178._0_4_;
  auVar179._4_4_ = auVar136._4_4_ * auVar178._4_4_;
  auVar179._8_4_ = auVar136._8_4_ * auVar178._8_4_;
  auVar179._12_4_ = auVar136._12_4_ * auVar178._12_4_;
  auVar217 = vsubps_avx(auVar179,auVar295);
  auVar263 = vshufps_avx(auVar217,auVar217,0xc9);
  auVar217 = vshufps_avx(auVar216,auVar216,0xc9);
  auVar296._0_4_ = auVar313._0_4_ * auVar217._0_4_;
  auVar296._4_4_ = auVar313._4_4_ * auVar217._4_4_;
  auVar296._8_4_ = auVar313._8_4_ * auVar217._8_4_;
  auVar296._12_4_ = auVar313._12_4_ * auVar217._12_4_;
  auVar101._0_4_ = auVar136._0_4_ * auVar216._0_4_;
  auVar101._4_4_ = auVar136._4_4_ * auVar216._4_4_;
  auVar101._8_4_ = auVar136._8_4_ * auVar216._8_4_;
  auVar101._12_4_ = auVar136._12_4_ * auVar216._12_4_;
  auVar136 = vdpps_avx(auVar252,auVar252,0x7f);
  auVar217 = vsubps_avx(auVar101,auVar296);
  auVar6 = vshufps_avx(auVar217,auVar217,0xc9);
  fVar122 = auVar136._0_4_;
  auVar110 = ZEXT416((uint)fVar122);
  auVar217 = vrsqrtss_avx(auVar110,auVar110);
  fVar211 = auVar217._0_4_;
  auVar217 = ZEXT416((uint)(fVar211 * 1.5 - fVar122 * 0.5 * fVar211 * fVar211 * fVar211));
  auVar194 = vshufps_avx(auVar217,auVar217,0);
  fVar257 = auVar194._0_4_ * auVar252._0_4_;
  fVar258 = auVar194._4_4_ * auVar252._4_4_;
  fVar259 = auVar194._8_4_ * auVar252._8_4_;
  fVar260 = auVar194._12_4_ * auVar252._12_4_;
  auVar217 = vdpps_avx(auVar252,auVar297,0x7f);
  auVar136 = vshufps_avx(auVar136,auVar136,0);
  auVar277._0_4_ = auVar136._0_4_ * auVar297._0_4_;
  auVar277._4_4_ = auVar136._4_4_ * auVar297._4_4_;
  auVar277._8_4_ = auVar136._8_4_ * auVar297._8_4_;
  auVar277._12_4_ = auVar136._12_4_ * auVar297._12_4_;
  auVar136 = vshufps_avx(auVar217,auVar217,0);
  auVar243._0_4_ = auVar136._0_4_ * auVar252._0_4_;
  auVar243._4_4_ = auVar136._4_4_ * auVar252._4_4_;
  auVar243._8_4_ = auVar136._8_4_ * auVar252._8_4_;
  auVar243._12_4_ = auVar136._12_4_ * auVar252._12_4_;
  auVar193 = vsubps_avx(auVar277,auVar243);
  auVar136 = vrcpss_avx(auVar110,auVar110);
  auVar136 = ZEXT416((uint)((2.0 - fVar122 * auVar136._0_4_) * auVar136._0_4_));
  auVar252 = vshufps_avx(auVar136,auVar136,0);
  auVar136 = vdpps_avx(auVar263,auVar263,0x7f);
  fVar175 = auVar136._0_4_;
  auVar297 = ZEXT416((uint)fVar175);
  auVar217 = vrsqrtss_avx(auVar297,auVar297);
  fVar239 = auVar217._0_4_;
  auVar217 = vdpps_avx(auVar263,auVar6,0x7f);
  auVar136 = vshufps_avx(auVar136,auVar136,0);
  auVar408._0_4_ = auVar136._0_4_ * auVar6._0_4_;
  auVar408._4_4_ = auVar136._4_4_ * auVar6._4_4_;
  auVar408._8_4_ = auVar136._8_4_ * auVar6._8_4_;
  auVar408._12_4_ = auVar136._12_4_ * auVar6._12_4_;
  lVar24 = *(long *)(_Var22 + 0x38 + lVar94);
  lVar25 = *(long *)(_Var22 + 0x48 + lVar94);
  pfVar2 = (float *)(lVar24 + lVar25 * uVar89);
  fVar211 = *pfVar2;
  fVar122 = pfVar2[1];
  fVar205 = pfVar2[2];
  fVar174 = pfVar2[3];
  pfVar2 = (float *)(lVar24 + lVar25 * lVar90);
  fVar123 = *pfVar2;
  fVar206 = pfVar2[1];
  fVar232 = pfVar2[2];
  fVar152 = pfVar2[3];
  pfVar2 = (float *)(lVar24 + lVar25 * lVar96);
  fVar207 = *pfVar2;
  fVar234 = pfVar2[1];
  fVar331 = pfVar2[2];
  fVar208 = pfVar2[3];
  auVar136 = vshufps_avx(auVar217,auVar217,0);
  auVar102._0_4_ = auVar136._0_4_ * auVar263._0_4_;
  auVar102._4_4_ = auVar136._4_4_ * auVar263._4_4_;
  auVar102._8_4_ = auVar136._8_4_ * auVar263._8_4_;
  auVar102._12_4_ = auVar136._12_4_ * auVar263._12_4_;
  auVar6 = vsubps_avx(auVar408,auVar102);
  pfVar2 = (float *)(lVar24 + lVar25 * lVar1);
  fVar237 = *pfVar2;
  fVar209 = pfVar2[1];
  fVar238 = pfVar2[2];
  fVar210 = pfVar2[3];
  lVar24 = *(long *)(lVar23 + 0x38 + lVar94);
  lVar23 = *(long *)(lVar23 + 0x48 + lVar94);
  auVar136 = ZEXT416((uint)(fVar239 * 1.5 - fVar175 * 0.5 * fVar239 * fVar239 * fVar239));
  auVar217 = vshufps_avx(auVar136,auVar136,0);
  fVar239 = auVar217._0_4_ * auVar263._0_4_;
  fVar240 = auVar217._4_4_ * auVar263._4_4_;
  fVar255 = auVar217._8_4_ * auVar263._8_4_;
  fVar256 = auVar217._12_4_ * auVar263._12_4_;
  auVar136 = vrcpss_avx(auVar297,auVar297);
  auVar136 = ZEXT416((uint)(auVar136._0_4_ * (2.0 - auVar136._0_4_ * fVar175)));
  auVar136 = vshufps_avx(auVar136,auVar136,0);
  auVar297 = vshufps_avx(_local_720,_local_720,0xff);
  auVar369._0_4_ = auVar297._0_4_ * fVar257;
  auVar369._4_4_ = auVar297._4_4_ * fVar258;
  auVar369._8_4_ = auVar297._8_4_ * fVar259;
  auVar369._12_4_ = auVar297._12_4_ * fVar260;
  auVar263 = vshufps_avx(auVar135,auVar135,0xff);
  auVar110 = vsubps_avx(_local_720,auVar369);
  auVar278._0_4_ =
       auVar263._0_4_ * fVar257 + auVar297._0_4_ * auVar194._0_4_ * auVar193._0_4_ * auVar252._0_4_;
  auVar278._4_4_ =
       auVar263._4_4_ * fVar258 + auVar297._4_4_ * auVar194._4_4_ * auVar193._4_4_ * auVar252._4_4_;
  auVar278._8_4_ =
       auVar263._8_4_ * fVar259 + auVar297._8_4_ * auVar194._8_4_ * auVar193._8_4_ * auVar252._8_4_;
  auVar278._12_4_ =
       auVar263._12_4_ * fVar260 +
       auVar297._12_4_ * auVar194._12_4_ * auVar193._12_4_ * auVar252._12_4_;
  auVar193 = vsubps_avx(auVar135,auVar278);
  local_720._0_4_ = auVar369._0_4_ + (float)local_720._0_4_;
  local_720._4_4_ = auVar369._4_4_ + (float)local_720._4_4_;
  fStack_718 = auVar369._8_4_ + fStack_718;
  fStack_714 = auVar369._12_4_ + fStack_714;
  auVar252 = vshufps_avx(_local_6c0,_local_6c0,0xff);
  auVar155._0_4_ = auVar252._0_4_ * fVar239;
  auVar155._4_4_ = auVar252._4_4_ * fVar240;
  auVar155._8_4_ = auVar252._8_4_ * fVar255;
  auVar155._12_4_ = auVar252._12_4_ * fVar256;
  auVar297 = vshufps_avx(auVar313,auVar313,0xff);
  auVar163 = vsubps_avx(_local_6c0,auVar155);
  auVar103._0_4_ =
       auVar297._0_4_ * fVar239 + auVar252._0_4_ * auVar217._0_4_ * auVar6._0_4_ * auVar136._0_4_;
  auVar103._4_4_ =
       auVar297._4_4_ * fVar240 + auVar252._4_4_ * auVar217._4_4_ * auVar6._4_4_ * auVar136._4_4_;
  auVar103._8_4_ =
       auVar297._8_4_ * fVar255 + auVar252._8_4_ * auVar217._8_4_ * auVar6._8_4_ * auVar136._8_4_;
  auVar103._12_4_ =
       auVar297._12_4_ * fVar256 +
       auVar252._12_4_ * auVar217._12_4_ * auVar6._12_4_ * auVar136._12_4_;
  auVar7 = vsubps_avx(auVar313,auVar103);
  local_6c0._0_4_ = (float)local_6c0._0_4_ + auVar155._0_4_;
  local_6c0._4_4_ = (float)local_6c0._4_4_ + auVar155._4_4_;
  fStack_6b8 = fStack_6b8 + auVar155._8_4_;
  fStack_6b4 = fStack_6b4 + auVar155._12_4_;
  auVar104._0_4_ = fVar123 * 0.0 + fVar207 * 0.5 + fVar237 * 0.0;
  auVar104._4_4_ = fVar206 * 0.0 + fVar234 * 0.5 + fVar209 * 0.0;
  auVar104._8_4_ = fVar232 * 0.0 + fVar331 * 0.5 + fVar238 * 0.0;
  auVar104._12_4_ = fVar152 * 0.0 + fVar208 * 0.5 + fVar210 * 0.0;
  auVar126._0_4_ = fVar211 * 0.5;
  auVar126._4_4_ = fVar122 * 0.5;
  auVar126._8_4_ = fVar205 * 0.5;
  auVar126._12_4_ = fVar174 * 0.5;
  auVar8 = vsubps_avx(auVar104,auVar126);
  pfVar2 = (float *)(lVar24 + lVar96 * lVar23);
  fVar239 = *pfVar2;
  fVar240 = pfVar2[1];
  fVar255 = pfVar2[2];
  fVar256 = pfVar2[3];
  auVar136 = *(undefined1 (*) [16])(lVar24 + lVar23 * lVar1);
  fVar212 = auVar136._0_4_;
  fVar230 = auVar136._4_4_;
  fVar233 = auVar136._8_4_;
  fVar235 = auVar136._12_4_;
  pfVar2 = (float *)(lVar24 + lVar90 * lVar23);
  fVar257 = *pfVar2;
  fVar258 = pfVar2[1];
  fVar259 = pfVar2[2];
  fVar260 = pfVar2[3];
  auVar262._0_4_ = fVar257 * 0.0 + fVar212 * 0.0 + fVar239 * 0.5;
  auVar262._4_4_ = fVar258 * 0.0 + fVar230 * 0.0 + fVar240 * 0.5;
  auVar262._8_4_ = fVar259 * 0.0 + fVar233 * 0.0 + fVar255 * 0.5;
  auVar262._12_4_ = fVar260 * 0.0 + fVar235 * 0.0 + fVar256 * 0.5;
  pfVar2 = (float *)(lVar24 + uVar89 * lVar23);
  fVar175 = *pfVar2;
  fVar332 = pfVar2[1];
  fVar333 = pfVar2[2];
  fVar349 = pfVar2[3];
  auVar298._0_4_ = fVar175 * 0.5;
  auVar298._4_4_ = fVar332 * 0.5;
  auVar298._8_4_ = fVar333 * 0.5;
  auVar298._12_4_ = fVar349 * 0.5;
  auVar217 = vsubps_avx(auVar262,auVar298);
  auVar299._0_4_ = fVar211 * -0.0 + fVar123 + fVar207 * 0.0 + fVar237 * -0.0;
  auVar299._4_4_ = fVar122 * -0.0 + fVar206 + fVar234 * 0.0 + fVar209 * -0.0;
  auVar299._8_4_ = fVar205 * -0.0 + fVar232 + fVar331 * 0.0 + fVar238 * -0.0;
  auVar299._12_4_ = fVar174 * -0.0 + fVar152 + fVar208 * 0.0 + fVar210 * -0.0;
  auVar279._0_4_ = fVar211 * -0.0 + fVar123 * 0.0 + fVar207 + fVar237 * -0.0;
  auVar279._4_4_ = fVar122 * -0.0 + fVar206 * 0.0 + fVar234 + fVar209 * -0.0;
  auVar279._8_4_ = fVar205 * -0.0 + fVar232 * 0.0 + fVar331 + fVar238 * -0.0;
  auVar279._12_4_ = fVar174 * -0.0 + fVar152 * 0.0 + fVar208 + fVar210 * -0.0;
  auVar334._0_4_ = fVar207 * 0.0 + fVar237 * 0.5;
  auVar334._4_4_ = fVar234 * 0.0 + fVar209 * 0.5;
  auVar334._8_4_ = fVar331 * 0.0 + fVar238 * 0.5;
  auVar334._12_4_ = fVar208 * 0.0 + fVar210 * 0.5;
  auVar370._0_4_ = fVar123 * 0.5;
  auVar370._4_4_ = fVar206 * 0.5;
  auVar370._8_4_ = fVar232 * 0.5;
  auVar370._12_4_ = fVar152 * 0.5;
  auVar136 = vsubps_avx(auVar334,auVar370);
  auVar350._0_4_ = fVar211 * 0.0 + auVar136._0_4_;
  auVar350._4_4_ = fVar122 * 0.0 + auVar136._4_4_;
  auVar350._8_4_ = fVar205 * 0.0 + auVar136._8_4_;
  auVar350._12_4_ = fVar174 * 0.0 + auVar136._12_4_;
  auVar335._0_4_ = fVar175 * -0.0 + fVar257 + fVar212 * -0.0 + fVar239 * 0.0;
  auVar335._4_4_ = fVar332 * -0.0 + fVar258 + fVar230 * -0.0 + fVar240 * 0.0;
  auVar335._8_4_ = fVar333 * -0.0 + fVar259 + fVar233 * -0.0 + fVar255 * 0.0;
  auVar335._12_4_ = fVar349 * -0.0 + fVar260 + fVar235 * -0.0 + fVar256 * 0.0;
  auVar127._0_4_ = fVar175 * -0.0 + fVar212 * -0.0 + fVar239 + fVar257 * 0.0;
  auVar127._4_4_ = fVar332 * -0.0 + fVar230 * -0.0 + fVar240 + fVar258 * 0.0;
  auVar127._8_4_ = fVar333 * -0.0 + fVar233 * -0.0 + fVar255 + fVar259 * 0.0;
  auVar127._12_4_ = fVar349 * -0.0 + fVar235 * -0.0 + fVar256 + fVar260 * 0.0;
  auVar156._0_4_ = fVar239 * 0.0 + fVar212 * 0.5;
  auVar156._4_4_ = fVar240 * 0.0 + fVar230 * 0.5;
  auVar156._8_4_ = fVar255 * 0.0 + fVar233 * 0.5;
  auVar156._12_4_ = fVar256 * 0.0 + fVar235 * 0.5;
  auVar180._0_4_ = fVar257 * 0.5;
  auVar180._4_4_ = fVar258 * 0.5;
  auVar180._8_4_ = fVar259 * 0.5;
  auVar180._12_4_ = fVar260 * 0.5;
  auVar136 = vsubps_avx(auVar156,auVar180);
  auVar157._0_4_ = fVar175 * 0.0 + auVar136._0_4_;
  auVar157._4_4_ = fVar332 * 0.0 + auVar136._4_4_;
  auVar157._8_4_ = fVar333 * 0.0 + auVar136._8_4_;
  auVar157._12_4_ = fVar349 * 0.0 + auVar136._12_4_;
  auVar136 = vshufps_avx(auVar335,auVar335,0xc9);
  fVar207 = auVar8._0_4_;
  auVar105._0_4_ = fVar207 * auVar136._0_4_;
  fVar234 = auVar8._4_4_;
  auVar105._4_4_ = fVar234 * auVar136._4_4_;
  fVar331 = auVar8._8_4_;
  auVar105._8_4_ = fVar331 * auVar136._8_4_;
  fVar209 = auVar8._12_4_;
  auVar105._12_4_ = fVar209 * auVar136._12_4_;
  auVar136 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar336._0_4_ = auVar335._0_4_ * auVar136._0_4_;
  auVar336._4_4_ = auVar335._4_4_ * auVar136._4_4_;
  auVar336._8_4_ = auVar335._8_4_ * auVar136._8_4_;
  auVar336._12_4_ = auVar335._12_4_ * auVar136._12_4_;
  auVar252 = vsubps_avx(auVar336,auVar105);
  auVar106._0_4_ = auVar136._0_4_ * auVar217._0_4_;
  auVar106._4_4_ = auVar136._4_4_ * auVar217._4_4_;
  auVar106._8_4_ = auVar136._8_4_ * auVar217._8_4_;
  auVar106._12_4_ = auVar136._12_4_ * auVar217._12_4_;
  auVar136 = vshufps_avx(auVar217,auVar217,0xc9);
  auVar181._0_4_ = fVar207 * auVar136._0_4_;
  auVar181._4_4_ = fVar234 * auVar136._4_4_;
  auVar181._8_4_ = fVar331 * auVar136._8_4_;
  auVar181._12_4_ = fVar209 * auVar136._12_4_;
  auVar297 = vsubps_avx(auVar106,auVar181);
  auVar136 = vshufps_avx(auVar127,auVar127,0xc9);
  auVar107._0_4_ = auVar350._0_4_ * auVar136._0_4_;
  auVar107._4_4_ = auVar350._4_4_ * auVar136._4_4_;
  auVar107._8_4_ = auVar350._8_4_ * auVar136._8_4_;
  auVar107._12_4_ = auVar350._12_4_ * auVar136._12_4_;
  auVar136 = vshufps_avx(auVar350,auVar350,0xc9);
  auVar128._0_4_ = auVar136._0_4_ * auVar127._0_4_;
  auVar128._4_4_ = auVar136._4_4_ * auVar127._4_4_;
  auVar128._8_4_ = auVar136._8_4_ * auVar127._8_4_;
  auVar128._12_4_ = auVar136._12_4_ * auVar127._12_4_;
  auVar6 = vsubps_avx(auVar128,auVar107);
  auVar129._0_4_ = auVar136._0_4_ * auVar157._0_4_;
  auVar129._4_4_ = auVar136._4_4_ * auVar157._4_4_;
  auVar129._8_4_ = auVar136._8_4_ * auVar157._8_4_;
  auVar129._12_4_ = auVar136._12_4_ * auVar157._12_4_;
  auVar136 = vshufps_avx(auVar157,auVar157,0xc9);
  auVar158._0_4_ = auVar350._0_4_ * auVar136._0_4_;
  auVar158._4_4_ = auVar350._4_4_ * auVar136._4_4_;
  auVar158._8_4_ = auVar350._8_4_ * auVar136._8_4_;
  auVar158._12_4_ = auVar350._12_4_ * auVar136._12_4_;
  auVar194 = vsubps_avx(auVar129,auVar158);
  auVar252 = vshufps_avx(auVar252,auVar252,0xc9);
  auVar136 = vdpps_avx(auVar252,auVar252,0x7f);
  fVar211 = auVar136._0_4_;
  auVar263 = ZEXT416((uint)fVar211);
  auVar217 = vrsqrtss_avx(auVar263,auVar263);
  fVar122 = auVar217._0_4_;
  auVar297 = vshufps_avx(auVar297,auVar297,0xc9);
  auVar217 = vdpps_avx(auVar252,auVar297,0x7f);
  auVar136 = vshufps_avx(auVar136,auVar136,0);
  auVar182._0_4_ = auVar136._0_4_ * auVar297._0_4_;
  auVar182._4_4_ = auVar136._4_4_ * auVar297._4_4_;
  auVar182._8_4_ = auVar136._8_4_ * auVar297._8_4_;
  auVar182._12_4_ = auVar136._12_4_ * auVar297._12_4_;
  auVar136 = vshufps_avx(auVar217,auVar217,0);
  auVar371._0_4_ = auVar136._0_4_ * auVar252._0_4_;
  auVar371._4_4_ = auVar136._4_4_ * auVar252._4_4_;
  auVar371._8_4_ = auVar136._8_4_ * auVar252._8_4_;
  auVar371._12_4_ = auVar136._12_4_ * auVar252._12_4_;
  auVar282 = vsubps_avx(auVar182,auVar371);
  auVar136 = vrcpss_avx(auVar263,auVar263);
  auVar136 = ZEXT416((uint)(auVar136._0_4_ * (2.0 - fVar211 * auVar136._0_4_)));
  auVar297 = vshufps_avx(auVar136,auVar136,0);
  auVar136 = ZEXT416((uint)(fVar122 * 1.5 - fVar211 * 0.5 * fVar122 * fVar122 * fVar122));
  auVar263 = vshufps_avx(auVar136,auVar136,0);
  fVar123 = auVar252._0_4_ * auVar263._0_4_;
  fVar206 = auVar252._4_4_ * auVar263._4_4_;
  fVar232 = auVar252._8_4_ * auVar263._8_4_;
  fVar152 = auVar252._12_4_ * auVar263._12_4_;
  auVar6 = vshufps_avx(auVar6,auVar6,0xc9);
  auVar217 = vdpps_avx(auVar6,auVar6,0x7f);
  auVar136 = vblendps_avx(auVar217,_DAT_01feba10,0xe);
  auVar252 = vrsqrtss_avx(auVar136,auVar136);
  fVar211 = auVar252._0_4_;
  auVar194 = vshufps_avx(auVar194,auVar194,0xc9);
  auVar252 = vdpps_avx(auVar6,auVar194,0x7f);
  auVar135 = vshufps_avx(auVar217,auVar217,0);
  auVar337._0_4_ = auVar135._0_4_ * auVar194._0_4_;
  auVar337._4_4_ = auVar135._4_4_ * auVar194._4_4_;
  auVar337._8_4_ = auVar135._8_4_ * auVar194._8_4_;
  auVar337._12_4_ = auVar135._12_4_ * auVar194._12_4_;
  auVar252 = vshufps_avx(auVar252,auVar252,0);
  auVar372._0_4_ = auVar252._0_4_ * auVar6._0_4_;
  auVar372._4_4_ = auVar252._4_4_ * auVar6._4_4_;
  auVar372._8_4_ = auVar252._8_4_ * auVar6._8_4_;
  auVar372._12_4_ = auVar252._12_4_ * auVar6._12_4_;
  auVar194 = vsubps_avx(auVar337,auVar372);
  auVar136 = vrcpss_avx(auVar136,auVar136);
  auVar136 = ZEXT416((uint)(auVar136._0_4_ * (2.0 - auVar217._0_4_ * auVar136._0_4_)));
  auVar136 = vshufps_avx(auVar136,auVar136,0);
  auVar217 = ZEXT416((uint)(fVar211 * 1.5 - auVar217._0_4_ * 0.5 * fVar211 * fVar211 * fVar211));
  auVar217 = vshufps_avx(auVar217,auVar217,0);
  fVar211 = auVar6._0_4_ * auVar217._0_4_;
  fVar122 = auVar6._4_4_ * auVar217._4_4_;
  fVar205 = auVar6._8_4_ * auVar217._8_4_;
  fVar174 = auVar6._12_4_ * auVar217._12_4_;
  auVar252 = vshufps_avx(auVar8,auVar8,0xff);
  auVar6 = vshufps_avx(auVar299,auVar299,0xff);
  auVar130._0_4_ = auVar6._0_4_ * fVar123;
  auVar130._4_4_ = auVar6._4_4_ * fVar206;
  auVar130._8_4_ = auVar6._8_4_ * fVar232;
  auVar130._12_4_ = auVar6._12_4_ * fVar152;
  auVar183._0_4_ =
       auVar252._0_4_ * fVar123 + auVar263._0_4_ * auVar282._0_4_ * auVar297._0_4_ * auVar6._0_4_;
  auVar183._4_4_ =
       auVar252._4_4_ * fVar206 + auVar263._4_4_ * auVar282._4_4_ * auVar297._4_4_ * auVar6._4_4_;
  auVar183._8_4_ =
       auVar252._8_4_ * fVar232 + auVar263._8_4_ * auVar282._8_4_ * auVar297._8_4_ * auVar6._8_4_;
  auVar183._12_4_ =
       auVar252._12_4_ * fVar152 +
       auVar263._12_4_ * auVar282._12_4_ * auVar297._12_4_ * auVar6._12_4_;
  auVar263 = vsubps_avx(auVar299,auVar130);
  auVar6 = vsubps_avx(auVar8,auVar183);
  auVar252 = vshufps_avx(auVar350,auVar350,0xff);
  auVar297 = vshufps_avx(auVar279,auVar279,0xff);
  auVar314._0_4_ = auVar297._0_4_ * fVar211;
  auVar314._4_4_ = auVar297._4_4_ * fVar122;
  auVar314._8_4_ = auVar297._8_4_ * fVar205;
  auVar314._12_4_ = auVar297._12_4_ * fVar174;
  auVar159._0_4_ =
       auVar252._0_4_ * fVar211 + auVar297._0_4_ * auVar217._0_4_ * auVar194._0_4_ * auVar136._0_4_;
  auVar159._4_4_ =
       auVar252._4_4_ * fVar122 + auVar297._4_4_ * auVar217._4_4_ * auVar194._4_4_ * auVar136._4_4_;
  auVar159._8_4_ =
       auVar252._8_4_ * fVar205 + auVar297._8_4_ * auVar217._8_4_ * auVar194._8_4_ * auVar136._8_4_;
  auVar159._12_4_ =
       auVar252._12_4_ * fVar174 +
       auVar297._12_4_ * auVar217._12_4_ * auVar194._12_4_ * auVar136._12_4_;
  auVar252 = vsubps_avx(auVar279,auVar314);
  auVar389._0_4_ = auVar314._0_4_ + auVar279._0_4_;
  auVar389._4_4_ = auVar314._4_4_ + auVar279._4_4_;
  auVar389._8_4_ = auVar314._8_4_ + auVar279._8_4_;
  auVar389._12_4_ = auVar314._12_4_ + auVar279._12_4_;
  auVar297 = vsubps_avx(auVar350,auVar159);
  local_640 = auVar193._0_4_;
  fStack_63c = auVar193._4_4_;
  fStack_638 = auVar193._8_4_;
  fStack_634 = auVar193._12_4_;
  local_6e0 = auVar110._0_4_;
  fStack_6dc = auVar110._4_4_;
  fStack_6d8 = auVar110._8_4_;
  fStack_6d4 = auVar110._12_4_;
  auVar136 = vshufps_avx(ZEXT416((uint)fVar176),ZEXT416((uint)fVar176),0);
  auVar217 = vshufps_avx(ZEXT416((uint)(1.0 - fVar176)),ZEXT416((uint)(1.0 - fVar176)),0);
  fVar174 = auVar136._0_4_;
  fVar123 = auVar136._4_4_;
  fVar206 = auVar136._8_4_;
  fVar232 = auVar136._12_4_;
  fVar176 = auVar217._0_4_;
  fVar211 = auVar217._4_4_;
  fVar122 = auVar217._8_4_;
  fVar205 = auVar217._12_4_;
  local_480._0_4_ = fVar176 * local_6e0 + fVar174 * auVar263._0_4_;
  local_480._4_4_ = fVar211 * fStack_6dc + fVar123 * auVar263._4_4_;
  fStack_478 = fVar122 * fStack_6d8 + fVar206 * auVar263._8_4_;
  fStack_474 = fVar205 * fStack_6d4 + fVar232 * auVar263._12_4_;
  fVar208 = fVar176 * (local_6e0 + local_640 * 0.33333334) +
            fVar174 * (auVar263._0_4_ + auVar6._0_4_ * 0.33333334);
  fVar238 = fVar211 * (fStack_6dc + fStack_63c * 0.33333334) +
            fVar123 * (auVar263._4_4_ + auVar6._4_4_ * 0.33333334);
  fVar240 = fVar122 * (fStack_6d8 + fStack_638 * 0.33333334) +
            fVar206 * (auVar263._8_4_ + auVar6._8_4_ * 0.33333334);
  fVar257 = fVar205 * (fStack_6d4 + fStack_634 * 0.33333334) +
            fVar232 * (auVar263._12_4_ + auVar6._12_4_ * 0.33333334);
  local_600 = auVar7._0_4_;
  fStack_5fc = auVar7._4_4_;
  fStack_5f8 = auVar7._8_4_;
  fStack_5f4 = auVar7._12_4_;
  auVar160._0_4_ = local_600 * 0.33333334;
  auVar160._4_4_ = fStack_5fc * 0.33333334;
  auVar160._8_4_ = fStack_5f8 * 0.33333334;
  auVar160._12_4_ = fStack_5f4 * 0.33333334;
  auVar136 = vsubps_avx(auVar163,auVar160);
  auVar264._0_4_ = (auVar313._0_4_ + auVar103._0_4_) * 0.33333334;
  auVar264._4_4_ = (auVar313._4_4_ + auVar103._4_4_) * 0.33333334;
  auVar264._8_4_ = (auVar313._8_4_ + auVar103._8_4_) * 0.33333334;
  auVar264._12_4_ = (auVar313._12_4_ + auVar103._12_4_) * 0.33333334;
  auVar217 = vsubps_avx(_local_6c0,auVar264);
  auVar184._0_4_ = auVar297._0_4_ * 0.33333334;
  auVar184._4_4_ = auVar297._4_4_ * 0.33333334;
  auVar184._8_4_ = auVar297._8_4_ * 0.33333334;
  auVar184._12_4_ = auVar297._12_4_ * 0.33333334;
  auVar297 = vsubps_avx(auVar252,auVar184);
  auVar338._0_4_ = (auVar350._0_4_ + auVar159._0_4_) * 0.33333334;
  auVar338._4_4_ = (auVar350._4_4_ + auVar159._4_4_) * 0.33333334;
  auVar338._8_4_ = (auVar350._8_4_ + auVar159._8_4_) * 0.33333334;
  auVar338._12_4_ = (auVar350._12_4_ + auVar159._12_4_) * 0.33333334;
  auVar263 = vsubps_avx(auVar389,auVar338);
  local_490._0_4_ = fVar174 * auVar297._0_4_ + fVar176 * auVar136._0_4_;
  local_490._4_4_ = fVar123 * auVar297._4_4_ + fVar211 * auVar136._4_4_;
  fStack_488 = fVar206 * auVar297._8_4_ + fVar122 * auVar136._8_4_;
  fStack_484 = fVar232 * auVar297._12_4_ + fVar205 * auVar136._12_4_;
  fVar237 = fVar176 * auVar163._0_4_ + fVar174 * auVar252._0_4_;
  fVar210 = fVar211 * auVar163._4_4_ + fVar123 * auVar252._4_4_;
  fVar255 = fVar122 * auVar163._8_4_ + fVar206 * auVar252._8_4_;
  fVar258 = fVar205 * auVar163._12_4_ + fVar232 * auVar252._12_4_;
  local_4a0._0_4_ = (float)local_720._0_4_ * fVar176 + fVar174 * (auVar299._0_4_ + auVar130._0_4_);
  local_4a0._4_4_ = (float)local_720._4_4_ * fVar211 + fVar123 * (auVar299._4_4_ + auVar130._4_4_);
  fStack_498 = fStack_718 * fVar122 + fVar206 * (auVar299._8_4_ + auVar130._8_4_);
  fStack_494 = fStack_714 * fVar205 + fVar232 * (auVar299._12_4_ + auVar130._12_4_);
  local_4b0._0_4_ =
       fVar176 * ((float)local_720._0_4_ + (fVar362 + auVar278._0_4_) * 0.33333334) +
       fVar174 * (auVar299._0_4_ + auVar130._0_4_ + (fVar207 + auVar183._0_4_) * 0.33333334);
  local_4b0._4_4_ =
       fVar211 * ((float)local_720._4_4_ + (fVar231 + auVar278._4_4_) * 0.33333334) +
       fVar123 * (auVar299._4_4_ + auVar130._4_4_ + (fVar234 + auVar183._4_4_) * 0.33333334);
  fStack_4a8 = fVar122 * (fStack_718 + (fVar363 + auVar278._8_4_) * 0.33333334) +
               fVar206 * (auVar299._8_4_ + auVar130._8_4_ + (fVar331 + auVar183._8_4_) * 0.33333334)
  ;
  fStack_4a4 = fVar205 * (fStack_714 + (fVar236 + auVar278._12_4_) * 0.33333334) +
               fVar232 * (auVar299._12_4_ + auVar130._12_4_ +
                         (fVar209 + auVar183._12_4_) * 0.33333334);
  fVar209 = fVar176 * auVar217._0_4_ + fVar174 * auVar263._0_4_;
  fVar239 = fVar211 * auVar217._4_4_ + fVar123 * auVar263._4_4_;
  fVar256 = fVar122 * auVar217._8_4_ + fVar206 * auVar263._8_4_;
  fVar259 = fVar205 * auVar217._12_4_ + fVar232 * auVar263._12_4_;
  auVar136 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  local_410._0_4_ = (float)local_6c0._0_4_ * fVar176 + fVar174 * auVar389._0_4_;
  local_410._4_4_ = (float)local_6c0._4_4_ * fVar211 + fVar123 * auVar389._4_4_;
  fStack_408 = fStack_6b8 * fVar122 + fVar206 * auVar389._8_4_;
  fStack_404 = fStack_6b4 * fVar205 + fVar232 * auVar389._12_4_;
  auVar136 = vinsertps_avx(auVar136,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_380 = vsubps_avx(_local_480,auVar136);
  auVar252 = vmovsldup_avx(local_380);
  auVar217 = vmovshdup_avx(local_380);
  auVar297 = vshufps_avx(local_380,local_380,0xaa);
  fVar176 = pre->ray_space[k].vx.field_0.m128[0];
  fVar211 = pre->ray_space[k].vx.field_0.m128[1];
  fVar122 = pre->ray_space[k].vx.field_0.m128[2];
  fVar205 = pre->ray_space[k].vx.field_0.m128[3];
  fVar174 = pre->ray_space[k].vy.field_0.m128[0];
  fVar123 = pre->ray_space[k].vy.field_0.m128[1];
  fVar206 = pre->ray_space[k].vy.field_0.m128[2];
  fVar232 = pre->ray_space[k].vy.field_0.m128[3];
  fVar152 = pre->ray_space[k].vz.field_0.m128[0];
  fVar207 = pre->ray_space[k].vz.field_0.m128[1];
  fVar234 = pre->ray_space[k].vz.field_0.m128[2];
  fVar331 = pre->ray_space[k].vz.field_0.m128[3];
  local_5e0._0_4_ = fVar176 * auVar252._0_4_ + fVar174 * auVar217._0_4_ + fVar152 * auVar297._0_4_;
  local_5e0._4_4_ = fVar211 * auVar252._4_4_ + fVar123 * auVar217._4_4_ + fVar207 * auVar297._4_4_;
  fStack_5d8 = fVar122 * auVar252._8_4_ + fVar206 * auVar217._8_4_ + fVar234 * auVar297._8_4_;
  fStack_5d4 = fVar205 * auVar252._12_4_ + fVar232 * auVar217._12_4_ + fVar331 * auVar297._12_4_;
  auVar80._4_4_ = fVar238;
  auVar80._0_4_ = fVar208;
  auVar80._8_4_ = fVar240;
  auVar80._12_4_ = fVar257;
  local_390 = vsubps_avx(auVar80,auVar136);
  auVar297 = vshufps_avx(local_390,local_390,0xaa);
  auVar217 = vmovshdup_avx(local_390);
  auVar252 = vmovsldup_avx(local_390);
  auVar390._0_4_ = fVar176 * auVar252._0_4_ + fVar174 * auVar217._0_4_ + fVar152 * auVar297._0_4_;
  auVar390._4_4_ = fVar211 * auVar252._4_4_ + fVar123 * auVar217._4_4_ + fVar207 * auVar297._4_4_;
  auVar390._8_4_ = fVar122 * auVar252._8_4_ + fVar206 * auVar217._8_4_ + fVar234 * auVar297._8_4_;
  auVar390._12_4_ =
       fVar205 * auVar252._12_4_ + fVar232 * auVar217._12_4_ + fVar331 * auVar297._12_4_;
  local_3a0 = vsubps_avx(_local_490,auVar136);
  auVar297 = vshufps_avx(local_3a0,local_3a0,0xaa);
  auVar217 = vmovshdup_avx(local_3a0);
  auVar252 = vmovsldup_avx(local_3a0);
  auVar401._0_4_ = fVar176 * auVar252._0_4_ + fVar174 * auVar217._0_4_ + fVar152 * auVar297._0_4_;
  auVar401._4_4_ = fVar211 * auVar252._4_4_ + fVar123 * auVar217._4_4_ + fVar207 * auVar297._4_4_;
  auVar401._8_4_ = fVar122 * auVar252._8_4_ + fVar206 * auVar217._8_4_ + fVar234 * auVar297._8_4_;
  auVar401._12_4_ =
       fVar205 * auVar252._12_4_ + fVar232 * auVar217._12_4_ + fVar331 * auVar297._12_4_;
  auVar78._4_4_ = fVar210;
  auVar78._0_4_ = fVar237;
  auVar78._8_4_ = fVar255;
  auVar78._12_4_ = fVar258;
  local_3b0 = vsubps_avx(auVar78,auVar136);
  auVar297 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar217 = vmovshdup_avx(local_3b0);
  auVar252 = vmovsldup_avx(local_3b0);
  auVar280._0_4_ = auVar252._0_4_ * fVar176 + auVar217._0_4_ * fVar174 + fVar152 * auVar297._0_4_;
  auVar280._4_4_ = auVar252._4_4_ * fVar211 + auVar217._4_4_ * fVar123 + fVar207 * auVar297._4_4_;
  auVar280._8_4_ = auVar252._8_4_ * fVar122 + auVar217._8_4_ * fVar206 + fVar234 * auVar297._8_4_;
  auVar280._12_4_ =
       auVar252._12_4_ * fVar205 + auVar217._12_4_ * fVar232 + fVar331 * auVar297._12_4_;
  local_3c0 = vsubps_avx(_local_4a0,auVar136);
  auVar297 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar217 = vmovshdup_avx(local_3c0);
  auVar252 = vmovsldup_avx(local_3c0);
  auVar300._0_4_ = auVar252._0_4_ * fVar176 + auVar217._0_4_ * fVar174 + auVar297._0_4_ * fVar152;
  auVar300._4_4_ = auVar252._4_4_ * fVar211 + auVar217._4_4_ * fVar123 + auVar297._4_4_ * fVar207;
  auVar300._8_4_ = auVar252._8_4_ * fVar122 + auVar217._8_4_ * fVar206 + auVar297._8_4_ * fVar234;
  auVar300._12_4_ =
       auVar252._12_4_ * fVar205 + auVar217._12_4_ * fVar232 + auVar297._12_4_ * fVar331;
  local_3d0 = vsubps_avx(_local_4b0,auVar136);
  auVar297 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar217 = vmovshdup_avx(local_3d0);
  auVar252 = vmovsldup_avx(local_3d0);
  auVar315._0_4_ = auVar252._0_4_ * fVar176 + auVar217._0_4_ * fVar174 + auVar297._0_4_ * fVar152;
  auVar315._4_4_ = auVar252._4_4_ * fVar211 + auVar217._4_4_ * fVar123 + auVar297._4_4_ * fVar207;
  auVar315._8_4_ = auVar252._8_4_ * fVar122 + auVar217._8_4_ * fVar206 + auVar297._8_4_ * fVar234;
  auVar315._12_4_ =
       auVar252._12_4_ * fVar205 + auVar217._12_4_ * fVar232 + auVar297._12_4_ * fVar331;
  auVar76._4_4_ = fVar239;
  auVar76._0_4_ = fVar209;
  auVar76._8_4_ = fVar256;
  auVar76._12_4_ = fVar259;
  local_3e0 = vsubps_avx(auVar76,auVar136);
  auVar297 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar217 = vmovshdup_avx(local_3e0);
  auVar252 = vmovsldup_avx(local_3e0);
  auVar339._0_4_ = auVar252._0_4_ * fVar176 + auVar217._0_4_ * fVar174 + auVar297._0_4_ * fVar152;
  auVar339._4_4_ = auVar252._4_4_ * fVar211 + auVar217._4_4_ * fVar123 + auVar297._4_4_ * fVar207;
  auVar339._8_4_ = auVar252._8_4_ * fVar122 + auVar217._8_4_ * fVar206 + auVar297._8_4_ * fVar234;
  auVar339._12_4_ =
       auVar252._12_4_ * fVar205 + auVar217._12_4_ * fVar232 + auVar297._12_4_ * fVar331;
  local_3f0 = vsubps_avx(_local_410,auVar136);
  auVar252 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar136 = vmovshdup_avx(local_3f0);
  auVar217 = vmovsldup_avx(local_3f0);
  auVar108._0_4_ = fVar176 * auVar217._0_4_ + fVar174 * auVar136._0_4_ + fVar152 * auVar252._0_4_;
  auVar108._4_4_ = fVar211 * auVar217._4_4_ + fVar123 * auVar136._4_4_ + fVar207 * auVar252._4_4_;
  auVar108._8_4_ = fVar122 * auVar217._8_4_ + fVar206 * auVar136._8_4_ + fVar234 * auVar252._8_4_;
  auVar108._12_4_ =
       fVar205 * auVar217._12_4_ + fVar232 * auVar136._12_4_ + fVar331 * auVar252._12_4_;
  auVar297 = vmovlhps_avx(_local_5e0,auVar300);
  auVar263 = vmovlhps_avx(auVar390,auVar315);
  auVar6 = vmovlhps_avx(auVar401,auVar339);
  _local_470 = vmovlhps_avx(auVar280,auVar108);
  auVar136 = vminps_avx(auVar297,auVar263);
  auVar217 = vminps_avx(auVar6,_local_470);
  auVar252 = vminps_avx(auVar136,auVar217);
  auVar136 = vmaxps_avx(auVar297,auVar263);
  auVar217 = vmaxps_avx(auVar6,_local_470);
  auVar136 = vmaxps_avx(auVar136,auVar217);
  auVar217 = vshufpd_avx(auVar252,auVar252,3);
  auVar252 = vminps_avx(auVar252,auVar217);
  auVar217 = vshufpd_avx(auVar136,auVar136,3);
  auVar217 = vmaxps_avx(auVar136,auVar217);
  auVar265._8_4_ = 0x7fffffff;
  auVar265._0_8_ = 0x7fffffff7fffffff;
  auVar265._12_4_ = 0x7fffffff;
  auVar136 = vandps_avx(auVar252,auVar265);
  auVar217 = vandps_avx(auVar217,auVar265);
  auVar136 = vmaxps_avx(auVar136,auVar217);
  auVar217 = vmovshdup_avx(auVar136);
  auVar136 = vmaxss_avx(auVar217,auVar136);
  local_508 = uVar86 + 0xff;
  fVar211 = auVar136._0_4_ * 9.536743e-07;
  auVar136 = vshufps_avx(ZEXT416((uint)fVar211),ZEXT416((uint)fVar211),0);
  local_280._16_16_ = auVar136;
  local_280._0_16_ = auVar136;
  auVar109._0_8_ = auVar136._0_8_ ^ 0x8000000080000000;
  auVar109._8_4_ = auVar136._8_4_ ^ 0x80000000;
  auVar109._12_4_ = auVar136._12_4_ ^ 0x80000000;
  local_2a0._16_16_ = auVar109;
  local_2a0._0_16_ = auVar109;
  auVar136 = vshufps_avx(ZEXT416(uVar93),ZEXT416(uVar93),0);
  local_2e0._16_16_ = auVar136;
  local_2e0._0_16_ = auVar136;
  auVar136 = vpshufd_avx(ZEXT416(uVar20),0);
  local_300._16_16_ = auVar136;
  local_300._0_16_ = auVar136;
  uVar89 = 0;
  fVar176 = *(float *)(ray + k * 4 + 0x60);
  _local_350 = vsubps_avx(auVar263,auVar297);
  _local_360 = vsubps_avx(auVar6,auVar263);
  _local_370 = vsubps_avx(_local_470,auVar6);
  _local_420 = vsubps_avx(_local_4a0,_local_480);
  auVar81._4_4_ = fVar238;
  auVar81._0_4_ = fVar208;
  auVar81._8_4_ = fVar240;
  auVar81._12_4_ = fVar257;
  _local_430 = vsubps_avx(_local_4b0,auVar81);
  auVar77._4_4_ = fVar239;
  auVar77._0_4_ = fVar209;
  auVar77._8_4_ = fVar256;
  auVar77._12_4_ = fVar259;
  _local_440 = vsubps_avx(auVar77,_local_490);
  auVar79._4_4_ = fVar210;
  auVar79._0_4_ = fVar237;
  auVar79._8_4_ = fVar255;
  auVar79._12_4_ = fVar258;
  _local_450 = vsubps_avx(_local_410,auVar79);
  _local_720 = ZEXT816(0x3f80000000000000);
  local_400 = _local_720;
  do {
    auVar136 = vshufps_avx(_local_720,_local_720,0x50);
    auVar409._8_4_ = 0x3f800000;
    auVar409._0_8_ = &DAT_3f8000003f800000;
    auVar409._12_4_ = 0x3f800000;
    auVar412._16_4_ = 0x3f800000;
    auVar412._0_16_ = auVar409;
    auVar412._20_4_ = 0x3f800000;
    auVar412._24_4_ = 0x3f800000;
    auVar412._28_4_ = 0x3f800000;
    auVar217 = vsubps_avx(auVar409,auVar136);
    fVar122 = auVar136._0_4_;
    fVar205 = auVar136._4_4_;
    fVar174 = auVar136._8_4_;
    fVar123 = auVar136._12_4_;
    fVar206 = auVar217._0_4_;
    fVar232 = auVar217._4_4_;
    fVar152 = auVar217._8_4_;
    fVar207 = auVar217._12_4_;
    auVar161._0_4_ = auVar300._0_4_ * fVar122 + fVar206 * (float)local_5e0._0_4_;
    auVar161._4_4_ = auVar300._4_4_ * fVar205 + fVar232 * (float)local_5e0._4_4_;
    auVar161._8_4_ = auVar300._0_4_ * fVar174 + fVar152 * (float)local_5e0._0_4_;
    auVar161._12_4_ = auVar300._4_4_ * fVar123 + fVar207 * (float)local_5e0._4_4_;
    auVar131._0_4_ = auVar315._0_4_ * fVar122 + auVar390._0_4_ * fVar206;
    auVar131._4_4_ = auVar315._4_4_ * fVar205 + auVar390._4_4_ * fVar232;
    auVar131._8_4_ = auVar315._0_4_ * fVar174 + auVar390._0_4_ * fVar152;
    auVar131._12_4_ = auVar315._4_4_ * fVar123 + auVar390._4_4_ * fVar207;
    auVar281._0_4_ = auVar339._0_4_ * fVar122 + auVar401._0_4_ * fVar206;
    auVar281._4_4_ = auVar339._4_4_ * fVar205 + auVar401._4_4_ * fVar232;
    auVar281._8_4_ = auVar339._0_4_ * fVar174 + auVar401._0_4_ * fVar152;
    auVar281._12_4_ = auVar339._4_4_ * fVar123 + auVar401._4_4_ * fVar207;
    auVar185._0_4_ = auVar108._0_4_ * fVar122 + auVar280._0_4_ * fVar206;
    auVar185._4_4_ = auVar108._4_4_ * fVar205 + auVar280._4_4_ * fVar232;
    auVar185._8_4_ = auVar108._0_4_ * fVar174 + auVar280._0_4_ * fVar152;
    auVar185._12_4_ = auVar108._4_4_ * fVar123 + auVar280._4_4_ * fVar207;
    auVar136 = vmovshdup_avx(local_400);
    auVar217 = vshufps_avx(local_400,local_400,0);
    auVar311._16_16_ = auVar217;
    auVar311._0_16_ = auVar217;
    auVar252 = vshufps_avx(local_400,local_400,0x55);
    auVar116._16_16_ = auVar252;
    auVar116._0_16_ = auVar252;
    auVar112 = vsubps_avx(auVar116,auVar311);
    auVar252 = vshufps_avx(auVar161,auVar161,0);
    auVar194 = vshufps_avx(auVar161,auVar161,0x55);
    auVar135 = vshufps_avx(auVar131,auVar131,0);
    auVar193 = vshufps_avx(auVar131,auVar131,0x55);
    auVar110 = vshufps_avx(auVar281,auVar281,0);
    auVar163 = vshufps_avx(auVar281,auVar281,0x55);
    auVar7 = vshufps_avx(auVar185,auVar185,0);
    auVar8 = vshufps_avx(auVar185,auVar185,0x55);
    auVar136 = ZEXT416((uint)((auVar136._0_4_ - local_400._0_4_) * 0.04761905));
    auVar136 = vshufps_avx(auVar136,auVar136,0);
    auVar330._0_4_ = auVar217._0_4_ + auVar112._0_4_ * 0.0;
    auVar330._4_4_ = auVar217._4_4_ + auVar112._4_4_ * 0.14285715;
    auVar330._8_4_ = auVar217._8_4_ + auVar112._8_4_ * 0.2857143;
    auVar330._12_4_ = auVar217._12_4_ + auVar112._12_4_ * 0.42857146;
    auVar330._16_4_ = auVar217._0_4_ + auVar112._16_4_ * 0.5714286;
    auVar330._20_4_ = auVar217._4_4_ + auVar112._20_4_ * 0.71428573;
    auVar330._24_4_ = auVar217._8_4_ + auVar112._24_4_ * 0.8571429;
    auVar330._28_4_ = auVar217._12_4_ + auVar112._28_4_;
    auVar28 = vsubps_avx(auVar412,auVar330);
    fVar333 = auVar135._0_4_;
    fVar212 = auVar135._4_4_;
    fVar231 = auVar135._8_4_;
    fVar236 = auVar135._12_4_;
    fVar122 = auVar28._0_4_;
    fVar206 = auVar28._4_4_;
    fVar234 = auVar28._8_4_;
    fVar332 = auVar28._12_4_;
    fVar397 = auVar252._12_4_;
    fVar230 = auVar28._16_4_;
    fVar233 = auVar28._20_4_;
    fVar235 = auVar28._24_4_;
    fVar273 = auVar193._0_4_;
    fVar274 = auVar193._4_4_;
    fVar275 = auVar193._8_4_;
    fVar388 = auVar193._12_4_;
    local_6a0 = auVar194._0_4_;
    fStack_69c = auVar194._4_4_;
    fStack_698 = auVar194._8_4_;
    fStack_694 = auVar194._12_4_;
    fVar205 = auVar110._0_4_;
    fVar123 = auVar110._4_4_;
    fVar152 = auVar110._8_4_;
    fVar331 = auVar110._12_4_;
    fVar349 = auVar330._0_4_ * fVar205 + fVar333 * fVar122;
    fVar362 = auVar330._4_4_ * fVar123 + fVar212 * fVar206;
    fVar363 = auVar330._8_4_ * fVar152 + fVar231 * fVar234;
    fVar364 = auVar330._12_4_ * fVar331 + fVar236 * fVar332;
    fVar365 = auVar330._16_4_ * fVar205 + fVar333 * fVar230;
    fVar366 = auVar330._20_4_ * fVar123 + fVar212 * fVar233;
    fVar367 = auVar330._24_4_ * fVar152 + fVar231 * fVar235;
    fVar174 = auVar163._0_4_;
    fVar232 = auVar163._4_4_;
    fVar207 = auVar163._8_4_;
    fVar260 = auVar163._12_4_;
    fVar368 = auVar330._0_4_ * fVar174 + fVar273 * fVar122;
    fVar379 = auVar330._4_4_ * fVar232 + fVar274 * fVar206;
    fVar380 = auVar330._8_4_ * fVar207 + fVar275 * fVar234;
    fVar381 = auVar330._12_4_ * fVar260 + fVar388 * fVar332;
    fVar382 = auVar330._16_4_ * fVar174 + fVar273 * fVar230;
    fVar384 = auVar330._20_4_ * fVar232 + fVar274 * fVar233;
    fVar386 = auVar330._24_4_ * fVar207 + fVar275 * fVar235;
    auVar217 = vshufps_avx(auVar161,auVar161,0xaa);
    auVar194 = vshufps_avx(auVar161,auVar161,0xff);
    fVar175 = fVar331 + 0.0;
    auVar135 = vshufps_avx(auVar131,auVar131,0xaa);
    auVar193 = vshufps_avx(auVar131,auVar131,0xff);
    auVar117._0_4_ =
         fVar122 * (fVar333 * auVar330._0_4_ + auVar252._0_4_ * fVar122) + auVar330._0_4_ * fVar349;
    auVar117._4_4_ =
         fVar206 * (fVar212 * auVar330._4_4_ + auVar252._4_4_ * fVar206) + auVar330._4_4_ * fVar362;
    auVar117._8_4_ =
         fVar234 * (fVar231 * auVar330._8_4_ + auVar252._8_4_ * fVar234) + auVar330._8_4_ * fVar363;
    auVar117._12_4_ =
         fVar332 * (fVar236 * auVar330._12_4_ + fVar397 * fVar332) + auVar330._12_4_ * fVar364;
    auVar117._16_4_ =
         fVar230 * (fVar333 * auVar330._16_4_ + auVar252._0_4_ * fVar230) +
         auVar330._16_4_ * fVar365;
    auVar117._20_4_ =
         fVar233 * (fVar212 * auVar330._20_4_ + auVar252._4_4_ * fVar233) +
         auVar330._20_4_ * fVar366;
    auVar117._24_4_ =
         fVar235 * (fVar231 * auVar330._24_4_ + auVar252._8_4_ * fVar235) +
         auVar330._24_4_ * fVar367;
    auVar117._28_4_ = fVar397 + 1.0 + fVar260;
    auVar201._0_4_ =
         fVar122 * (fVar273 * auVar330._0_4_ + fVar122 * local_6a0) + auVar330._0_4_ * fVar368;
    auVar201._4_4_ =
         fVar206 * (fVar274 * auVar330._4_4_ + fVar206 * fStack_69c) + auVar330._4_4_ * fVar379;
    auVar201._8_4_ =
         fVar234 * (fVar275 * auVar330._8_4_ + fVar234 * fStack_698) + auVar330._8_4_ * fVar380;
    auVar201._12_4_ =
         fVar332 * (fVar388 * auVar330._12_4_ + fVar332 * fStack_694) + auVar330._12_4_ * fVar381;
    auVar201._16_4_ =
         fVar230 * (fVar273 * auVar330._16_4_ + fVar230 * local_6a0) + auVar330._16_4_ * fVar382;
    auVar201._20_4_ =
         fVar233 * (fVar274 * auVar330._20_4_ + fVar233 * fStack_69c) + auVar330._20_4_ * fVar384;
    auVar201._24_4_ =
         fVar235 * (fVar275 * auVar330._24_4_ + fVar235 * fStack_698) + auVar330._24_4_ * fVar386;
    auVar201._28_4_ = fVar397 + 1.0 + fVar260;
    auVar227._0_4_ =
         fVar122 * fVar349 + auVar330._0_4_ * (auVar7._0_4_ * auVar330._0_4_ + fVar122 * fVar205);
    auVar227._4_4_ =
         fVar206 * fVar362 + auVar330._4_4_ * (auVar7._4_4_ * auVar330._4_4_ + fVar206 * fVar123);
    auVar227._8_4_ =
         fVar234 * fVar363 + auVar330._8_4_ * (auVar7._8_4_ * auVar330._8_4_ + fVar234 * fVar152);
    auVar227._12_4_ =
         fVar332 * fVar364 + auVar330._12_4_ * (auVar7._12_4_ * auVar330._12_4_ + fVar332 * fVar331)
    ;
    auVar227._16_4_ =
         fVar230 * fVar365 + auVar330._16_4_ * (auVar7._0_4_ * auVar330._16_4_ + fVar230 * fVar205);
    auVar227._20_4_ =
         fVar233 * fVar366 + auVar330._20_4_ * (auVar7._4_4_ * auVar330._20_4_ + fVar233 * fVar123);
    auVar227._24_4_ =
         fVar235 * fVar367 + auVar330._24_4_ * (auVar7._8_4_ * auVar330._24_4_ + fVar235 * fVar152);
    auVar227._28_4_ = fVar260 + fVar175;
    auVar348._0_4_ =
         fVar122 * fVar368 + auVar330._0_4_ * (auVar8._0_4_ * auVar330._0_4_ + fVar122 * fVar174);
    auVar348._4_4_ =
         fVar206 * fVar379 + auVar330._4_4_ * (auVar8._4_4_ * auVar330._4_4_ + fVar206 * fVar232);
    auVar348._8_4_ =
         fVar234 * fVar380 + auVar330._8_4_ * (auVar8._8_4_ * auVar330._8_4_ + fVar234 * fVar207);
    auVar348._12_4_ =
         fVar332 * fVar381 + auVar330._12_4_ * (auVar8._12_4_ * auVar330._12_4_ + fVar332 * fVar260)
    ;
    auVar348._16_4_ =
         fVar230 * fVar382 + auVar330._16_4_ * (auVar8._0_4_ * auVar330._16_4_ + fVar230 * fVar174);
    auVar348._20_4_ =
         fVar233 * fVar384 + auVar330._20_4_ * (auVar8._4_4_ * auVar330._20_4_ + fVar233 * fVar232);
    auVar348._24_4_ =
         fVar235 * fVar386 + auVar330._24_4_ * (auVar8._8_4_ * auVar330._24_4_ + fVar235 * fVar207);
    auVar348._28_4_ = fVar175 + fVar260 + 0.0;
    local_1c0._0_4_ = fVar122 * auVar117._0_4_ + auVar330._0_4_ * auVar227._0_4_;
    local_1c0._4_4_ = fVar206 * auVar117._4_4_ + auVar330._4_4_ * auVar227._4_4_;
    local_1c0._8_4_ = fVar234 * auVar117._8_4_ + auVar330._8_4_ * auVar227._8_4_;
    local_1c0._12_4_ = fVar332 * auVar117._12_4_ + auVar330._12_4_ * auVar227._12_4_;
    local_1c0._16_4_ = fVar230 * auVar117._16_4_ + auVar330._16_4_ * auVar227._16_4_;
    local_1c0._20_4_ = fVar233 * auVar117._20_4_ + auVar330._20_4_ * auVar227._20_4_;
    local_1c0._24_4_ = fVar235 * auVar117._24_4_ + auVar330._24_4_ * auVar227._24_4_;
    local_1c0._28_4_ = fVar397 + fVar236 + fVar260 + 0.0;
    local_1e0._0_4_ = fVar122 * auVar201._0_4_ + auVar330._0_4_ * auVar348._0_4_;
    local_1e0._4_4_ = fVar206 * auVar201._4_4_ + auVar330._4_4_ * auVar348._4_4_;
    local_1e0._8_4_ = fVar234 * auVar201._8_4_ + auVar330._8_4_ * auVar348._8_4_;
    local_1e0._12_4_ = fVar332 * auVar201._12_4_ + auVar330._12_4_ * auVar348._12_4_;
    local_1e0._16_4_ = fVar230 * auVar201._16_4_ + auVar330._16_4_ * auVar348._16_4_;
    local_1e0._20_4_ = fVar233 * auVar201._20_4_ + auVar330._20_4_ * auVar348._20_4_;
    local_1e0._24_4_ = fVar235 * auVar201._24_4_ + auVar330._24_4_ * auVar348._24_4_;
    local_1e0._28_4_ = fVar397 + fVar236 + fVar175;
    auVar29 = vsubps_avx(auVar227,auVar117);
    auVar112 = vsubps_avx(auVar348,auVar201);
    local_660 = auVar136._0_4_;
    fStack_65c = auVar136._4_4_;
    fStack_658 = auVar136._8_4_;
    fStack_654 = auVar136._12_4_;
    local_220 = local_660 * auVar29._0_4_ * 3.0;
    fStack_21c = fStack_65c * auVar29._4_4_ * 3.0;
    auVar37._4_4_ = fStack_21c;
    auVar37._0_4_ = local_220;
    fStack_218 = fStack_658 * auVar29._8_4_ * 3.0;
    auVar37._8_4_ = fStack_218;
    fStack_214 = fStack_654 * auVar29._12_4_ * 3.0;
    auVar37._12_4_ = fStack_214;
    fStack_210 = local_660 * auVar29._16_4_ * 3.0;
    auVar37._16_4_ = fStack_210;
    fStack_20c = fStack_65c * auVar29._20_4_ * 3.0;
    auVar37._20_4_ = fStack_20c;
    fStack_208 = fStack_658 * auVar29._24_4_ * 3.0;
    auVar37._24_4_ = fStack_208;
    auVar37._28_4_ = auVar29._28_4_;
    fVar362 = local_660 * auVar112._0_4_ * 3.0;
    fVar231 = fStack_65c * auVar112._4_4_ * 3.0;
    auVar38._4_4_ = fVar231;
    auVar38._0_4_ = fVar362;
    fVar363 = fStack_658 * auVar112._8_4_ * 3.0;
    auVar38._8_4_ = fVar363;
    fVar236 = fStack_654 * auVar112._12_4_ * 3.0;
    auVar38._12_4_ = fVar236;
    fVar364 = local_660 * auVar112._16_4_ * 3.0;
    auVar38._16_4_ = fVar364;
    fVar365 = fStack_65c * auVar112._20_4_ * 3.0;
    auVar38._20_4_ = fVar365;
    fVar366 = fStack_658 * auVar112._24_4_ * 3.0;
    auVar38._24_4_ = fVar366;
    auVar38._28_4_ = auVar227._28_4_;
    auVar27 = vsubps_avx(local_1c0,auVar37);
    auVar112 = vperm2f128_avx(auVar27,auVar27,1);
    auVar112 = vshufps_avx(auVar112,auVar27,0x30);
    auVar112 = vshufps_avx(auVar27,auVar112,0x29);
    auVar30 = vsubps_avx(local_1e0,auVar38);
    auVar27 = vperm2f128_avx(auVar30,auVar30,1);
    auVar27 = vshufps_avx(auVar27,auVar30,0x30);
    auVar31 = vshufps_avx(auVar30,auVar27,0x29);
    fVar399 = auVar135._0_4_;
    fVar405 = auVar135._4_4_;
    fVar406 = auVar135._8_4_;
    fVar205 = auVar193._0_4_;
    fVar232 = auVar193._4_4_;
    fVar331 = auVar193._8_4_;
    fVar333 = auVar193._12_4_;
    fVar398 = auVar194._12_4_;
    auVar136 = vshufps_avx(auVar281,auVar281,0xaa);
    fVar174 = auVar136._0_4_;
    fVar152 = auVar136._4_4_;
    fVar260 = auVar136._8_4_;
    fVar349 = auVar136._12_4_;
    fVar381 = auVar330._0_4_ * fVar174 + fVar399 * fVar122;
    fVar382 = auVar330._4_4_ * fVar152 + fVar405 * fVar206;
    fVar384 = auVar330._8_4_ * fVar260 + fVar406 * fVar234;
    fVar386 = auVar330._12_4_ * fVar349 + auVar135._12_4_ * fVar332;
    fVar383 = auVar330._16_4_ * fVar174 + fVar399 * fVar230;
    fVar385 = auVar330._20_4_ * fVar152 + fVar405 * fVar233;
    fVar387 = auVar330._24_4_ * fVar260 + fVar406 * fVar235;
    fVar388 = fVar398 + fVar397 + fVar388;
    auVar136 = vshufps_avx(auVar281,auVar281,0xff);
    fVar123 = auVar136._0_4_;
    fVar207 = auVar136._4_4_;
    fVar175 = auVar136._8_4_;
    fVar212 = auVar136._12_4_;
    fVar367 = auVar330._0_4_ * fVar123 + fVar122 * fVar205;
    fVar273 = auVar330._4_4_ * fVar207 + fVar206 * fVar232;
    fVar368 = auVar330._8_4_ * fVar175 + fVar234 * fVar331;
    fVar274 = auVar330._12_4_ * fVar212 + fVar332 * fVar333;
    fVar379 = auVar330._16_4_ * fVar123 + fVar230 * fVar205;
    fVar275 = auVar330._20_4_ * fVar207 + fVar233 * fVar232;
    fVar380 = auVar330._24_4_ * fVar175 + fVar235 * fVar331;
    auVar136 = vshufps_avx(auVar185,auVar185,0xaa);
    auVar252 = vshufps_avx(auVar185,auVar185,0xff);
    fVar397 = auVar252._12_4_;
    auVar118._0_4_ =
         auVar330._0_4_ * fVar381 + fVar122 * (fVar399 * auVar330._0_4_ + auVar217._0_4_ * fVar122);
    auVar118._4_4_ =
         auVar330._4_4_ * fVar382 + fVar206 * (fVar405 * auVar330._4_4_ + auVar217._4_4_ * fVar206);
    auVar118._8_4_ =
         auVar330._8_4_ * fVar384 + fVar234 * (fVar406 * auVar330._8_4_ + auVar217._8_4_ * fVar234);
    auVar118._12_4_ =
         auVar330._12_4_ * fVar386 +
         fVar332 * (auVar135._12_4_ * auVar330._12_4_ + auVar217._12_4_ * fVar332);
    auVar118._16_4_ =
         auVar330._16_4_ * fVar383 +
         fVar230 * (fVar399 * auVar330._16_4_ + auVar217._0_4_ * fVar230);
    auVar118._20_4_ =
         auVar330._20_4_ * fVar385 +
         fVar233 * (fVar405 * auVar330._20_4_ + auVar217._4_4_ * fVar233);
    auVar118._24_4_ =
         auVar330._24_4_ * fVar387 +
         fVar235 * (fVar406 * auVar330._24_4_ + auVar217._8_4_ * fVar235);
    auVar118._28_4_ = fVar397 + auVar30._28_4_ + auVar27._28_4_;
    auVar396._0_4_ =
         auVar330._0_4_ * fVar367 + fVar122 * (auVar330._0_4_ * fVar205 + auVar194._0_4_ * fVar122);
    auVar396._4_4_ =
         auVar330._4_4_ * fVar273 + fVar206 * (auVar330._4_4_ * fVar232 + auVar194._4_4_ * fVar206);
    auVar396._8_4_ =
         auVar330._8_4_ * fVar368 + fVar234 * (auVar330._8_4_ * fVar331 + auVar194._8_4_ * fVar234);
    auVar396._12_4_ =
         auVar330._12_4_ * fVar274 + fVar332 * (auVar330._12_4_ * fVar333 + fVar398 * fVar332);
    auVar396._16_4_ =
         auVar330._16_4_ * fVar379 +
         fVar230 * (auVar330._16_4_ * fVar205 + auVar194._0_4_ * fVar230);
    auVar396._20_4_ =
         auVar330._20_4_ * fVar275 +
         fVar233 * (auVar330._20_4_ * fVar232 + auVar194._4_4_ * fVar233);
    auVar396._24_4_ =
         auVar330._24_4_ * fVar380 +
         fVar235 * (auVar330._24_4_ * fVar331 + auVar194._8_4_ * fVar235);
    auVar396._28_4_ = fVar397 + auVar27._28_4_ + auVar227._28_4_;
    auVar27 = vperm2f128_avx(local_1c0,local_1c0,1);
    auVar27 = vshufps_avx(auVar27,local_1c0,0x30);
    auVar32 = vshufps_avx(local_1c0,auVar27,0x29);
    auVar228._0_4_ =
         fVar122 * fVar381 + auVar330._0_4_ * (auVar136._0_4_ * auVar330._0_4_ + fVar122 * fVar174);
    auVar228._4_4_ =
         fVar206 * fVar382 + auVar330._4_4_ * (auVar136._4_4_ * auVar330._4_4_ + fVar206 * fVar152);
    auVar228._8_4_ =
         fVar234 * fVar384 + auVar330._8_4_ * (auVar136._8_4_ * auVar330._8_4_ + fVar234 * fVar260);
    auVar228._12_4_ =
         fVar332 * fVar386 +
         auVar330._12_4_ * (auVar136._12_4_ * auVar330._12_4_ + fVar332 * fVar349);
    auVar228._16_4_ =
         fVar230 * fVar383 +
         auVar330._16_4_ * (auVar136._0_4_ * auVar330._16_4_ + fVar230 * fVar174);
    auVar228._20_4_ =
         fVar233 * fVar385 +
         auVar330._20_4_ * (auVar136._4_4_ * auVar330._20_4_ + fVar233 * fVar152);
    auVar228._24_4_ =
         fVar235 * fVar387 +
         auVar330._24_4_ * (auVar136._8_4_ * auVar330._24_4_ + fVar235 * fVar260);
    auVar228._28_4_ = fVar388 + auVar136._12_4_ + fVar349;
    auVar272._0_4_ =
         fVar122 * fVar367 + auVar330._0_4_ * (auVar252._0_4_ * auVar330._0_4_ + fVar122 * fVar123);
    auVar272._4_4_ =
         fVar206 * fVar273 + auVar330._4_4_ * (auVar252._4_4_ * auVar330._4_4_ + fVar206 * fVar207);
    auVar272._8_4_ =
         fVar234 * fVar368 + auVar330._8_4_ * (auVar252._8_4_ * auVar330._8_4_ + fVar234 * fVar175);
    auVar272._12_4_ =
         fVar332 * fVar274 + auVar330._12_4_ * (fVar397 * auVar330._12_4_ + fVar332 * fVar212);
    auVar272._16_4_ =
         fVar230 * fVar379 +
         auVar330._16_4_ * (auVar252._0_4_ * auVar330._16_4_ + fVar230 * fVar123);
    auVar272._20_4_ =
         fVar233 * fVar275 +
         auVar330._20_4_ * (auVar252._4_4_ * auVar330._20_4_ + fVar233 * fVar207);
    auVar272._24_4_ =
         fVar235 * fVar380 +
         auVar330._24_4_ * (auVar252._8_4_ * auVar330._24_4_ + fVar235 * fVar175);
    auVar272._28_4_ = fVar398 + fVar333 + fVar397 + fVar212;
    auVar291._0_4_ = fVar122 * auVar118._0_4_ + auVar330._0_4_ * auVar228._0_4_;
    auVar291._4_4_ = fVar206 * auVar118._4_4_ + auVar330._4_4_ * auVar228._4_4_;
    auVar291._8_4_ = fVar234 * auVar118._8_4_ + auVar330._8_4_ * auVar228._8_4_;
    auVar291._12_4_ = fVar332 * auVar118._12_4_ + auVar330._12_4_ * auVar228._12_4_;
    auVar291._16_4_ = fVar230 * auVar118._16_4_ + auVar330._16_4_ * auVar228._16_4_;
    auVar291._20_4_ = fVar233 * auVar118._20_4_ + auVar330._20_4_ * auVar228._20_4_;
    auVar291._24_4_ = fVar235 * auVar118._24_4_ + auVar330._24_4_ * auVar228._24_4_;
    auVar291._28_4_ = fVar388 + fVar397 + fVar212;
    auVar312._0_4_ = fVar122 * auVar396._0_4_ + auVar330._0_4_ * auVar272._0_4_;
    auVar312._4_4_ = fVar206 * auVar396._4_4_ + auVar330._4_4_ * auVar272._4_4_;
    auVar312._8_4_ = fVar234 * auVar396._8_4_ + auVar330._8_4_ * auVar272._8_4_;
    auVar312._12_4_ = fVar332 * auVar396._12_4_ + auVar330._12_4_ * auVar272._12_4_;
    auVar312._16_4_ = fVar230 * auVar396._16_4_ + auVar330._16_4_ * auVar272._16_4_;
    auVar312._20_4_ = fVar233 * auVar396._20_4_ + auVar330._20_4_ * auVar272._20_4_;
    auVar312._24_4_ = fVar235 * auVar396._24_4_ + auVar330._24_4_ * auVar272._24_4_;
    auVar312._28_4_ = auVar28._28_4_ + auVar330._28_4_;
    auVar27 = vsubps_avx(auVar228,auVar118);
    auVar28 = vsubps_avx(auVar272,auVar396);
    local_240 = local_660 * auVar27._0_4_ * 3.0;
    fStack_23c = fStack_65c * auVar27._4_4_ * 3.0;
    auVar39._4_4_ = fStack_23c;
    auVar39._0_4_ = local_240;
    fStack_238 = fStack_658 * auVar27._8_4_ * 3.0;
    auVar39._8_4_ = fStack_238;
    fStack_234 = fStack_654 * auVar27._12_4_ * 3.0;
    auVar39._12_4_ = fStack_234;
    fStack_230 = local_660 * auVar27._16_4_ * 3.0;
    auVar39._16_4_ = fStack_230;
    fStack_22c = fStack_65c * auVar27._20_4_ * 3.0;
    auVar39._20_4_ = fStack_22c;
    fStack_228 = fStack_658 * auVar27._24_4_ * 3.0;
    auVar39._24_4_ = fStack_228;
    auVar39._28_4_ = auVar272._28_4_;
    local_260 = local_660 * auVar28._0_4_ * 3.0;
    fStack_25c = fStack_65c * auVar28._4_4_ * 3.0;
    auVar40._4_4_ = fStack_25c;
    auVar40._0_4_ = local_260;
    fStack_258 = fStack_658 * auVar28._8_4_ * 3.0;
    auVar40._8_4_ = fStack_258;
    fStack_254 = fStack_654 * auVar28._12_4_ * 3.0;
    auVar40._12_4_ = fStack_254;
    local_660 = local_660 * auVar28._16_4_ * 3.0;
    auVar40._16_4_ = local_660;
    fStack_65c = fStack_65c * auVar28._20_4_ * 3.0;
    auVar40._20_4_ = fStack_65c;
    fStack_658 = fStack_658 * auVar28._24_4_ * 3.0;
    auVar40._24_4_ = fStack_658;
    auVar40._28_4_ = fStack_654;
    auVar27 = vperm2f128_avx(auVar291,auVar291,1);
    auVar27 = vshufps_avx(auVar27,auVar291,0x30);
    auVar33 = vshufps_avx(auVar291,auVar27,0x29);
    auVar28 = vsubps_avx(auVar291,auVar39);
    auVar27 = vperm2f128_avx(auVar28,auVar28,1);
    auVar27 = vshufps_avx(auVar27,auVar28,0x30);
    auVar34 = vshufps_avx(auVar28,auVar27,0x29);
    auVar28 = vsubps_avx(auVar312,auVar40);
    auVar27 = vperm2f128_avx(auVar28,auVar28,1);
    auVar27 = vshufps_avx(auVar27,auVar28,0x30);
    auVar35 = vshufps_avx(auVar28,auVar27,0x29);
    auVar30 = vsubps_avx(auVar291,local_1c0);
    auVar113 = vsubps_avx(auVar33,auVar32);
    fVar122 = auVar113._0_4_ + auVar30._0_4_;
    fVar205 = auVar113._4_4_ + auVar30._4_4_;
    fVar174 = auVar113._8_4_ + auVar30._8_4_;
    fVar123 = auVar113._12_4_ + auVar30._12_4_;
    fVar206 = auVar113._16_4_ + auVar30._16_4_;
    fVar232 = auVar113._20_4_ + auVar30._20_4_;
    fVar152 = auVar113._24_4_ + auVar30._24_4_;
    auVar28 = vperm2f128_avx(local_1e0,local_1e0,1);
    auVar28 = vshufps_avx(auVar28,local_1e0,0x30);
    local_200 = vshufps_avx(local_1e0,auVar28,0x29);
    auVar28 = vperm2f128_avx(auVar312,auVar312,1);
    auVar28 = vshufps_avx(auVar28,auVar312,0x30);
    auVar36 = vshufps_avx(auVar312,auVar28,0x29);
    auVar28 = vsubps_avx(auVar312,local_1e0);
    auVar114 = vsubps_avx(auVar36,local_200);
    fVar207 = auVar28._0_4_ + auVar114._0_4_;
    fVar234 = auVar28._4_4_ + auVar114._4_4_;
    fVar331 = auVar28._8_4_ + auVar114._8_4_;
    fVar260 = auVar28._12_4_ + auVar114._12_4_;
    fVar175 = auVar28._16_4_ + auVar114._16_4_;
    fVar332 = auVar28._20_4_ + auVar114._20_4_;
    fVar333 = auVar28._24_4_ + auVar114._24_4_;
    fVar349 = auVar28._28_4_;
    auVar41._4_4_ = local_1e0._4_4_ * fVar205;
    auVar41._0_4_ = local_1e0._0_4_ * fVar122;
    auVar41._8_4_ = local_1e0._8_4_ * fVar174;
    auVar41._12_4_ = local_1e0._12_4_ * fVar123;
    auVar41._16_4_ = local_1e0._16_4_ * fVar206;
    auVar41._20_4_ = local_1e0._20_4_ * fVar232;
    auVar41._24_4_ = local_1e0._24_4_ * fVar152;
    auVar41._28_4_ = fVar349;
    auVar42._4_4_ = fVar234 * local_1c0._4_4_;
    auVar42._0_4_ = fVar207 * local_1c0._0_4_;
    auVar42._8_4_ = fVar331 * local_1c0._8_4_;
    auVar42._12_4_ = fVar260 * local_1c0._12_4_;
    auVar42._16_4_ = fVar175 * local_1c0._16_4_;
    auVar42._20_4_ = fVar332 * local_1c0._20_4_;
    auVar42._24_4_ = fVar333 * local_1c0._24_4_;
    auVar42._28_4_ = auVar27._28_4_;
    auVar28 = vsubps_avx(auVar41,auVar42);
    local_220 = local_1c0._0_4_ + local_220;
    fStack_21c = local_1c0._4_4_ + fStack_21c;
    fStack_218 = local_1c0._8_4_ + fStack_218;
    fStack_214 = local_1c0._12_4_ + fStack_214;
    fStack_210 = local_1c0._16_4_ + fStack_210;
    fStack_20c = local_1c0._20_4_ + fStack_20c;
    fStack_208 = local_1c0._24_4_ + fStack_208;
    fStack_204 = local_1c0._28_4_ + auVar29._28_4_;
    fVar362 = local_1e0._0_4_ + fVar362;
    fVar231 = local_1e0._4_4_ + fVar231;
    fVar363 = local_1e0._8_4_ + fVar363;
    fVar236 = local_1e0._12_4_ + fVar236;
    fVar364 = local_1e0._16_4_ + fVar364;
    fVar365 = local_1e0._20_4_ + fVar365;
    fVar366 = local_1e0._24_4_ + fVar366;
    auVar43._4_4_ = fVar231 * fVar205;
    auVar43._0_4_ = fVar362 * fVar122;
    auVar43._8_4_ = fVar363 * fVar174;
    auVar43._12_4_ = fVar236 * fVar123;
    auVar43._16_4_ = fVar364 * fVar206;
    auVar43._20_4_ = fVar365 * fVar232;
    auVar43._24_4_ = fVar366 * fVar152;
    auVar43._28_4_ = fVar349;
    auVar44._4_4_ = fVar234 * fStack_21c;
    auVar44._0_4_ = fVar207 * local_220;
    auVar44._8_4_ = fVar331 * fStack_218;
    auVar44._12_4_ = fVar260 * fStack_214;
    auVar44._16_4_ = fVar175 * fStack_210;
    auVar44._20_4_ = fVar332 * fStack_20c;
    auVar44._24_4_ = fVar333 * fStack_208;
    auVar44._28_4_ = fStack_204;
    auVar29 = vsubps_avx(auVar43,auVar44);
    auVar45._4_4_ = auVar31._4_4_ * fVar205;
    auVar45._0_4_ = auVar31._0_4_ * fVar122;
    auVar45._8_4_ = auVar31._8_4_ * fVar174;
    auVar45._12_4_ = auVar31._12_4_ * fVar123;
    auVar45._16_4_ = auVar31._16_4_ * fVar206;
    auVar45._20_4_ = auVar31._20_4_ * fVar232;
    auVar45._24_4_ = auVar31._24_4_ * fVar152;
    auVar45._28_4_ = fVar349;
    local_6a0 = auVar112._0_4_;
    fStack_69c = auVar112._4_4_;
    fStack_698 = auVar112._8_4_;
    fStack_694 = auVar112._12_4_;
    fStack_690 = auVar112._16_4_;
    fStack_68c = auVar112._20_4_;
    fStack_688 = auVar112._24_4_;
    auVar46._4_4_ = fVar234 * fStack_69c;
    auVar46._0_4_ = fVar207 * local_6a0;
    auVar46._8_4_ = fVar331 * fStack_698;
    auVar46._12_4_ = fVar260 * fStack_694;
    auVar46._16_4_ = fVar175 * fStack_690;
    auVar46._20_4_ = fVar332 * fStack_68c;
    auVar46._24_4_ = fVar333 * fStack_688;
    auVar46._28_4_ = 0x40400000;
    auVar146 = vsubps_avx(auVar45,auVar46);
    auVar47._4_4_ = local_200._4_4_ * fVar205;
    auVar47._0_4_ = local_200._0_4_ * fVar122;
    auVar47._8_4_ = local_200._8_4_ * fVar174;
    auVar47._12_4_ = local_200._12_4_ * fVar123;
    auVar47._16_4_ = local_200._16_4_ * fVar206;
    auVar47._20_4_ = local_200._20_4_ * fVar232;
    auVar47._24_4_ = local_200._24_4_ * fVar152;
    auVar47._28_4_ = fVar349;
    auVar48._4_4_ = auVar32._4_4_ * fVar234;
    auVar48._0_4_ = auVar32._0_4_ * fVar207;
    auVar48._8_4_ = auVar32._8_4_ * fVar331;
    auVar48._12_4_ = auVar32._12_4_ * fVar260;
    auVar48._16_4_ = auVar32._16_4_ * fVar175;
    auVar48._20_4_ = auVar32._20_4_ * fVar332;
    auVar48._24_4_ = auVar32._24_4_ * fVar333;
    auVar48._28_4_ = local_200._28_4_;
    auVar147 = vsubps_avx(auVar47,auVar48);
    auVar49._4_4_ = auVar312._4_4_ * fVar205;
    auVar49._0_4_ = auVar312._0_4_ * fVar122;
    auVar49._8_4_ = auVar312._8_4_ * fVar174;
    auVar49._12_4_ = auVar312._12_4_ * fVar123;
    auVar49._16_4_ = auVar312._16_4_ * fVar206;
    auVar49._20_4_ = auVar312._20_4_ * fVar232;
    auVar49._24_4_ = auVar312._24_4_ * fVar152;
    auVar49._28_4_ = fVar349;
    auVar50._4_4_ = fVar234 * auVar291._4_4_;
    auVar50._0_4_ = fVar207 * auVar291._0_4_;
    auVar50._8_4_ = fVar331 * auVar291._8_4_;
    auVar50._12_4_ = fVar260 * auVar291._12_4_;
    auVar50._16_4_ = fVar175 * auVar291._16_4_;
    auVar50._20_4_ = fVar332 * auVar291._20_4_;
    auVar50._24_4_ = fVar333 * auVar291._24_4_;
    auVar50._28_4_ = auVar31._28_4_;
    auVar148 = vsubps_avx(auVar49,auVar50);
    local_240 = auVar291._0_4_ + local_240;
    fStack_23c = auVar291._4_4_ + fStack_23c;
    fStack_238 = auVar291._8_4_ + fStack_238;
    fStack_234 = auVar291._12_4_ + fStack_234;
    fStack_230 = auVar291._16_4_ + fStack_230;
    fStack_22c = auVar291._20_4_ + fStack_22c;
    fStack_228 = auVar291._24_4_ + fStack_228;
    fStack_224 = auVar291._28_4_ + auVar272._28_4_;
    local_260 = auVar312._0_4_ + local_260;
    fStack_25c = auVar312._4_4_ + fStack_25c;
    fStack_258 = auVar312._8_4_ + fStack_258;
    fStack_254 = auVar312._12_4_ + fStack_254;
    fStack_250 = auVar312._16_4_ + local_660;
    fStack_24c = auVar312._20_4_ + fStack_65c;
    fStack_248 = auVar312._24_4_ + fStack_658;
    fStack_244 = auVar312._28_4_ + fStack_654;
    auVar51._4_4_ = fStack_25c * fVar205;
    auVar51._0_4_ = local_260 * fVar122;
    auVar51._8_4_ = fStack_258 * fVar174;
    auVar51._12_4_ = fStack_254 * fVar123;
    auVar51._16_4_ = fStack_250 * fVar206;
    auVar51._20_4_ = fStack_24c * fVar232;
    auVar51._24_4_ = fStack_248 * fVar152;
    auVar51._28_4_ = auVar312._28_4_ + fStack_654;
    auVar52._4_4_ = fStack_23c * fVar234;
    auVar52._0_4_ = local_240 * fVar207;
    auVar52._8_4_ = fStack_238 * fVar331;
    auVar52._12_4_ = fStack_234 * fVar260;
    auVar52._16_4_ = fStack_230 * fVar175;
    auVar52._20_4_ = fStack_22c * fVar332;
    auVar52._24_4_ = fStack_228 * fVar333;
    auVar52._28_4_ = fStack_224;
    auVar168 = vsubps_avx(auVar51,auVar52);
    auVar53._4_4_ = auVar35._4_4_ * fVar205;
    auVar53._0_4_ = auVar35._0_4_ * fVar122;
    auVar53._8_4_ = auVar35._8_4_ * fVar174;
    auVar53._12_4_ = auVar35._12_4_ * fVar123;
    auVar53._16_4_ = auVar35._16_4_ * fVar206;
    auVar53._20_4_ = auVar35._20_4_ * fVar232;
    auVar53._24_4_ = auVar35._24_4_ * fVar152;
    auVar53._28_4_ = fStack_224;
    auVar54._4_4_ = fVar234 * auVar34._4_4_;
    auVar54._0_4_ = fVar207 * auVar34._0_4_;
    auVar54._8_4_ = fVar331 * auVar34._8_4_;
    auVar54._12_4_ = fVar260 * auVar34._12_4_;
    auVar54._16_4_ = fVar175 * auVar34._16_4_;
    auVar54._20_4_ = fVar332 * auVar34._20_4_;
    auVar54._24_4_ = fVar333 * auVar34._24_4_;
    auVar54._28_4_ = auVar34._28_4_;
    auVar169 = vsubps_avx(auVar53,auVar54);
    auVar55._4_4_ = auVar36._4_4_ * fVar205;
    auVar55._0_4_ = auVar36._0_4_ * fVar122;
    auVar55._8_4_ = auVar36._8_4_ * fVar174;
    auVar55._12_4_ = auVar36._12_4_ * fVar123;
    auVar55._16_4_ = auVar36._16_4_ * fVar206;
    auVar55._20_4_ = auVar36._20_4_ * fVar232;
    auVar55._24_4_ = auVar36._24_4_ * fVar152;
    auVar55._28_4_ = auVar113._28_4_ + auVar30._28_4_;
    auVar56._4_4_ = auVar33._4_4_ * fVar234;
    auVar56._0_4_ = auVar33._0_4_ * fVar207;
    auVar56._8_4_ = auVar33._8_4_ * fVar331;
    auVar56._12_4_ = auVar33._12_4_ * fVar260;
    auVar56._16_4_ = auVar33._16_4_ * fVar175;
    auVar56._20_4_ = auVar33._20_4_ * fVar332;
    auVar56._24_4_ = auVar33._24_4_ * fVar333;
    auVar56._28_4_ = fVar349 + auVar114._28_4_;
    auVar113 = vsubps_avx(auVar55,auVar56);
    auVar27 = vminps_avx(auVar28,auVar29);
    auVar112 = vmaxps_avx(auVar28,auVar29);
    auVar28 = vminps_avx(auVar146,auVar147);
    auVar28 = vminps_avx(auVar27,auVar28);
    auVar27 = vmaxps_avx(auVar146,auVar147);
    auVar112 = vmaxps_avx(auVar112,auVar27);
    auVar29 = vminps_avx(auVar148,auVar168);
    auVar27 = vmaxps_avx(auVar148,auVar168);
    auVar30 = vminps_avx(auVar169,auVar113);
    auVar29 = vminps_avx(auVar29,auVar30);
    auVar29 = vminps_avx(auVar28,auVar29);
    auVar28 = vmaxps_avx(auVar169,auVar113);
    auVar27 = vmaxps_avx(auVar27,auVar28);
    auVar27 = vmaxps_avx(auVar112,auVar27);
    auVar112 = vcmpps_avx(auVar29,local_280,2);
    auVar27 = vcmpps_avx(auVar27,local_2a0,5);
    auVar112 = vandps_avx(auVar27,auVar112);
    auVar27 = local_340 & auVar112;
    uVar87 = 0;
    if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar27 >> 0x7f,0) != '\0') ||
          (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar27 >> 0xbf,0) != '\0') ||
        (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar27[0x1f] < '\0')
    {
      auVar27 = vsubps_avx(auVar32,local_1c0);
      auVar28 = vsubps_avx(auVar33,auVar291);
      fVar205 = auVar27._0_4_ + auVar28._0_4_;
      fVar174 = auVar27._4_4_ + auVar28._4_4_;
      fVar123 = auVar27._8_4_ + auVar28._8_4_;
      fVar206 = auVar27._12_4_ + auVar28._12_4_;
      fVar232 = auVar27._16_4_ + auVar28._16_4_;
      fVar152 = auVar27._20_4_ + auVar28._20_4_;
      fVar207 = auVar27._24_4_ + auVar28._24_4_;
      auVar29 = vsubps_avx(local_200,local_1e0);
      auVar30 = vsubps_avx(auVar36,auVar312);
      fVar234 = auVar29._0_4_ + auVar30._0_4_;
      fVar331 = auVar29._4_4_ + auVar30._4_4_;
      fVar260 = auVar29._8_4_ + auVar30._8_4_;
      fVar175 = auVar29._12_4_ + auVar30._12_4_;
      fVar332 = auVar29._16_4_ + auVar30._16_4_;
      fVar333 = auVar29._20_4_ + auVar30._20_4_;
      fVar349 = auVar29._24_4_ + auVar30._24_4_;
      fVar122 = auVar30._28_4_;
      auVar57._4_4_ = local_1e0._4_4_ * fVar174;
      auVar57._0_4_ = local_1e0._0_4_ * fVar205;
      auVar57._8_4_ = local_1e0._8_4_ * fVar123;
      auVar57._12_4_ = local_1e0._12_4_ * fVar206;
      auVar57._16_4_ = local_1e0._16_4_ * fVar232;
      auVar57._20_4_ = local_1e0._20_4_ * fVar152;
      auVar57._24_4_ = local_1e0._24_4_ * fVar207;
      auVar57._28_4_ = local_1e0._28_4_;
      auVar58._4_4_ = local_1c0._4_4_ * fVar331;
      auVar58._0_4_ = local_1c0._0_4_ * fVar234;
      auVar58._8_4_ = local_1c0._8_4_ * fVar260;
      auVar58._12_4_ = local_1c0._12_4_ * fVar175;
      auVar58._16_4_ = local_1c0._16_4_ * fVar332;
      auVar58._20_4_ = local_1c0._20_4_ * fVar333;
      auVar58._24_4_ = local_1c0._24_4_ * fVar349;
      auVar58._28_4_ = local_1c0._28_4_;
      auVar30 = vsubps_avx(auVar57,auVar58);
      auVar59._4_4_ = fVar231 * fVar174;
      auVar59._0_4_ = fVar362 * fVar205;
      auVar59._8_4_ = fVar363 * fVar123;
      auVar59._12_4_ = fVar236 * fVar206;
      auVar59._16_4_ = fVar364 * fVar232;
      auVar59._20_4_ = fVar365 * fVar152;
      auVar59._24_4_ = fVar366 * fVar207;
      auVar59._28_4_ = local_1e0._28_4_;
      auVar60._4_4_ = fVar331 * fStack_21c;
      auVar60._0_4_ = fVar234 * local_220;
      auVar60._8_4_ = fVar260 * fStack_218;
      auVar60._12_4_ = fVar175 * fStack_214;
      auVar60._16_4_ = fVar332 * fStack_210;
      auVar60._20_4_ = fVar333 * fStack_20c;
      auVar60._24_4_ = fVar349 * fStack_208;
      auVar60._28_4_ = fVar122;
      auVar113 = vsubps_avx(auVar59,auVar60);
      auVar61._4_4_ = fVar174 * auVar31._4_4_;
      auVar61._0_4_ = fVar205 * auVar31._0_4_;
      auVar61._8_4_ = fVar123 * auVar31._8_4_;
      auVar61._12_4_ = fVar206 * auVar31._12_4_;
      auVar61._16_4_ = fVar232 * auVar31._16_4_;
      auVar61._20_4_ = fVar152 * auVar31._20_4_;
      auVar61._24_4_ = fVar207 * auVar31._24_4_;
      auVar61._28_4_ = fVar122;
      auVar62._4_4_ = fVar331 * fStack_69c;
      auVar62._0_4_ = fVar234 * local_6a0;
      auVar62._8_4_ = fVar260 * fStack_698;
      auVar62._12_4_ = fVar175 * fStack_694;
      auVar62._16_4_ = fVar332 * fStack_690;
      auVar62._20_4_ = fVar333 * fStack_68c;
      auVar62._24_4_ = fVar349 * fStack_688;
      auVar62._28_4_ = local_1e0._28_4_ + auVar227._28_4_;
      auVar31 = vsubps_avx(auVar61,auVar62);
      auVar63._4_4_ = local_200._4_4_ * fVar174;
      auVar63._0_4_ = local_200._0_4_ * fVar205;
      auVar63._8_4_ = local_200._8_4_ * fVar123;
      auVar63._12_4_ = local_200._12_4_ * fVar206;
      auVar63._16_4_ = local_200._16_4_ * fVar232;
      auVar63._20_4_ = local_200._20_4_ * fVar152;
      auVar63._24_4_ = local_200._24_4_ * fVar207;
      auVar63._28_4_ = local_1e0._28_4_ + auVar227._28_4_;
      auVar64._4_4_ = auVar32._4_4_ * fVar331;
      auVar64._0_4_ = auVar32._0_4_ * fVar234;
      auVar64._8_4_ = auVar32._8_4_ * fVar260;
      auVar64._12_4_ = auVar32._12_4_ * fVar175;
      auVar64._16_4_ = auVar32._16_4_ * fVar332;
      auVar64._20_4_ = auVar32._20_4_ * fVar333;
      uVar3 = auVar32._28_4_;
      auVar64._24_4_ = auVar32._24_4_ * fVar349;
      auVar64._28_4_ = uVar3;
      auVar32 = vsubps_avx(auVar63,auVar64);
      auVar65._4_4_ = auVar312._4_4_ * fVar174;
      auVar65._0_4_ = auVar312._0_4_ * fVar205;
      auVar65._8_4_ = auVar312._8_4_ * fVar123;
      auVar65._12_4_ = auVar312._12_4_ * fVar206;
      auVar65._16_4_ = auVar312._16_4_ * fVar232;
      auVar65._20_4_ = auVar312._20_4_ * fVar152;
      auVar65._24_4_ = auVar312._24_4_ * fVar207;
      auVar65._28_4_ = auVar312._28_4_;
      auVar66._4_4_ = auVar291._4_4_ * fVar331;
      auVar66._0_4_ = auVar291._0_4_ * fVar234;
      auVar66._8_4_ = auVar291._8_4_ * fVar260;
      auVar66._12_4_ = auVar291._12_4_ * fVar175;
      auVar66._16_4_ = auVar291._16_4_ * fVar332;
      auVar66._20_4_ = auVar291._20_4_ * fVar333;
      auVar66._24_4_ = auVar291._24_4_ * fVar349;
      auVar66._28_4_ = auVar291._28_4_;
      auVar114 = vsubps_avx(auVar65,auVar66);
      auVar67._4_4_ = fVar174 * fStack_25c;
      auVar67._0_4_ = fVar205 * local_260;
      auVar67._8_4_ = fVar123 * fStack_258;
      auVar67._12_4_ = fVar206 * fStack_254;
      auVar67._16_4_ = fVar232 * fStack_250;
      auVar67._20_4_ = fVar152 * fStack_24c;
      auVar67._24_4_ = fVar207 * fStack_248;
      auVar67._28_4_ = auVar312._28_4_;
      auVar68._4_4_ = fVar331 * fStack_23c;
      auVar68._0_4_ = fVar234 * local_240;
      auVar68._8_4_ = fVar260 * fStack_238;
      auVar68._12_4_ = fVar175 * fStack_234;
      auVar68._16_4_ = fVar332 * fStack_230;
      auVar68._20_4_ = fVar333 * fStack_22c;
      auVar68._24_4_ = fVar349 * fStack_228;
      auVar68._28_4_ = uVar3;
      auVar146 = vsubps_avx(auVar67,auVar68);
      auVar69._4_4_ = fVar174 * auVar35._4_4_;
      auVar69._0_4_ = fVar205 * auVar35._0_4_;
      auVar69._8_4_ = fVar123 * auVar35._8_4_;
      auVar69._12_4_ = fVar206 * auVar35._12_4_;
      auVar69._16_4_ = fVar232 * auVar35._16_4_;
      auVar69._20_4_ = fVar152 * auVar35._20_4_;
      auVar69._24_4_ = fVar207 * auVar35._24_4_;
      auVar69._28_4_ = uVar3;
      auVar70._4_4_ = fVar331 * auVar34._4_4_;
      auVar70._0_4_ = fVar234 * auVar34._0_4_;
      auVar70._8_4_ = fVar260 * auVar34._8_4_;
      auVar70._12_4_ = fVar175 * auVar34._12_4_;
      auVar70._16_4_ = fVar332 * auVar34._16_4_;
      auVar70._20_4_ = fVar333 * auVar34._20_4_;
      auVar70._24_4_ = fVar349 * auVar34._24_4_;
      auVar70._28_4_ = local_200._28_4_;
      auVar34 = vsubps_avx(auVar69,auVar70);
      auVar71._4_4_ = auVar36._4_4_ * fVar174;
      auVar71._0_4_ = auVar36._0_4_ * fVar205;
      auVar71._8_4_ = auVar36._8_4_ * fVar123;
      auVar71._12_4_ = auVar36._12_4_ * fVar206;
      auVar71._16_4_ = auVar36._16_4_ * fVar232;
      auVar71._20_4_ = auVar36._20_4_ * fVar152;
      auVar71._24_4_ = auVar36._24_4_ * fVar207;
      auVar71._28_4_ = auVar27._28_4_ + auVar28._28_4_;
      auVar72._4_4_ = auVar33._4_4_ * fVar331;
      auVar72._0_4_ = auVar33._0_4_ * fVar234;
      auVar72._8_4_ = auVar33._8_4_ * fVar260;
      auVar72._12_4_ = auVar33._12_4_ * fVar175;
      auVar72._16_4_ = auVar33._16_4_ * fVar332;
      auVar72._20_4_ = auVar33._20_4_ * fVar333;
      auVar72._24_4_ = auVar33._24_4_ * fVar349;
      auVar72._28_4_ = auVar29._28_4_ + fVar122;
      auVar33 = vsubps_avx(auVar71,auVar72);
      auVar28 = vminps_avx(auVar30,auVar113);
      auVar27 = vmaxps_avx(auVar30,auVar113);
      auVar29 = vminps_avx(auVar31,auVar32);
      auVar29 = vminps_avx(auVar28,auVar29);
      auVar28 = vmaxps_avx(auVar31,auVar32);
      auVar27 = vmaxps_avx(auVar27,auVar28);
      auVar30 = vminps_avx(auVar114,auVar146);
      auVar28 = vmaxps_avx(auVar114,auVar146);
      auVar31 = vminps_avx(auVar34,auVar33);
      auVar30 = vminps_avx(auVar30,auVar31);
      auVar30 = vminps_avx(auVar29,auVar30);
      auVar29 = vmaxps_avx(auVar34,auVar33);
      auVar28 = vmaxps_avx(auVar28,auVar29);
      auVar28 = vmaxps_avx(auVar27,auVar28);
      auVar27 = vcmpps_avx(auVar30,local_280,2);
      auVar28 = vcmpps_avx(auVar28,local_2a0,5);
      auVar27 = vandps_avx(auVar28,auVar27);
      auVar112 = vandps_avx(auVar112,local_340);
      auVar28 = auVar112 & auVar27;
      if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar28 >> 0x7f,0) != '\0') ||
            (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar28 >> 0xbf,0) != '\0') ||
          (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar28[0x1f] < '\0') {
        auVar112 = vandps_avx(auVar27,auVar112);
        uVar87 = vmovmskps_avx(auVar112);
      }
    }
    if (uVar87 != 0) {
      auStack_460[uVar89] = uVar87;
      uVar4 = vmovlps_avx(local_400);
      *(undefined8 *)(afStack_320 + uVar89 * 2) = uVar4;
      uVar5 = vmovlps_avx(_local_720);
      auStack_1a0[uVar89] = uVar5;
      uVar89 = (ulong)((int)uVar89 + 1);
    }
    auVar404 = ZEXT864(0) << 0x20;
    do {
      if ((int)uVar89 == 0) {
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar121._4_4_ = uVar3;
        auVar121._0_4_ = uVar3;
        auVar121._8_4_ = uVar3;
        auVar121._12_4_ = uVar3;
        auVar121._16_4_ = uVar3;
        auVar121._20_4_ = uVar3;
        auVar121._24_4_ = uVar3;
        auVar121._28_4_ = uVar3;
        auVar112 = vcmpps_avx(local_2c0,auVar121,2);
        uVar93 = vmovmskps_avx(auVar112);
        uVar86 = uVar86 & local_508 & uVar93;
        if (uVar86 == 0) {
          return;
        }
        goto LAB_012a4bec;
      }
      uVar91 = (int)uVar89 - 1;
      uVar92 = (ulong)uVar91;
      uVar87 = auStack_460[uVar92];
      fVar122 = afStack_320[uVar92 * 2];
      fVar205 = afStack_320[uVar92 * 2 + 1];
      register0x00001548 = 0;
      local_720 = (undefined1  [8])auStack_1a0[uVar92];
      uVar5 = 0;
      if (uVar87 != 0) {
        for (; (uVar87 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar87 = uVar87 - 1 & uVar87;
      auStack_460[uVar92] = uVar87;
      if (uVar87 == 0) {
        uVar89 = (ulong)uVar91;
      }
      fVar123 = (float)(uVar5 + 1) * 0.14285715;
      fVar174 = (1.0 - (float)uVar5 * 0.14285715) * fVar122 + fVar205 * (float)uVar5 * 0.14285715;
      fVar122 = (1.0 - fVar123) * fVar122 + fVar205 * fVar123;
      fVar205 = fVar122 - fVar174;
      if (0.16666667 <= fVar205) break;
      auVar136 = vshufps_avx(_local_720,_local_720,0x50);
      auVar162._8_4_ = 0x3f800000;
      auVar162._0_8_ = &DAT_3f8000003f800000;
      auVar162._12_4_ = 0x3f800000;
      auVar217 = vsubps_avx(auVar162,auVar136);
      fVar123 = auVar136._0_4_;
      fVar206 = auVar136._4_4_;
      fVar232 = auVar136._8_4_;
      fVar152 = auVar136._12_4_;
      fVar207 = auVar217._0_4_;
      fVar234 = auVar217._4_4_;
      fVar331 = auVar217._8_4_;
      fVar260 = auVar217._12_4_;
      auVar186._0_4_ = auVar300._0_4_ * fVar123 + fVar207 * (float)local_5e0._0_4_;
      auVar186._4_4_ = auVar300._4_4_ * fVar206 + fVar234 * (float)local_5e0._4_4_;
      auVar186._8_4_ = auVar300._0_4_ * fVar232 + fVar331 * (float)local_5e0._0_4_;
      auVar186._12_4_ = auVar300._4_4_ * fVar152 + fVar260 * (float)local_5e0._4_4_;
      auVar218._0_4_ = auVar315._0_4_ * fVar123 + fVar207 * auVar390._0_4_;
      auVar218._4_4_ = auVar315._4_4_ * fVar206 + fVar234 * auVar390._4_4_;
      auVar218._8_4_ = auVar315._0_4_ * fVar232 + fVar331 * auVar390._0_4_;
      auVar218._12_4_ = auVar315._4_4_ * fVar152 + fVar260 * auVar390._4_4_;
      auVar244._0_4_ = auVar339._0_4_ * fVar123 + auVar401._0_4_ * fVar207;
      auVar244._4_4_ = auVar339._4_4_ * fVar206 + auVar401._4_4_ * fVar234;
      auVar244._8_4_ = auVar339._0_4_ * fVar232 + auVar401._0_4_ * fVar331;
      auVar244._12_4_ = auVar339._4_4_ * fVar152 + auVar401._4_4_ * fVar260;
      auVar132._0_4_ = auVar108._0_4_ * fVar123 + auVar280._0_4_ * fVar207;
      auVar132._4_4_ = auVar108._4_4_ * fVar206 + auVar280._4_4_ * fVar234;
      auVar132._8_4_ = auVar108._0_4_ * fVar232 + auVar280._0_4_ * fVar331;
      auVar132._12_4_ = auVar108._4_4_ * fVar152 + auVar280._4_4_ * fVar260;
      auVar171._16_16_ = auVar186;
      auVar171._0_16_ = auVar186;
      auVar202._16_16_ = auVar218;
      auVar202._0_16_ = auVar218;
      auVar229._16_16_ = auVar244;
      auVar229._0_16_ = auVar244;
      auVar112 = vshufps_avx(ZEXT2032(CONCAT416(fVar122,ZEXT416((uint)fVar174))),
                             ZEXT2032(CONCAT416(fVar122,ZEXT416((uint)fVar174))),0);
      auVar27 = vsubps_avx(auVar202,auVar171);
      fVar123 = auVar112._0_4_;
      fVar206 = auVar112._4_4_;
      fVar232 = auVar112._8_4_;
      fVar152 = auVar112._12_4_;
      fVar207 = auVar112._16_4_;
      fVar234 = auVar112._20_4_;
      fVar331 = auVar112._24_4_;
      auVar172._0_4_ = auVar186._0_4_ + auVar27._0_4_ * fVar123;
      auVar172._4_4_ = auVar186._4_4_ + auVar27._4_4_ * fVar206;
      auVar172._8_4_ = auVar186._8_4_ + auVar27._8_4_ * fVar232;
      auVar172._12_4_ = auVar186._12_4_ + auVar27._12_4_ * fVar152;
      auVar172._16_4_ = auVar186._0_4_ + auVar27._16_4_ * fVar207;
      auVar172._20_4_ = auVar186._4_4_ + auVar27._20_4_ * fVar234;
      auVar172._24_4_ = auVar186._8_4_ + auVar27._24_4_ * fVar331;
      auVar172._28_4_ = auVar186._12_4_ + auVar27._28_4_;
      auVar27 = vsubps_avx(auVar229,auVar202);
      auVar203._0_4_ = auVar218._0_4_ + auVar27._0_4_ * fVar123;
      auVar203._4_4_ = auVar218._4_4_ + auVar27._4_4_ * fVar206;
      auVar203._8_4_ = auVar218._8_4_ + auVar27._8_4_ * fVar232;
      auVar203._12_4_ = auVar218._12_4_ + auVar27._12_4_ * fVar152;
      auVar203._16_4_ = auVar218._0_4_ + auVar27._16_4_ * fVar207;
      auVar203._20_4_ = auVar218._4_4_ + auVar27._20_4_ * fVar234;
      auVar203._24_4_ = auVar218._8_4_ + auVar27._24_4_ * fVar331;
      auVar203._28_4_ = auVar218._12_4_ + auVar27._28_4_;
      auVar136 = vsubps_avx(auVar132,auVar244);
      auVar149._0_4_ = auVar244._0_4_ + auVar136._0_4_ * fVar123;
      auVar149._4_4_ = auVar244._4_4_ + auVar136._4_4_ * fVar206;
      auVar149._8_4_ = auVar244._8_4_ + auVar136._8_4_ * fVar232;
      auVar149._12_4_ = auVar244._12_4_ + auVar136._12_4_ * fVar152;
      auVar149._16_4_ = auVar244._0_4_ + auVar136._0_4_ * fVar207;
      auVar149._20_4_ = auVar244._4_4_ + auVar136._4_4_ * fVar234;
      auVar149._24_4_ = auVar244._8_4_ + auVar136._8_4_ * fVar331;
      auVar149._28_4_ = auVar244._12_4_ + auVar136._12_4_;
      auVar27 = vsubps_avx(auVar203,auVar172);
      auVar173._0_4_ = auVar172._0_4_ + fVar123 * auVar27._0_4_;
      auVar173._4_4_ = auVar172._4_4_ + fVar206 * auVar27._4_4_;
      auVar173._8_4_ = auVar172._8_4_ + fVar232 * auVar27._8_4_;
      auVar173._12_4_ = auVar172._12_4_ + fVar152 * auVar27._12_4_;
      auVar173._16_4_ = auVar172._16_4_ + fVar207 * auVar27._16_4_;
      auVar173._20_4_ = auVar172._20_4_ + fVar234 * auVar27._20_4_;
      auVar173._24_4_ = auVar172._24_4_ + fVar331 * auVar27._24_4_;
      auVar173._28_4_ = auVar172._28_4_ + auVar27._28_4_;
      auVar27 = vsubps_avx(auVar149,auVar203);
      auVar150._0_4_ = auVar203._0_4_ + fVar123 * auVar27._0_4_;
      auVar150._4_4_ = auVar203._4_4_ + fVar206 * auVar27._4_4_;
      auVar150._8_4_ = auVar203._8_4_ + fVar232 * auVar27._8_4_;
      auVar150._12_4_ = auVar203._12_4_ + fVar152 * auVar27._12_4_;
      auVar150._16_4_ = auVar203._16_4_ + fVar207 * auVar27._16_4_;
      auVar150._20_4_ = auVar203._20_4_ + fVar234 * auVar27._20_4_;
      auVar150._24_4_ = auVar203._24_4_ + fVar331 * auVar27._24_4_;
      auVar150._28_4_ = auVar203._28_4_ + auVar27._28_4_;
      auVar27 = vsubps_avx(auVar150,auVar173);
      auVar187._0_4_ = auVar173._0_4_ + fVar123 * auVar27._0_4_;
      auVar187._4_4_ = auVar173._4_4_ + fVar206 * auVar27._4_4_;
      auVar187._8_4_ = auVar173._8_4_ + fVar232 * auVar27._8_4_;
      auVar187._12_4_ = auVar173._12_4_ + fVar152 * auVar27._12_4_;
      auVar204._16_4_ = auVar173._16_4_ + fVar207 * auVar27._16_4_;
      auVar204._0_16_ = auVar187;
      auVar204._20_4_ = auVar173._20_4_ + fVar234 * auVar27._20_4_;
      auVar204._24_4_ = auVar173._24_4_ + fVar331 * auVar27._24_4_;
      auVar204._28_4_ = auVar173._28_4_ + auVar203._28_4_;
      fVar123 = auVar27._4_4_ * 3.0;
      auVar163 = auVar204._16_16_;
      auVar135 = vshufps_avx(ZEXT416((uint)(fVar205 * 0.33333334)),
                             ZEXT416((uint)(fVar205 * 0.33333334)),0);
      auVar316._0_4_ = auVar187._0_4_ + auVar135._0_4_ * auVar27._0_4_ * 3.0;
      auVar316._4_4_ = auVar187._4_4_ + auVar135._4_4_ * fVar123;
      auVar316._8_4_ = auVar187._8_4_ + auVar135._8_4_ * auVar27._8_4_ * 3.0;
      auVar316._12_4_ = auVar187._12_4_ + auVar135._12_4_ * auVar27._12_4_ * 3.0;
      auVar252 = vshufpd_avx(auVar187,auVar187,3);
      auVar194 = vshufpd_avx(auVar163,auVar163,3);
      auVar136 = vsubps_avx(auVar252,auVar187);
      auVar217 = vsubps_avx(auVar194,auVar163);
      auVar133._0_4_ = auVar136._0_4_ + auVar217._0_4_;
      auVar133._4_4_ = auVar136._4_4_ + auVar217._4_4_;
      auVar133._8_4_ = auVar136._8_4_ + auVar217._8_4_;
      auVar133._12_4_ = auVar136._12_4_ + auVar217._12_4_;
      auVar136 = vmovshdup_avx(auVar187);
      auVar217 = vmovshdup_avx(auVar316);
      auVar193 = vshufps_avx(auVar133,auVar133,0);
      auVar110 = vshufps_avx(auVar133,auVar133,0x55);
      fVar234 = auVar110._0_4_;
      fVar331 = auVar110._4_4_;
      fVar260 = auVar110._8_4_;
      fVar175 = auVar110._12_4_;
      fVar206 = auVar193._0_4_;
      fVar232 = auVar193._4_4_;
      fVar152 = auVar193._8_4_;
      fVar207 = auVar193._12_4_;
      auVar301._0_4_ = fVar206 * auVar187._0_4_ + fVar234 * auVar136._0_4_;
      auVar301._4_4_ = fVar232 * auVar187._4_4_ + fVar331 * auVar136._4_4_;
      auVar301._8_4_ = fVar152 * auVar187._8_4_ + fVar260 * auVar136._8_4_;
      auVar301._12_4_ = fVar207 * auVar187._12_4_ + fVar175 * auVar136._12_4_;
      auVar317._0_4_ = auVar316._0_4_ * fVar206 + fVar234 * auVar217._0_4_;
      auVar317._4_4_ = auVar316._4_4_ * fVar232 + fVar331 * auVar217._4_4_;
      auVar317._8_4_ = auVar316._8_4_ * fVar152 + fVar260 * auVar217._8_4_;
      auVar317._12_4_ = auVar316._12_4_ * fVar207 + fVar175 * auVar217._12_4_;
      auVar217 = vshufps_avx(auVar301,auVar301,0xe8);
      auVar193 = vshufps_avx(auVar317,auVar317,0xe8);
      auVar136 = vcmpps_avx(auVar217,auVar193,1);
      uVar87 = vextractps_avx(auVar136,0);
      auVar110 = auVar317;
      if ((uVar87 & 1) == 0) {
        auVar110 = auVar301;
      }
      auVar134._0_4_ = auVar135._0_4_ * auVar27._16_4_ * 3.0;
      auVar134._4_4_ = auVar135._4_4_ * fVar123;
      auVar134._8_4_ = auVar135._8_4_ * auVar27._24_4_ * 3.0;
      auVar134._12_4_ = auVar135._12_4_ * auVar112._28_4_;
      auVar8 = vsubps_avx(auVar163,auVar134);
      auVar135 = vmovshdup_avx(auVar8);
      auVar163 = vmovshdup_avx(auVar163);
      fVar123 = auVar8._0_4_;
      fVar332 = auVar8._4_4_;
      auVar410._0_4_ = fVar206 * fVar123 + fVar234 * auVar135._0_4_;
      auVar410._4_4_ = fVar232 * fVar332 + fVar331 * auVar135._4_4_;
      auVar410._8_4_ = fVar152 * auVar8._8_4_ + fVar260 * auVar135._8_4_;
      auVar410._12_4_ = fVar207 * auVar8._12_4_ + fVar175 * auVar135._12_4_;
      auVar391._0_4_ = fVar206 * auVar204._16_4_ + fVar234 * auVar163._0_4_;
      auVar391._4_4_ = fVar232 * auVar204._20_4_ + fVar331 * auVar163._4_4_;
      auVar391._8_4_ = fVar152 * auVar204._24_4_ + fVar260 * auVar163._8_4_;
      auVar391._12_4_ = fVar207 * auVar204._28_4_ + fVar175 * auVar163._12_4_;
      auVar163 = vshufps_avx(auVar410,auVar410,0xe8);
      auVar7 = vshufps_avx(auVar391,auVar391,0xe8);
      auVar135 = vcmpps_avx(auVar163,auVar7,1);
      uVar87 = vextractps_avx(auVar135,0);
      auVar282 = auVar391;
      if ((uVar87 & 1) == 0) {
        auVar282 = auVar410;
      }
      auVar110 = vmaxss_avx(auVar282,auVar110);
      auVar217 = vminps_avx(auVar217,auVar193);
      auVar193 = vminps_avx(auVar163,auVar7);
      auVar193 = vminps_avx(auVar217,auVar193);
      auVar136 = vshufps_avx(auVar136,auVar136,0x55);
      auVar136 = vblendps_avx(auVar136,auVar135,2);
      auVar135 = vpslld_avx(auVar136,0x1f);
      auVar136 = vshufpd_avx(auVar317,auVar317,1);
      auVar136 = vinsertps_avx(auVar136,auVar391,0x9c);
      auVar217 = vshufpd_avx(auVar301,auVar301,1);
      auVar217 = vinsertps_avx(auVar217,auVar410,0x9c);
      auVar136 = vblendvps_avx(auVar217,auVar136,auVar135);
      auVar217 = vmovshdup_avx(auVar136);
      auVar136 = vmaxss_avx(auVar217,auVar136);
      fVar152 = auVar193._0_4_;
      auVar217 = vmovshdup_avx(auVar193);
      fVar232 = auVar136._0_4_;
      fVar207 = auVar217._0_4_;
      fVar206 = auVar110._0_4_;
      if ((0.0001 <= fVar152) || (fVar232 <= -0.0001)) {
        if ((-0.0001 < fVar206 && fVar207 < 0.0001) ||
           ((fVar152 < 0.0001 && -0.0001 < fVar206 || (fVar207 < 0.0001 && -0.0001 < fVar232))))
        goto LAB_012a62b1;
LAB_012a6d4b:
        bVar73 = true;
        auVar404 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
LAB_012a62b1:
        auVar404 = ZEXT864(0) << 0x20;
        auVar135 = vcmpps_avx(auVar193,ZEXT816(0) << 0x20,1);
        auVar217 = vcmpss_avx(auVar110,ZEXT416(0),1);
        auVar245._8_4_ = 0x3f800000;
        auVar245._0_8_ = &DAT_3f8000003f800000;
        auVar245._12_4_ = 0x3f800000;
        auVar318._8_4_ = 0xbf800000;
        auVar318._0_8_ = 0xbf800000bf800000;
        auVar318._12_4_ = 0xbf800000;
        auVar217 = vblendvps_avx(auVar245,auVar318,auVar217);
        auVar135 = vblendvps_avx(auVar245,auVar318,auVar135);
        auVar163 = vcmpss_avx(auVar217,auVar135,4);
        auVar163 = vpshufd_avx(ZEXT416(auVar163._0_4_ & 1),0x50);
        auVar163 = vpslld_avx(auVar163,0x1f);
        auVar163 = vpsrad_avx(auVar163,0x1f);
        auVar163 = vpandn_avx(auVar163,_DAT_02020eb0);
        auVar7 = vmovshdup_avx(auVar135);
        fVar234 = auVar7._0_4_;
        local_670 = auVar297._0_4_;
        fStack_66c = auVar297._4_4_;
        fStack_668 = auVar297._8_4_;
        fStack_664 = auVar297._12_4_;
        if ((auVar135._0_4_ != fVar234) || (NAN(auVar135._0_4_) || NAN(fVar234))) {
          if ((fVar207 != fVar152) || (NAN(fVar207) || NAN(fVar152))) {
            fVar152 = -fVar152 / (fVar207 - fVar152);
            auVar135 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar152) * 0.0 + fVar152)));
          }
          else {
            auVar135 = vcmpss_avx(auVar193,ZEXT416(0),0);
            auVar135 = vpshufd_avx(ZEXT416(auVar135._0_4_ & 1),0x50);
            auVar135 = vpslld_avx(auVar135,0x1f);
            auVar135 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar135);
          }
          auVar7 = vcmpps_avx(auVar163,auVar135,1);
          auVar193 = vblendps_avx(auVar163,auVar135,2);
          auVar135 = vblendps_avx(auVar135,auVar163,2);
          auVar163 = vblendvps_avx(auVar135,auVar193,auVar7);
        }
        auVar136 = vcmpss_avx(auVar136,ZEXT416(0),1);
        auVar164._8_4_ = 0x3f800000;
        auVar164._0_8_ = &DAT_3f8000003f800000;
        auVar164._12_4_ = 0x3f800000;
        auVar246._8_4_ = 0xbf800000;
        auVar246._0_8_ = 0xbf800000bf800000;
        auVar246._12_4_ = 0xbf800000;
        auVar136 = vblendvps_avx(auVar164,auVar246,auVar136);
        fVar152 = auVar136._0_4_;
        if ((auVar217._0_4_ != fVar152) || (NAN(auVar217._0_4_) || NAN(fVar152))) {
          if ((fVar232 != fVar206) || (NAN(fVar232) || NAN(fVar206))) {
            fVar206 = -fVar206 / (fVar232 - fVar206);
            auVar136 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar206) * 0.0 + fVar206)));
          }
          else {
            auVar136 = vcmpss_avx(auVar110,ZEXT416(0),0);
            auVar136 = vpshufd_avx(ZEXT416(auVar136._0_4_ & 1),0x50);
            auVar136 = vpslld_avx(auVar136,0x1f);
            auVar136 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar136);
          }
          auVar135 = vcmpps_avx(auVar163,auVar136,1);
          auVar217 = vblendps_avx(auVar163,auVar136,2);
          auVar136 = vblendps_avx(auVar136,auVar163,2);
          auVar163 = vblendvps_avx(auVar136,auVar217,auVar135);
        }
        if ((fVar234 != fVar152) || (NAN(fVar234) || NAN(fVar152))) {
          auVar137._8_4_ = 0x3f800000;
          auVar137._0_8_ = &DAT_3f8000003f800000;
          auVar137._12_4_ = 0x3f800000;
          auVar136 = vcmpps_avx(auVar163,auVar137,1);
          auVar217 = vinsertps_avx(auVar163,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar247._4_12_ = auVar163._4_12_;
          auVar247._0_4_ = 0x3f800000;
          auVar163 = vblendvps_avx(auVar247,auVar217,auVar136);
        }
        auVar136 = vcmpps_avx(auVar163,_DAT_01fec6f0,1);
        auVar74._12_4_ = 0;
        auVar74._0_12_ = auVar163._4_12_;
        auVar217 = vinsertps_avx(auVar163,ZEXT416(0x3f800000),0x10);
        auVar136 = vblendvps_avx(auVar217,auVar74 << 0x20,auVar136);
        auVar217 = vmovshdup_avx(auVar136);
        bVar73 = true;
        if (auVar136._0_4_ <= auVar217._0_4_) {
          auVar138._0_4_ = auVar136._0_4_ + -0.1;
          auVar138._4_4_ = auVar136._4_4_ + 0.1;
          auVar138._8_4_ = auVar136._8_4_ + 0.0;
          auVar138._12_4_ = auVar136._12_4_ + 0.0;
          auVar135 = vshufpd_avx(auVar316,auVar316,3);
          auVar188._8_8_ = 0x3f80000000000000;
          auVar188._0_8_ = 0x3f80000000000000;
          auVar136 = vcmpps_avx(auVar138,auVar188,1);
          auVar75._12_4_ = 0;
          auVar75._0_12_ = auVar138._4_12_;
          auVar217 = vinsertps_avx(auVar138,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar136 = vblendvps_avx(auVar217,auVar75 << 0x20,auVar136);
          auVar217 = vshufpd_avx(auVar8,auVar8,3);
          auVar193 = vshufps_avx(auVar136,auVar136,0x50);
          auVar189._8_4_ = 0x3f800000;
          auVar189._0_8_ = &DAT_3f8000003f800000;
          auVar189._12_4_ = 0x3f800000;
          auVar110 = vsubps_avx(auVar189,auVar193);
          local_640 = auVar252._0_4_;
          fStack_63c = auVar252._4_4_;
          fStack_638 = auVar252._8_4_;
          fStack_634 = auVar252._12_4_;
          fVar206 = auVar193._0_4_;
          fVar232 = auVar193._4_4_;
          fVar152 = auVar193._8_4_;
          fVar207 = auVar193._12_4_;
          local_6e0 = auVar194._0_4_;
          fStack_6dc = auVar194._4_4_;
          fStack_6d8 = auVar194._8_4_;
          fStack_6d4 = auVar194._12_4_;
          fVar234 = auVar110._0_4_;
          fVar331 = auVar110._4_4_;
          fVar260 = auVar110._8_4_;
          fVar175 = auVar110._12_4_;
          auVar165._0_4_ = fVar206 * local_640 + fVar234 * auVar187._0_4_;
          auVar165._4_4_ = fVar232 * fStack_63c + fVar331 * auVar187._4_4_;
          auVar165._8_4_ = fVar152 * fStack_638 + fVar260 * auVar187._0_4_;
          auVar165._12_4_ = fVar207 * fStack_634 + fVar175 * auVar187._4_4_;
          auVar219._0_4_ = fVar206 * auVar135._0_4_ + fVar234 * auVar316._0_4_;
          auVar219._4_4_ = fVar232 * auVar135._4_4_ + fVar331 * auVar316._4_4_;
          auVar219._8_4_ = fVar152 * auVar135._8_4_ + fVar260 * auVar316._0_4_;
          auVar219._12_4_ = fVar207 * auVar135._12_4_ + fVar175 * auVar316._4_4_;
          auVar283._0_4_ = fVar206 * auVar217._0_4_ + fVar234 * fVar123;
          auVar283._4_4_ = fVar232 * auVar217._4_4_ + fVar331 * fVar332;
          auVar283._8_4_ = fVar152 * auVar217._8_4_ + fVar260 * fVar123;
          auVar283._12_4_ = fVar207 * auVar217._12_4_ + fVar175 * fVar332;
          auVar302._0_4_ = fVar206 * local_6e0 + fVar234 * auVar204._16_4_;
          auVar302._4_4_ = fVar232 * fStack_6dc + fVar331 * auVar204._20_4_;
          auVar302._8_4_ = fVar152 * fStack_6d8 + fVar260 * auVar204._16_4_;
          auVar302._12_4_ = fVar207 * fStack_6d4 + fVar175 * auVar204._20_4_;
          auVar194 = vsubps_avx(auVar189,auVar136);
          auVar217 = vmovshdup_avx(_local_720);
          auVar252 = vmovsldup_avx(_local_720);
          local_720._0_4_ = auVar194._0_4_ * auVar252._0_4_ + auVar217._0_4_ * auVar136._0_4_;
          local_720._4_4_ = auVar194._4_4_ * auVar252._4_4_ + auVar217._4_4_ * auVar136._4_4_;
          fStack_718 = auVar194._8_4_ * auVar252._8_4_ + auVar217._8_4_ * auVar136._8_4_;
          fStack_714 = auVar194._12_4_ * auVar252._12_4_ + auVar217._12_4_ * auVar136._12_4_;
          auVar8 = vmovshdup_avx(_local_720);
          auVar136 = vsubps_avx(auVar219,auVar165);
          auVar248._0_4_ = auVar136._0_4_ * 3.0;
          auVar248._4_4_ = auVar136._4_4_ * 3.0;
          auVar248._8_4_ = auVar136._8_4_ * 3.0;
          auVar248._12_4_ = auVar136._12_4_ * 3.0;
          auVar136 = vsubps_avx(auVar283,auVar219);
          auVar266._0_4_ = auVar136._0_4_ * 3.0;
          auVar266._4_4_ = auVar136._4_4_ * 3.0;
          auVar266._8_4_ = auVar136._8_4_ * 3.0;
          auVar266._12_4_ = auVar136._12_4_ * 3.0;
          auVar136 = vsubps_avx(auVar302,auVar283);
          auVar319._0_4_ = auVar136._0_4_ * 3.0;
          auVar319._4_4_ = auVar136._4_4_ * 3.0;
          auVar319._8_4_ = auVar136._8_4_ * 3.0;
          auVar319._12_4_ = auVar136._12_4_ * 3.0;
          auVar217 = vminps_avx(auVar266,auVar319);
          auVar136 = vmaxps_avx(auVar266,auVar319);
          auVar217 = vminps_avx(auVar248,auVar217);
          auVar136 = vmaxps_avx(auVar248,auVar136);
          auVar252 = vshufpd_avx(auVar217,auVar217,3);
          auVar194 = vshufpd_avx(auVar136,auVar136,3);
          auVar217 = vminps_avx(auVar217,auVar252);
          auVar136 = vmaxps_avx(auVar136,auVar194);
          auVar252 = vshufps_avx(ZEXT416((uint)(1.0 / fVar205)),ZEXT416((uint)(1.0 / fVar205)),0);
          auVar249._0_4_ = auVar252._0_4_ * auVar217._0_4_;
          auVar249._4_4_ = auVar252._4_4_ * auVar217._4_4_;
          auVar249._8_4_ = auVar252._8_4_ * auVar217._8_4_;
          auVar249._12_4_ = auVar252._12_4_ * auVar217._12_4_;
          auVar267._0_4_ = auVar136._0_4_ * auVar252._0_4_;
          auVar267._4_4_ = auVar136._4_4_ * auVar252._4_4_;
          auVar267._8_4_ = auVar136._8_4_ * auVar252._8_4_;
          auVar267._12_4_ = auVar136._12_4_ * auVar252._12_4_;
          auVar110 = ZEXT416((uint)(1.0 / (auVar8._0_4_ - (float)local_720._0_4_)));
          auVar136 = vshufpd_avx(auVar165,auVar165,3);
          auVar217 = vshufpd_avx(auVar219,auVar219,3);
          auVar252 = vshufpd_avx(auVar283,auVar283,3);
          auVar194 = vshufpd_avx(auVar302,auVar302,3);
          auVar136 = vsubps_avx(auVar136,auVar165);
          auVar135 = vsubps_avx(auVar217,auVar219);
          auVar193 = vsubps_avx(auVar252,auVar283);
          auVar194 = vsubps_avx(auVar194,auVar302);
          auVar217 = vminps_avx(auVar136,auVar135);
          auVar136 = vmaxps_avx(auVar136,auVar135);
          auVar252 = vminps_avx(auVar193,auVar194);
          auVar252 = vminps_avx(auVar217,auVar252);
          auVar217 = vmaxps_avx(auVar193,auVar194);
          auVar136 = vmaxps_avx(auVar136,auVar217);
          auVar217 = vshufps_avx(auVar110,auVar110,0);
          auVar340._0_4_ = auVar217._0_4_ * auVar252._0_4_;
          auVar340._4_4_ = auVar217._4_4_ * auVar252._4_4_;
          auVar340._8_4_ = auVar217._8_4_ * auVar252._8_4_;
          auVar340._12_4_ = auVar217._12_4_ * auVar252._12_4_;
          auVar351._0_4_ = auVar217._0_4_ * auVar136._0_4_;
          auVar351._4_4_ = auVar217._4_4_ * auVar136._4_4_;
          auVar351._8_4_ = auVar217._8_4_ * auVar136._8_4_;
          auVar351._12_4_ = auVar217._12_4_ * auVar136._12_4_;
          auVar136 = vmovsldup_avx(_local_720);
          auVar284._4_12_ = auVar136._4_12_;
          auVar284._0_4_ = fVar174;
          auVar303._4_12_ = local_720._4_12_;
          auVar303._0_4_ = fVar122;
          auVar111._0_4_ = (fVar122 + fVar174) * 0.5;
          auVar111._4_4_ = ((float)local_720._4_4_ + auVar136._4_4_) * 0.5;
          auVar111._8_4_ = (fStack_718 + auVar136._8_4_) * 0.5;
          auVar111._12_4_ = (fStack_714 + auVar136._12_4_) * 0.5;
          auVar136 = vshufps_avx(auVar111,auVar111,0);
          fVar123 = auVar136._0_4_;
          fVar206 = auVar136._4_4_;
          fVar232 = auVar136._8_4_;
          fVar152 = auVar136._12_4_;
          auVar220._0_4_ = local_670 + fVar123 * (float)local_350._0_4_;
          auVar220._4_4_ = fStack_66c + fVar206 * (float)local_350._4_4_;
          auVar220._8_4_ = fStack_668 + fVar232 * fStack_348;
          auVar220._12_4_ = fStack_664 + fVar152 * fStack_344;
          local_5f0 = auVar263._0_4_;
          fStack_5ec = auVar263._4_4_;
          fStack_5e8 = auVar263._8_4_;
          fStack_5e4 = auVar263._12_4_;
          auVar320._0_4_ = fVar123 * (float)local_360._0_4_ + local_5f0;
          auVar320._4_4_ = fVar206 * (float)local_360._4_4_ + fStack_5ec;
          auVar320._8_4_ = fVar232 * fStack_358 + fStack_5e8;
          auVar320._12_4_ = fVar152 * fStack_354 + fStack_5e4;
          local_600 = auVar6._0_4_;
          fStack_5fc = auVar6._4_4_;
          fStack_5f8 = auVar6._8_4_;
          fStack_5f4 = auVar6._12_4_;
          auVar373._0_4_ = fVar123 * (float)local_370._0_4_ + local_600;
          auVar373._4_4_ = fVar206 * (float)local_370._4_4_ + fStack_5fc;
          auVar373._8_4_ = fVar232 * fStack_368 + fStack_5f8;
          auVar373._12_4_ = fVar152 * fStack_364 + fStack_5f4;
          auVar136 = vsubps_avx(auVar320,auVar220);
          auVar221._0_4_ = auVar136._0_4_ * fVar123 + auVar220._0_4_;
          auVar221._4_4_ = auVar136._4_4_ * fVar206 + auVar220._4_4_;
          auVar221._8_4_ = auVar136._8_4_ * fVar232 + auVar220._8_4_;
          auVar221._12_4_ = auVar136._12_4_ * fVar152 + auVar220._12_4_;
          auVar136 = vsubps_avx(auVar373,auVar320);
          auVar321._0_4_ = auVar320._0_4_ + auVar136._0_4_ * fVar123;
          auVar321._4_4_ = auVar320._4_4_ + auVar136._4_4_ * fVar206;
          auVar321._8_4_ = auVar320._8_4_ + auVar136._8_4_ * fVar232;
          auVar321._12_4_ = auVar320._12_4_ + auVar136._12_4_ * fVar152;
          auVar136 = vsubps_avx(auVar321,auVar221);
          fVar123 = auVar221._0_4_ + auVar136._0_4_ * fVar123;
          fVar206 = auVar221._4_4_ + auVar136._4_4_ * fVar206;
          auVar166._0_8_ = CONCAT44(fVar206,fVar123);
          auVar166._8_4_ = auVar221._8_4_ + auVar136._8_4_ * fVar232;
          auVar166._12_4_ = auVar221._12_4_ + auVar136._12_4_ * fVar152;
          fVar232 = auVar136._0_4_ * 3.0;
          fVar152 = auVar136._4_4_ * 3.0;
          auVar222._0_8_ = CONCAT44(fVar152,fVar232);
          auVar222._8_4_ = auVar136._8_4_ * 3.0;
          auVar222._12_4_ = auVar136._12_4_ * 3.0;
          auVar322._8_8_ = auVar166._0_8_;
          auVar322._0_8_ = auVar166._0_8_;
          auVar136 = vshufpd_avx(auVar166,auVar166,3);
          auVar217 = vshufps_avx(auVar111,auVar111,0x55);
          auVar193 = vsubps_avx(auVar136,auVar322);
          auVar323._0_4_ = auVar217._0_4_ * auVar193._0_4_ + fVar123;
          auVar323._4_4_ = auVar217._4_4_ * auVar193._4_4_ + fVar206;
          auVar323._8_4_ = auVar217._8_4_ * auVar193._8_4_ + fVar123;
          auVar323._12_4_ = auVar217._12_4_ * auVar193._12_4_ + fVar206;
          auVar392._8_8_ = auVar222._0_8_;
          auVar392._0_8_ = auVar222._0_8_;
          auVar136 = vshufpd_avx(auVar222,auVar222,1);
          auVar136 = vsubps_avx(auVar136,auVar392);
          auVar223._0_4_ = fVar232 + auVar217._0_4_ * auVar136._0_4_;
          auVar223._4_4_ = fVar152 + auVar217._4_4_ * auVar136._4_4_;
          auVar223._8_4_ = fVar232 + auVar217._8_4_ * auVar136._8_4_;
          auVar223._12_4_ = fVar152 + auVar217._12_4_ * auVar136._12_4_;
          auVar217 = vmovshdup_avx(auVar223);
          auVar393._0_8_ = auVar217._0_8_ ^ 0x8000000080000000;
          auVar393._8_4_ = auVar217._8_4_ ^ 0x80000000;
          auVar393._12_4_ = auVar217._12_4_ ^ 0x80000000;
          auVar252 = vmovshdup_avx(auVar193);
          auVar136 = vunpcklps_avx(auVar252,auVar393);
          auVar194 = vshufps_avx(auVar136,auVar393,4);
          auVar167._0_8_ = auVar193._0_8_ ^ 0x8000000080000000;
          auVar167._8_4_ = -auVar193._8_4_;
          auVar167._12_4_ = -auVar193._12_4_;
          auVar136 = vmovlhps_avx(auVar167,auVar223);
          auVar135 = vshufps_avx(auVar136,auVar223,8);
          auVar136 = ZEXT416((uint)(auVar252._0_4_ * auVar223._0_4_ -
                                   auVar217._0_4_ * auVar193._0_4_));
          auVar217 = vshufps_avx(auVar136,auVar136,0);
          auVar136 = vdivps_avx(auVar194,auVar217);
          auVar217 = vdivps_avx(auVar135,auVar217);
          auVar135 = vinsertps_avx(auVar249,auVar340,0x1c);
          auVar193 = vinsertps_avx(auVar267,auVar351,0x1c);
          auVar110 = vinsertps_avx(auVar340,auVar249,0x4c);
          auVar163 = vinsertps_avx(auVar351,auVar267,0x4c);
          auVar252 = vmovsldup_avx(auVar136);
          auVar352._0_4_ = auVar252._0_4_ * auVar135._0_4_;
          auVar352._4_4_ = auVar252._4_4_ * auVar135._4_4_;
          auVar352._8_4_ = auVar252._8_4_ * auVar135._8_4_;
          auVar352._12_4_ = auVar252._12_4_ * auVar135._12_4_;
          auVar341._0_4_ = auVar252._0_4_ * auVar193._0_4_;
          auVar341._4_4_ = auVar252._4_4_ * auVar193._4_4_;
          auVar341._8_4_ = auVar252._8_4_ * auVar193._8_4_;
          auVar341._12_4_ = auVar252._12_4_ * auVar193._12_4_;
          auVar194 = vminps_avx(auVar352,auVar341);
          auVar252 = vmaxps_avx(auVar341,auVar352);
          auVar7 = vmovsldup_avx(auVar217);
          auVar411._0_4_ = auVar7._0_4_ * auVar110._0_4_;
          auVar411._4_4_ = auVar7._4_4_ * auVar110._4_4_;
          auVar411._8_4_ = auVar7._8_4_ * auVar110._8_4_;
          auVar411._12_4_ = auVar7._12_4_ * auVar110._12_4_;
          auVar342._0_4_ = auVar7._0_4_ * auVar163._0_4_;
          auVar342._4_4_ = auVar7._4_4_ * auVar163._4_4_;
          auVar342._8_4_ = auVar7._8_4_ * auVar163._8_4_;
          auVar342._12_4_ = auVar7._12_4_ * auVar163._12_4_;
          auVar7 = vminps_avx(auVar411,auVar342);
          auVar139._0_4_ = auVar194._0_4_ + auVar7._0_4_;
          auVar139._4_4_ = auVar194._4_4_ + auVar7._4_4_;
          auVar139._8_4_ = auVar194._8_4_ + auVar7._8_4_;
          auVar139._12_4_ = auVar194._12_4_ + auVar7._12_4_;
          auVar194 = vmaxps_avx(auVar342,auVar411);
          auVar7 = vsubps_avx(auVar284,auVar111);
          auVar282 = vsubps_avx(auVar303,auVar111);
          auVar304._0_4_ = auVar252._0_4_ + auVar194._0_4_;
          auVar304._4_4_ = auVar252._4_4_ + auVar194._4_4_;
          auVar304._8_4_ = auVar252._8_4_ + auVar194._8_4_;
          auVar304._12_4_ = auVar252._12_4_ + auVar194._12_4_;
          auVar353._8_8_ = 0x3f800000;
          auVar353._0_8_ = 0x3f800000;
          auVar252 = vsubps_avx(auVar353,auVar304);
          auVar194 = vsubps_avx(auVar353,auVar139);
          fVar331 = auVar7._0_4_;
          auVar354._0_4_ = fVar331 * auVar252._0_4_;
          fVar260 = auVar7._4_4_;
          auVar354._4_4_ = fVar260 * auVar252._4_4_;
          fVar175 = auVar7._8_4_;
          auVar354._8_4_ = fVar175 * auVar252._8_4_;
          fVar332 = auVar7._12_4_;
          auVar354._12_4_ = fVar332 * auVar252._12_4_;
          fVar232 = auVar282._0_4_;
          auVar305._0_4_ = auVar252._0_4_ * fVar232;
          fVar152 = auVar282._4_4_;
          auVar305._4_4_ = auVar252._4_4_ * fVar152;
          fVar207 = auVar282._8_4_;
          auVar305._8_4_ = auVar252._8_4_ * fVar207;
          fVar234 = auVar282._12_4_;
          auVar305._12_4_ = auVar252._12_4_ * fVar234;
          auVar402._0_4_ = fVar331 * auVar194._0_4_;
          auVar402._4_4_ = fVar260 * auVar194._4_4_;
          auVar402._8_4_ = fVar175 * auVar194._8_4_;
          auVar402._12_4_ = fVar332 * auVar194._12_4_;
          auVar140._0_4_ = fVar232 * auVar194._0_4_;
          auVar140._4_4_ = fVar152 * auVar194._4_4_;
          auVar140._8_4_ = fVar207 * auVar194._8_4_;
          auVar140._12_4_ = fVar234 * auVar194._12_4_;
          auVar252 = vminps_avx(auVar354,auVar402);
          auVar194 = vminps_avx(auVar305,auVar140);
          auVar7 = vminps_avx(auVar252,auVar194);
          auVar252 = vmaxps_avx(auVar402,auVar354);
          auVar194 = vmaxps_avx(auVar140,auVar305);
          auVar282 = vshufps_avx(auVar111,auVar111,0x54);
          auVar194 = vmaxps_avx(auVar194,auVar252);
          auVar9 = vshufps_avx(auVar323,auVar323,0);
          auVar10 = vshufps_avx(auVar323,auVar323,0x55);
          auVar252 = vhaddps_avx(auVar7,auVar7);
          auVar194 = vhaddps_avx(auVar194,auVar194);
          auVar306._0_4_ = auVar9._0_4_ * auVar136._0_4_ + auVar10._0_4_ * auVar217._0_4_;
          auVar306._4_4_ = auVar9._4_4_ * auVar136._4_4_ + auVar10._4_4_ * auVar217._4_4_;
          auVar306._8_4_ = auVar9._8_4_ * auVar136._8_4_ + auVar10._8_4_ * auVar217._8_4_;
          auVar306._12_4_ = auVar9._12_4_ * auVar136._12_4_ + auVar10._12_4_ * auVar217._12_4_;
          auVar7 = vsubps_avx(auVar282,auVar306);
          fVar123 = auVar7._0_4_ + auVar252._0_4_;
          fVar206 = auVar7._0_4_ + auVar194._0_4_;
          auVar252 = vmaxss_avx(ZEXT416((uint)fVar174),ZEXT416((uint)fVar123));
          auVar194 = vminss_avx(ZEXT416((uint)fVar206),ZEXT416((uint)fVar122));
          if (auVar252._0_4_ <= auVar194._0_4_) {
            auVar252 = vmovshdup_avx(auVar136);
            auVar190._0_4_ = auVar135._0_4_ * auVar252._0_4_;
            auVar190._4_4_ = auVar135._4_4_ * auVar252._4_4_;
            auVar190._8_4_ = auVar135._8_4_ * auVar252._8_4_;
            auVar190._12_4_ = auVar135._12_4_ * auVar252._12_4_;
            auVar141._0_4_ = auVar193._0_4_ * auVar252._0_4_;
            auVar141._4_4_ = auVar193._4_4_ * auVar252._4_4_;
            auVar141._8_4_ = auVar193._8_4_ * auVar252._8_4_;
            auVar141._12_4_ = auVar193._12_4_ * auVar252._12_4_;
            auVar194 = vminps_avx(auVar190,auVar141);
            auVar252 = vmaxps_avx(auVar141,auVar190);
            auVar135 = vmovshdup_avx(auVar217);
            auVar250._0_4_ = auVar135._0_4_ * auVar110._0_4_;
            auVar250._4_4_ = auVar135._4_4_ * auVar110._4_4_;
            auVar250._8_4_ = auVar135._8_4_ * auVar110._8_4_;
            auVar250._12_4_ = auVar135._12_4_ * auVar110._12_4_;
            auVar191._0_4_ = auVar135._0_4_ * auVar163._0_4_;
            auVar191._4_4_ = auVar135._4_4_ * auVar163._4_4_;
            auVar191._8_4_ = auVar135._8_4_ * auVar163._8_4_;
            auVar191._12_4_ = auVar135._12_4_ * auVar163._12_4_;
            auVar135 = vminps_avx(auVar250,auVar191);
            auVar268._0_4_ = auVar194._0_4_ + auVar135._0_4_;
            auVar268._4_4_ = auVar194._4_4_ + auVar135._4_4_;
            auVar268._8_4_ = auVar194._8_4_ + auVar135._8_4_;
            auVar268._12_4_ = auVar194._12_4_ + auVar135._12_4_;
            auVar194 = vmaxps_avx(auVar191,auVar250);
            auVar142._0_4_ = auVar252._0_4_ + auVar194._0_4_;
            auVar142._4_4_ = auVar252._4_4_ + auVar194._4_4_;
            auVar142._8_4_ = auVar252._8_4_ + auVar194._8_4_;
            auVar142._12_4_ = auVar252._12_4_ + auVar194._12_4_;
            auVar252 = vsubps_avx(auVar188,auVar142);
            auVar194 = vsubps_avx(auVar188,auVar268);
            auVar251._0_4_ = fVar331 * auVar252._0_4_;
            auVar251._4_4_ = fVar260 * auVar252._4_4_;
            auVar251._8_4_ = fVar175 * auVar252._8_4_;
            auVar251._12_4_ = fVar332 * auVar252._12_4_;
            auVar269._0_4_ = fVar331 * auVar194._0_4_;
            auVar269._4_4_ = fVar260 * auVar194._4_4_;
            auVar269._8_4_ = fVar175 * auVar194._8_4_;
            auVar269._12_4_ = fVar332 * auVar194._12_4_;
            auVar143._0_4_ = fVar232 * auVar252._0_4_;
            auVar143._4_4_ = fVar152 * auVar252._4_4_;
            auVar143._8_4_ = fVar207 * auVar252._8_4_;
            auVar143._12_4_ = fVar234 * auVar252._12_4_;
            auVar192._0_4_ = fVar232 * auVar194._0_4_;
            auVar192._4_4_ = fVar152 * auVar194._4_4_;
            auVar192._8_4_ = fVar207 * auVar194._8_4_;
            auVar192._12_4_ = fVar234 * auVar194._12_4_;
            auVar252 = vminps_avx(auVar251,auVar269);
            auVar194 = vminps_avx(auVar143,auVar192);
            auVar252 = vminps_avx(auVar252,auVar194);
            auVar194 = vmaxps_avx(auVar269,auVar251);
            auVar135 = vmaxps_avx(auVar192,auVar143);
            auVar252 = vhaddps_avx(auVar252,auVar252);
            auVar194 = vmaxps_avx(auVar135,auVar194);
            auVar194 = vhaddps_avx(auVar194,auVar194);
            auVar135 = vmovshdup_avx(auVar7);
            auVar193 = ZEXT416((uint)(auVar135._0_4_ + auVar252._0_4_));
            auVar252 = vmaxss_avx(_local_720,auVar193);
            auVar135 = ZEXT416((uint)(auVar135._0_4_ + auVar194._0_4_));
            auVar194 = vminss_avx(auVar135,auVar8);
            if (auVar252._0_4_ <= auVar194._0_4_) {
              uVar87 = 0;
              auVar404 = ZEXT864(0) << 0x20;
              if (fVar123 <= fVar174) {
                auVar355._8_4_ = 0x7fffffff;
                auVar355._0_8_ = 0x7fffffff7fffffff;
                auVar355._12_4_ = 0x7fffffff;
              }
              else {
                auVar355._8_4_ = 0x7fffffff;
                auVar355._0_8_ = 0x7fffffff7fffffff;
                auVar355._12_4_ = 0x7fffffff;
                if (fVar206 < fVar122) {
                  auVar252 = vcmpps_avx(auVar135,auVar8,1);
                  auVar194 = vcmpps_avx(_local_720,auVar193,1);
                  auVar252 = vandps_avx(auVar194,auVar252);
                  uVar87 = auVar252._0_4_;
                }
              }
              if (((uint)uVar89 < 4 && 0.001 <= fVar205) && (uVar87 & 1) == 0) {
                bVar73 = false;
              }
              else {
                lVar90 = 200;
                do {
                  fVar123 = auVar7._0_4_;
                  fVar205 = 1.0 - fVar123;
                  auVar252 = ZEXT416((uint)(fVar205 * fVar205 * fVar205));
                  auVar252 = vshufps_avx(auVar252,auVar252,0);
                  auVar194 = ZEXT416((uint)(fVar123 * 3.0 * fVar205 * fVar205));
                  auVar194 = vshufps_avx(auVar194,auVar194,0);
                  auVar135 = ZEXT416((uint)(fVar205 * fVar123 * fVar123 * 3.0));
                  auVar135 = vshufps_avx(auVar135,auVar135,0);
                  auVar193 = ZEXT416((uint)(fVar123 * fVar123 * fVar123));
                  auVar193 = vshufps_avx(auVar193,auVar193,0);
                  fVar205 = local_670 * auVar252._0_4_ +
                            local_5f0 * auVar194._0_4_ +
                            (float)local_470._0_4_ * auVar193._0_4_ + local_600 * auVar135._0_4_;
                  fVar123 = fStack_66c * auVar252._4_4_ +
                            fStack_5ec * auVar194._4_4_ +
                            (float)local_470._4_4_ * auVar193._4_4_ + fStack_5fc * auVar135._4_4_;
                  auVar144._0_8_ = CONCAT44(fVar123,fVar205);
                  auVar144._8_4_ =
                       fStack_668 * auVar252._8_4_ +
                       fStack_5e8 * auVar194._8_4_ +
                       fStack_468 * auVar193._8_4_ + fStack_5f8 * auVar135._8_4_;
                  auVar144._12_4_ =
                       fStack_664 * auVar252._12_4_ +
                       fStack_5e4 * auVar194._12_4_ +
                       fStack_464 * auVar193._12_4_ + fStack_5f4 * auVar135._12_4_;
                  auVar195._8_8_ = auVar144._0_8_;
                  auVar195._0_8_ = auVar144._0_8_;
                  auVar194 = vshufpd_avx(auVar144,auVar144,1);
                  auVar252 = vmovshdup_avx(auVar7);
                  auVar194 = vsubps_avx(auVar194,auVar195);
                  auVar145._0_4_ = auVar252._0_4_ * auVar194._0_4_ + fVar205;
                  auVar145._4_4_ = auVar252._4_4_ * auVar194._4_4_ + fVar123;
                  auVar145._8_4_ = auVar252._8_4_ * auVar194._8_4_ + fVar205;
                  auVar145._12_4_ = auVar252._12_4_ * auVar194._12_4_ + fVar123;
                  auVar252 = vshufps_avx(auVar145,auVar145,0);
                  auVar194 = vshufps_avx(auVar145,auVar145,0x55);
                  auVar196._0_4_ = auVar136._0_4_ * auVar252._0_4_ + auVar217._0_4_ * auVar194._0_4_
                  ;
                  auVar196._4_4_ = auVar136._4_4_ * auVar252._4_4_ + auVar217._4_4_ * auVar194._4_4_
                  ;
                  auVar196._8_4_ = auVar136._8_4_ * auVar252._8_4_ + auVar217._8_4_ * auVar194._8_4_
                  ;
                  auVar196._12_4_ =
                       auVar136._12_4_ * auVar252._12_4_ + auVar217._12_4_ * auVar194._12_4_;
                  auVar7 = vsubps_avx(auVar7,auVar196);
                  auVar252 = vandps_avx(auVar355,auVar145);
                  auVar194 = vshufps_avx(auVar252,auVar252,0xf5);
                  auVar252 = vmaxss_avx(auVar194,auVar252);
                  if (auVar252._0_4_ < fVar211) {
                    fVar205 = auVar7._0_4_;
                    if ((0.0 <= fVar205) && (fVar205 <= 1.0)) {
                      auVar136 = vmovshdup_avx(auVar7);
                      fVar123 = auVar136._0_4_;
                      if ((0.0 <= fVar123) && (fVar123 <= 1.0)) {
                        auVar136 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2])
                                                 ,ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]
                                                         ),0x1c);
                        auVar163 = vinsertps_avx(auVar136,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                        auVar136 = vdpps_avx(auVar163,local_380,0x7f);
                        auVar217 = vdpps_avx(auVar163,local_390,0x7f);
                        auVar252 = vdpps_avx(auVar163,local_3a0,0x7f);
                        auVar194 = vdpps_avx(auVar163,local_3b0,0x7f);
                        auVar135 = vdpps_avx(auVar163,local_3c0,0x7f);
                        auVar193 = vdpps_avx(auVar163,local_3d0,0x7f);
                        auVar110 = vdpps_avx(auVar163,local_3e0,0x7f);
                        auVar163 = vdpps_avx(auVar163,local_3f0,0x7f);
                        fVar234 = 1.0 - fVar123;
                        fVar331 = 1.0 - fVar205;
                        fVar206 = auVar7._4_4_;
                        fVar232 = auVar7._8_4_;
                        fVar152 = auVar7._12_4_;
                        fVar207 = fVar331 * fVar205 * fVar205 * 3.0;
                        auVar285._0_4_ = fVar205 * fVar205 * fVar205;
                        auVar285._4_4_ = fVar206 * fVar206 * fVar206;
                        auVar285._8_4_ = fVar232 * fVar232 * fVar232;
                        auVar285._12_4_ = fVar152 * fVar152 * fVar152;
                        fVar232 = fVar331 * fVar331 * fVar205 * 3.0;
                        fVar152 = fVar331 * fVar331 * fVar331;
                        fVar206 = fVar152 * (fVar234 * auVar136._0_4_ + fVar123 * auVar135._0_4_) +
                                  (fVar234 * auVar217._0_4_ + auVar193._0_4_ * fVar123) * fVar232 +
                                  fVar207 * (auVar110._0_4_ * fVar123 + fVar234 * auVar252._0_4_) +
                                  auVar285._0_4_ *
                                  (fVar234 * auVar194._0_4_ + fVar123 * auVar163._0_4_);
                        if (((fVar176 <= fVar206) &&
                            (fVar234 = *(float *)(ray + k * 4 + 0x100), fVar206 <= fVar234)) &&
                           (pGVar21 = (context->scene->geometries).items[uVar93].ptr,
                           (pGVar21->mask & *(uint *)(ray + k * 4 + 0x120)) != 0)) {
                          auStack_f0 = vshufps_avx(auVar7,auVar7,0x55);
                          auVar324._8_4_ = 0x3f800000;
                          auVar324._0_8_ = &DAT_3f8000003f800000;
                          auVar324._12_4_ = 0x3f800000;
                          auVar136 = vsubps_avx(auVar324,auStack_f0);
                          fVar260 = auStack_f0._0_4_;
                          fVar175 = auStack_f0._4_4_;
                          fVar332 = auStack_f0._8_4_;
                          fVar333 = auStack_f0._12_4_;
                          fVar349 = auVar136._0_4_;
                          fVar212 = auVar136._4_4_;
                          fVar230 = auVar136._8_4_;
                          fVar233 = auVar136._12_4_;
                          auVar343._0_4_ =
                               fVar260 * (float)local_4a0._0_4_ + fVar349 * (float)local_480._0_4_;
                          auVar343._4_4_ =
                               fVar175 * (float)local_4a0._4_4_ + fVar212 * (float)local_480._4_4_;
                          auVar343._8_4_ = fVar332 * fStack_498 + fVar230 * fStack_478;
                          auVar343._12_4_ = fVar333 * fStack_494 + fVar233 * fStack_474;
                          auVar356._0_4_ = fVar260 * (float)local_4b0._0_4_ + fVar349 * fVar208;
                          auVar356._4_4_ = fVar175 * (float)local_4b0._4_4_ + fVar212 * fVar238;
                          auVar356._8_4_ = fVar332 * fStack_4a8 + fVar230 * fVar240;
                          auVar356._12_4_ = fVar333 * fStack_4a4 + fVar233 * fVar257;
                          auVar374._0_4_ = fVar260 * fVar209 + fVar349 * (float)local_490._0_4_;
                          auVar374._4_4_ = fVar175 * fVar239 + fVar212 * (float)local_490._4_4_;
                          auVar374._8_4_ = fVar332 * fVar256 + fVar230 * fStack_488;
                          auVar374._12_4_ = fVar333 * fVar259 + fVar233 * fStack_484;
                          auVar325._0_4_ = fVar260 * (float)local_410._0_4_ + fVar349 * fVar237;
                          auVar325._4_4_ = fVar175 * (float)local_410._4_4_ + fVar212 * fVar210;
                          auVar325._8_4_ = fVar332 * fStack_408 + fVar230 * fVar255;
                          auVar325._12_4_ = fVar333 * fStack_404 + fVar233 * fVar258;
                          auVar194 = vsubps_avx(auVar356,auVar343);
                          auVar135 = vsubps_avx(auVar374,auVar356);
                          auVar193 = vsubps_avx(auVar325,auVar374);
                          auStack_110 = vshufps_avx(auVar7,auVar7,0);
                          fVar333 = auStack_110._0_4_;
                          fVar349 = auStack_110._4_4_;
                          fVar212 = auStack_110._8_4_;
                          fVar230 = auStack_110._12_4_;
                          auVar136 = vshufps_avx(ZEXT416((uint)fVar331),ZEXT416((uint)fVar331),0);
                          fVar331 = auVar136._0_4_;
                          fVar260 = auVar136._4_4_;
                          fVar175 = auVar136._8_4_;
                          fVar332 = auVar136._12_4_;
                          auVar136 = vshufps_avx(auVar285,auVar285,0);
                          auVar217 = vshufps_avx(ZEXT416((uint)fVar207),ZEXT416((uint)fVar207),0);
                          auVar252 = vshufps_avx(ZEXT416((uint)fVar232),ZEXT416((uint)fVar232),0);
                          auVar270._0_4_ =
                               (fVar331 * (fVar331 * auVar194._0_4_ + fVar333 * auVar135._0_4_) +
                               fVar333 * (fVar331 * auVar135._0_4_ + fVar333 * auVar193._0_4_)) *
                               3.0;
                          auVar270._4_4_ =
                               (fVar260 * (fVar260 * auVar194._4_4_ + fVar349 * auVar135._4_4_) +
                               fVar349 * (fVar260 * auVar135._4_4_ + fVar349 * auVar193._4_4_)) *
                               3.0;
                          auVar270._8_4_ =
                               (fVar175 * (fVar175 * auVar194._8_4_ + fVar212 * auVar135._8_4_) +
                               fVar212 * (fVar175 * auVar135._8_4_ + fVar212 * auVar193._8_4_)) *
                               3.0;
                          auVar270._12_4_ =
                               (fVar332 * (fVar332 * auVar194._12_4_ + fVar230 * auVar135._12_4_) +
                               fVar230 * (fVar332 * auVar135._12_4_ + fVar230 * auVar193._12_4_)) *
                               3.0;
                          auVar194 = vshufps_avx(ZEXT416((uint)fVar152),ZEXT416((uint)fVar152),0);
                          auVar224._0_4_ =
                               auVar194._0_4_ * (float)local_420._0_4_ +
                               auVar252._0_4_ * (float)local_430._0_4_ +
                               auVar136._0_4_ * (float)local_450._0_4_ +
                               auVar217._0_4_ * (float)local_440._0_4_;
                          auVar224._4_4_ =
                               auVar194._4_4_ * (float)local_420._4_4_ +
                               auVar252._4_4_ * (float)local_430._4_4_ +
                               auVar136._4_4_ * (float)local_450._4_4_ +
                               auVar217._4_4_ * (float)local_440._4_4_;
                          auVar224._8_4_ =
                               auVar194._8_4_ * fStack_418 +
                               auVar252._8_4_ * fStack_428 +
                               auVar136._8_4_ * fStack_448 + auVar217._8_4_ * fStack_438;
                          auVar224._12_4_ =
                               auVar194._12_4_ * fStack_414 +
                               auVar252._12_4_ * fStack_424 +
                               auVar136._12_4_ * fStack_444 + auVar217._12_4_ * fStack_434;
                          auVar136 = vshufps_avx(auVar270,auVar270,0xc9);
                          auVar253._0_4_ = auVar224._0_4_ * auVar136._0_4_;
                          auVar253._4_4_ = auVar224._4_4_ * auVar136._4_4_;
                          auVar253._8_4_ = auVar224._8_4_ * auVar136._8_4_;
                          auVar253._12_4_ = auVar224._12_4_ * auVar136._12_4_;
                          auVar136 = vshufps_avx(auVar224,auVar224,0xc9);
                          auVar225._0_4_ = auVar270._0_4_ * auVar136._0_4_;
                          auVar225._4_4_ = auVar270._4_4_ * auVar136._4_4_;
                          auVar225._8_4_ = auVar270._8_4_ * auVar136._8_4_;
                          auVar225._12_4_ = auVar270._12_4_ * auVar136._12_4_;
                          auVar136 = vsubps_avx(auVar225,auVar253);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x100) = fVar206;
                            uVar3 = vextractps_avx(auVar136,1);
                            *(undefined4 *)(ray + k * 4 + 0x180) = uVar3;
                            uVar3 = vextractps_avx(auVar136,2);
                            *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar3;
                            *(int *)(ray + k * 4 + 0x1c0) = auVar136._0_4_;
                            *(float *)(ray + k * 4 + 0x1e0) = fVar205;
                            *(float *)(ray + k * 4 + 0x200) = fVar123;
                            *(uint *)(ray + k * 4 + 0x220) = uVar20;
                            *(uint *)(ray + k * 4 + 0x240) = uVar93;
                            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                          }
                          else {
                            auStack_170 = vshufps_avx(auVar136,auVar136,0x55);
                            auStack_150 = vshufps_avx(auVar136,auVar136,0xaa);
                            auStack_130 = vshufps_avx(auVar136,auVar136,0);
                            local_180[0] = (RTCHitN)auStack_170[0];
                            local_180[1] = (RTCHitN)auStack_170[1];
                            local_180[2] = (RTCHitN)auStack_170[2];
                            local_180[3] = (RTCHitN)auStack_170[3];
                            local_180[4] = (RTCHitN)auStack_170[4];
                            local_180[5] = (RTCHitN)auStack_170[5];
                            local_180[6] = (RTCHitN)auStack_170[6];
                            local_180[7] = (RTCHitN)auStack_170[7];
                            local_180[8] = (RTCHitN)auStack_170[8];
                            local_180[9] = (RTCHitN)auStack_170[9];
                            local_180[10] = (RTCHitN)auStack_170[10];
                            local_180[0xb] = (RTCHitN)auStack_170[0xb];
                            local_180[0xc] = (RTCHitN)auStack_170[0xc];
                            local_180[0xd] = (RTCHitN)auStack_170[0xd];
                            local_180[0xe] = (RTCHitN)auStack_170[0xe];
                            local_180[0xf] = (RTCHitN)auStack_170[0xf];
                            local_160 = auStack_150;
                            local_140 = auStack_130;
                            local_120 = auStack_110;
                            local_100 = auStack_f0;
                            local_e0 = local_300._0_8_;
                            uStack_d8 = local_300._8_8_;
                            uStack_d0 = local_300._16_8_;
                            uStack_c8 = local_300._24_8_;
                            local_c0 = local_2e0._0_8_;
                            uStack_b8 = local_2e0._8_8_;
                            uStack_b0 = local_2e0._16_8_;
                            uStack_a8 = local_2e0._24_8_;
                            auVar112 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_9c = context->user->instID[0];
                            local_a0 = uStack_9c;
                            uStack_98 = uStack_9c;
                            uStack_94 = uStack_9c;
                            uStack_90 = uStack_9c;
                            uStack_8c = uStack_9c;
                            uStack_84 = auVar112._28_4_;
                            uVar87 = uStack_84;
                            uStack_88 = uStack_9c;
                            uStack_84 = uStack_9c;
                            uStack_7c = context->user->instPrimID[0];
                            local_80 = uStack_7c;
                            uStack_78 = uStack_7c;
                            uStack_74 = uStack_7c;
                            uStack_70 = uStack_7c;
                            uStack_6c = uStack_7c;
                            uStack_68 = uStack_7c;
                            uStack_64 = uStack_7c;
                            *(float *)(ray + k * 4 + 0x100) = fVar206;
                            local_500 = *(undefined8 *)(mm_lookupmask_ps + uVar88);
                            uStack_4f8 = *(undefined8 *)(mm_lookupmask_ps + uVar88 + 8);
                            local_4f0 = *(undefined8 *)(mm_lookupmask_ps + lVar95);
                            uStack_4e8 = *(undefined8 *)(mm_lookupmask_ps + lVar95 + 8);
                            local_4e0.valid = (int *)&local_500;
                            local_4e0.geometryUserPtr = pGVar21->userPtr;
                            local_4e0.context = context->user;
                            local_4e0.hit = local_180;
                            local_4e0.N = 8;
                            local_4e0.ray = (RTCRayN *)ray;
                            if (pGVar21->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar21->intersectionFilterN)(&local_4e0);
                              auVar404 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            auVar82._8_8_ = uStack_4f8;
                            auVar82._0_8_ = local_500;
                            auVar136 = vpcmpeqd_avx(auVar404._0_16_,auVar82);
                            auVar84._8_8_ = uStack_4e8;
                            auVar84._0_8_ = local_4f0;
                            auVar217 = vpcmpeqd_avx(auVar404._0_16_,auVar84);
                            auVar119._16_16_ = auVar217;
                            auVar119._0_16_ = auVar136;
                            auVar27 = auVar112 & ~auVar119;
                            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar27 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar27 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar27 >> 0x7f,0) == '\0') &&
                                  (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                                  ) && SUB321(auVar27 >> 0xbf,0) == '\0') &&
                                (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar27[0x1f]) {
                              auVar120._0_4_ = auVar136._0_4_ ^ auVar112._0_4_;
                              auVar120._4_4_ = auVar136._4_4_ ^ auVar112._4_4_;
                              auVar120._8_4_ = auVar136._8_4_ ^ auVar112._8_4_;
                              auVar120._12_4_ = auVar136._12_4_ ^ auVar112._12_4_;
                              auVar120._16_4_ = auVar217._0_4_ ^ auVar112._16_4_;
                              auVar120._20_4_ = auVar217._4_4_ ^ auVar112._20_4_;
                              auVar120._24_4_ = auVar217._8_4_ ^ auVar112._24_4_;
                              auVar120._28_4_ = auVar217._12_4_ ^ uVar87;
                            }
                            else {
                              p_Var26 = context->args->filter;
                              if ((p_Var26 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar21->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var26)(&local_4e0);
                                auVar404 = ZEXT1664(ZEXT816(0) << 0x40);
                              }
                              auVar83._8_8_ = uStack_4f8;
                              auVar83._0_8_ = local_500;
                              auVar136 = vpcmpeqd_avx(auVar404._0_16_,auVar83);
                              auVar85._8_8_ = uStack_4e8;
                              auVar85._0_8_ = local_4f0;
                              auVar217 = vpcmpeqd_avx(auVar404._0_16_,auVar85);
                              auVar151._16_16_ = auVar217;
                              auVar151._0_16_ = auVar136;
                              auVar120._0_4_ = auVar136._0_4_ ^ auVar112._0_4_;
                              auVar120._4_4_ = auVar136._4_4_ ^ auVar112._4_4_;
                              auVar120._8_4_ = auVar136._8_4_ ^ auVar112._8_4_;
                              auVar120._12_4_ = auVar136._12_4_ ^ auVar112._12_4_;
                              auVar120._16_4_ = auVar217._0_4_ ^ auVar112._16_4_;
                              auVar120._20_4_ = auVar217._4_4_ ^ auVar112._20_4_;
                              auVar120._24_4_ = auVar217._8_4_ ^ auVar112._24_4_;
                              auVar120._28_4_ = auVar217._12_4_ ^ uVar87;
                              auVar112 = auVar112 & ~auVar151;
                              if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar112 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar112 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar112 >> 0x7f,0) != '\0')
                                    || (auVar112 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0) || SUB321(auVar112 >> 0xbf,0) != '\0')
                                  || (auVar112 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0) || auVar112[0x1f] < '\0') {
                                auVar112 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])
                                                                    local_4e0.hit);
                                *(undefined1 (*) [32])(local_4e0.ray + 0x180) = auVar112;
                                auVar112 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])
                                                                    (local_4e0.hit + 0x20));
                                *(undefined1 (*) [32])(local_4e0.ray + 0x1a0) = auVar112;
                                auVar112 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])
                                                                    (local_4e0.hit + 0x40));
                                *(undefined1 (*) [32])(local_4e0.ray + 0x1c0) = auVar112;
                                auVar112 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])
                                                                    (local_4e0.hit + 0x60));
                                *(undefined1 (*) [32])(local_4e0.ray + 0x1e0) = auVar112;
                                auVar112 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])
                                                                    (local_4e0.hit + 0x80));
                                *(undefined1 (*) [32])(local_4e0.ray + 0x200) = auVar112;
                                auVar112 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])
                                                                    (local_4e0.hit + 0xa0));
                                *(undefined1 (*) [32])(local_4e0.ray + 0x220) = auVar112;
                                auVar112 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])
                                                                    (local_4e0.hit + 0xc0));
                                *(undefined1 (*) [32])(local_4e0.ray + 0x240) = auVar112;
                                auVar112 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])
                                                                    (local_4e0.hit + 0xe0));
                                *(undefined1 (*) [32])(local_4e0.ray + 0x260) = auVar112;
                                auVar112 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])
                                                                    (local_4e0.hit + 0x100));
                                *(undefined1 (*) [32])(local_4e0.ray + 0x280) = auVar112;
                              }
                            }
                            if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar120 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar120 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar120 >> 0x7f,0) == '\0') &&
                                  (auVar120 & (undefined1  [32])0x100000000) ==
                                  (undefined1  [32])0x0) && SUB321(auVar120 >> 0xbf,0) == '\0') &&
                                (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar120[0x1f]) {
                              *(float *)(ray + k * 4 + 0x100) = fVar234;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar90 = lVar90 + -1;
                } while (lVar90 != 0);
              }
              goto LAB_012a6d35;
            }
          }
          goto LAB_012a6d4b;
        }
      }
LAB_012a6d35:
    } while (bVar73);
    _local_6c0 = ZEXT416((uint)fVar174);
    local_400 = vinsertps_avx(_local_6c0,ZEXT416((uint)fVar122),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }